

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

bool embree::avx::CurveNiMBIntersectorK<8,8>::
     occluded_t<embree::avx::SweepCurve1IntersectorK<embree::CatmullRomCurveT,8>,embree::avx::Occluded1KEpilog1<8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  undefined4 uVar7;
  undefined8 uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  Primitive PVar24;
  Geometry *pGVar25;
  __int_type_conflict _Var26;
  long lVar27;
  RTCRayQueryContext *pRVar28;
  RTCFilterFunctionN p_Var29;
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  bool bVar83;
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  bool bVar97;
  undefined1 auVar98 [12];
  bool bVar99;
  bool bVar100;
  bool bVar101;
  bool bVar102;
  bool bVar103;
  bool bVar104;
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  uint uVar120;
  uint uVar121;
  ulong uVar122;
  ulong uVar123;
  uint uVar124;
  long lVar125;
  uint uVar126;
  long lVar127;
  long lVar128;
  ulong uVar129;
  byte unaff_R13B;
  float fVar130;
  float fVar161;
  float fVar162;
  __m128 a;
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  float fVar163;
  float fVar201;
  float fVar202;
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  float fVar164;
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  float fVar207;
  float fVar209;
  float fVar210;
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  float fVar203;
  float fVar205;
  undefined1 auVar185 [32];
  float fVar204;
  float fVar206;
  float fVar208;
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  float fVar211;
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  float fVar235;
  float fVar237;
  float fVar239;
  float fVar240;
  float fVar241;
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  float fVar236;
  float fVar238;
  float fVar242;
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  float fVar243;
  float fVar261;
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [28];
  float fVar259;
  float fVar260;
  float fVar262;
  float fVar263;
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  float fVar264;
  undefined1 auVar254 [32];
  undefined1 auVar255 [32];
  undefined1 auVar256 [32];
  undefined1 auVar257 [32];
  undefined1 auVar258 [32];
  float fVar265;
  float fVar280;
  float fVar281;
  float fVar283;
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  float fVar282;
  undefined1 auVar275 [28];
  undefined1 auVar276 [32];
  undefined1 auVar277 [32];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar278 [32];
  float fVar284;
  float fVar285;
  float fVar286;
  undefined1 auVar279 [64];
  float fVar287;
  float fVar288;
  float fVar301;
  float fVar303;
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  float fVar307;
  float fVar309;
  float fVar311;
  undefined1 auVar293 [32];
  float fVar305;
  undefined1 auVar294 [32];
  undefined1 auVar295 [32];
  undefined1 auVar296 [32];
  float fVar302;
  float fVar304;
  float fVar306;
  float fVar308;
  float fVar310;
  float fVar312;
  undefined1 auVar297 [32];
  undefined1 auVar298 [32];
  undefined1 auVar299 [32];
  undefined1 auVar300 [32];
  float fVar313;
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  float fVar323;
  float fVar324;
  float fVar326;
  float fVar327;
  float fVar328;
  undefined1 auVar318 [32];
  undefined1 auVar319 [32];
  undefined1 auVar320 [32];
  float fVar325;
  undefined1 auVar321 [32];
  undefined1 auVar322 [32];
  float fVar329;
  undefined1 auVar330 [16];
  float fVar342;
  float fVar343;
  float fVar347;
  float fVar349;
  float fVar351;
  undefined1 auVar331 [32];
  undefined1 auVar332 [32];
  undefined1 auVar333 [32];
  undefined1 auVar334 [32];
  undefined1 auVar335 [32];
  float fVar345;
  float fVar353;
  float fVar354;
  undefined1 auVar336 [32];
  float fVar344;
  float fVar346;
  float fVar348;
  float fVar350;
  float fVar352;
  undefined1 auVar337 [32];
  undefined1 auVar338 [32];
  undefined1 auVar339 [32];
  undefined1 auVar340 [32];
  undefined1 auVar341 [32];
  undefined1 auVar355 [32];
  undefined1 auVar356 [32];
  undefined1 auVar357 [32];
  undefined1 auVar358 [32];
  undefined1 auVar360 [32];
  undefined1 auVar359 [32];
  undefined1 auVar361 [32];
  undefined1 auVar362 [64];
  undefined1 auVar363 [64];
  float s;
  float fVar373;
  float fVar376;
  float fVar379;
  float fVar382;
  float fVar385;
  float fVar388;
  undefined1 auVar367 [32];
  undefined1 auVar368 [32];
  undefined1 auVar369 [32];
  undefined1 auVar370 [32];
  float fVar364;
  float fVar365;
  float fVar366;
  float fVar374;
  float fVar375;
  float fVar377;
  float fVar378;
  float fVar380;
  float fVar381;
  float fVar383;
  float fVar384;
  float fVar386;
  float fVar387;
  float fVar389;
  float fVar390;
  float fVar391;
  float fVar392;
  float fVar393;
  undefined1 auVar371 [32];
  undefined1 auVar372 [32];
  undefined1 auVar394 [16];
  undefined1 auVar395 [16];
  undefined1 auVar396 [32];
  undefined1 auVar397 [32];
  undefined1 auVar398 [32];
  undefined1 auVar399 [32];
  float fVar404;
  undefined1 auVar400 [32];
  undefined1 auVar401 [32];
  undefined1 auVar402 [32];
  undefined1 auVar403 [64];
  float t;
  float fVar405;
  float fVar414;
  float fVar415;
  float fVar416;
  float fVar417;
  float fVar418;
  float fVar419;
  undefined1 auVar406 [32];
  undefined1 auVar407 [32];
  undefined1 auVar408 [32];
  undefined1 auVar409 [32];
  undefined1 auVar410 [32];
  float fVar420;
  undefined1 auVar411 [32];
  undefined1 auVar412 [32];
  undefined1 auVar413 [64];
  undefined1 auVar423 [16];
  float fVar421;
  float fVar422;
  float fVar430;
  float fVar433;
  float fVar439;
  float fVar441;
  float fVar443;
  float in_register_0000151c;
  undefined1 auVar424 [32];
  undefined1 auVar425 [32];
  undefined1 auVar426 [32];
  undefined1 auVar427 [32];
  float fVar431;
  float fVar432;
  float fVar434;
  float fVar435;
  float fVar436;
  float fVar437;
  float fVar438;
  float fVar440;
  float fVar442;
  float fVar444;
  float fVar445;
  undefined1 auVar428 [32];
  undefined1 auVar429 [32];
  float fVar446;
  float fVar447;
  float fVar448;
  undefined1 auVar449 [16];
  float fVar454;
  float fVar457;
  float fVar461;
  float fVar463;
  float fVar465;
  undefined1 auVar450 [32];
  undefined1 auVar451 [32];
  float fVar455;
  float fVar458;
  float fVar459;
  float fVar460;
  float fVar462;
  float fVar464;
  float fVar466;
  undefined1 auVar452 [32];
  float fVar456;
  undefined1 auVar453 [32];
  undefined1 auVar469 [16];
  float fVar467;
  float fVar468;
  float fVar473;
  float fVar475;
  float fVar479;
  float fVar481;
  float fVar483;
  float in_register_0000159c;
  undefined1 auVar470 [32];
  float fVar474;
  float fVar476;
  float fVar477;
  float fVar478;
  float fVar480;
  float fVar482;
  float fVar484;
  float fVar485;
  undefined1 auVar471 [32];
  undefined1 auVar472 [32];
  float fVar486;
  float fVar488;
  float fVar489;
  float fVar490;
  float fVar491;
  float fVar492;
  float fVar493;
  float in_register_000015dc;
  undefined1 auVar487 [32];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vfloatx_conflict u_outer1;
  vfloatx_conflict u_outer0;
  vboolx_conflict valid;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  bool local_cc9;
  float local_cc0;
  undefined1 local_c40 [8];
  float fStack_c38;
  float fStack_c34;
  float fStack_c30;
  float fStack_c2c;
  float fStack_c28;
  float fStack_c24;
  uint uStack_b84;
  undefined8 local_b20;
  undefined8 uStack_b18;
  undefined8 local_b10;
  undefined8 uStack_b08;
  undefined1 local_b00 [8];
  float fStack_af8;
  float fStack_af4;
  undefined1 local_af0 [8];
  float fStack_ae8;
  float fStack_ae4;
  undefined1 local_ae0 [8];
  float fStack_ad8;
  float fStack_ad4;
  undefined1 local_ad0 [8];
  float fStack_ac8;
  float fStack_ac4;
  undefined1 local_ac0 [8];
  float fStack_ab8;
  float fStack_ab4;
  float fStack_ab0;
  float fStack_aac;
  float fStack_aa8;
  float fStack_aa4;
  undefined1 local_aa0 [8];
  float fStack_a98;
  float fStack_a94;
  undefined1 auStack_a90 [16];
  undefined1 local_a80 [32];
  undefined1 local_a60 [32];
  undefined8 *local_a30;
  undefined8 *local_a28;
  undefined1 (*local_a20) [32];
  ulong local_a18;
  RTCFilterFunctionNArguments local_a10;
  undefined1 local_9e0 [8];
  float fStack_9d8;
  float fStack_9d4;
  float fStack_9d0;
  float fStack_9cc;
  float fStack_9c8;
  float fStack_9c4;
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [8];
  float fStack_998;
  float fStack_994;
  float fStack_990;
  float fStack_98c;
  float fStack_988;
  float fStack_984;
  undefined1 local_980 [16];
  undefined1 local_970 [8];
  float fStack_968;
  float fStack_964;
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  undefined1 local_900 [32];
  undefined1 local_8e0 [8];
  float fStack_8d8;
  float fStack_8d4;
  float fStack_8d0;
  float fStack_8cc;
  float fStack_8c8;
  float fStack_8c4;
  undefined1 local_8b0 [16];
  undefined1 local_8a0 [16];
  Primitive *local_890;
  ulong local_888;
  undefined1 local_880 [8];
  float fStack_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  undefined1 local_860 [8];
  float fStack_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float fStack_848;
  float fStack_844;
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [8];
  float fStack_7f8;
  float fStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  float fStack_7e8;
  float fStack_7e4;
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [8];
  float fStack_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  float fStack_748;
  undefined1 local_740 [8];
  float fStack_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  ulong local_720;
  undefined1 auStack_718 [24];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [8];
  float fStack_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float fStack_6a8;
  float fStack_6a4;
  undefined1 local_6a0 [16];
  undefined1 auStack_690 [16];
  undefined1 local_680 [32];
  float local_660 [4];
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  float fStack_644;
  float local_640 [4];
  float fStack_630;
  float fStack_62c;
  float fStack_628;
  float fStack_624;
  RTCHitN local_620 [16];
  undefined1 auStack_610 [16];
  undefined1 local_600 [16];
  undefined1 local_5f0 [16];
  undefined1 local_5e0 [16];
  undefined1 local_5d0 [16];
  undefined1 local_5c0 [16];
  undefined1 local_5b0 [16];
  undefined1 local_5a0 [32];
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 uStack_570;
  undefined8 uStack_568;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 uStack_550;
  undefined8 uStack_548;
  uint local_540;
  uint uStack_53c;
  uint uStack_538;
  uint uStack_534;
  uint uStack_530;
  uint uStack_52c;
  uint uStack_528;
  uint uStack_524;
  uint local_520;
  uint uStack_51c;
  uint uStack_518;
  uint uStack_514;
  uint uStack_510;
  uint uStack_50c;
  uint uStack_508;
  uint uStack_504;
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  undefined1 local_3e0 [8];
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  undefined1 local_320 [8];
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  undefined1 local_300 [32];
  undefined1 local_2e0 [8];
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  undefined1 local_1c0 [8];
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  undefined1 local_1a0 [8];
  float fStack_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  undefined4 uStack_184;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  float afStack_140 [2];
  uint auStack_138 [66];
  
  PVar24 = prim[1];
  uVar129 = (ulong)(byte)PVar24;
  lVar125 = uVar129 * 0x25;
  fVar243 = *(float *)(prim + lVar125 + 0x12);
  auVar169 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x10);
  auVar169 = vinsertps_avx(auVar169,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar36 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar36 = vinsertps_avx(auVar36,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar169 = vsubps_avx(auVar169,*(undefined1 (*) [16])(prim + lVar125 + 6));
  auVar165._0_4_ = fVar243 * auVar169._0_4_;
  auVar165._4_4_ = fVar243 * auVar169._4_4_;
  auVar165._8_4_ = fVar243 * auVar169._8_4_;
  auVar165._12_4_ = fVar243 * auVar169._12_4_;
  auVar289._0_4_ = fVar243 * auVar36._0_4_;
  auVar289._4_4_ = fVar243 * auVar36._4_4_;
  auVar289._8_4_ = fVar243 * auVar36._8_4_;
  auVar289._12_4_ = fVar243 * auVar36._12_4_;
  auVar169 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar129 * 4 + 6)));
  auVar36 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar129 * 4 + 10)));
  auVar142._16_16_ = auVar36;
  auVar142._0_16_ = auVar169;
  lVar27 = uVar129 * 5;
  auVar169 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar27 + 6)));
  auVar36 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar27 + 10)));
  auVar142 = vcvtdq2ps_avx(auVar142);
  auVar222._16_16_ = auVar36;
  auVar222._0_16_ = auVar169;
  auVar152 = vcvtdq2ps_avx(auVar222);
  auVar169 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar129 * 6 + 6)));
  auVar36 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar129 * 6 + 10)));
  auVar252._16_16_ = auVar36;
  auVar252._0_16_ = auVar169;
  auVar169 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar129 * 0xf + 6)));
  auVar30 = vcvtdq2ps_avx(auVar252);
  auVar36 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar129 * 0xf + 10)));
  auVar253._16_16_ = auVar36;
  auVar253._0_16_ = auVar169;
  lVar127 = (ulong)(byte)PVar24 * 0x10;
  auVar169 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar127 + 6)));
  auVar31 = vcvtdq2ps_avx(auVar253);
  auVar36 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar127 + 10)));
  auVar318._16_16_ = auVar36;
  auVar318._0_16_ = auVar169;
  auVar372 = vcvtdq2ps_avx(auVar318);
  auVar169 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar127 + uVar129 + 6)));
  auVar36 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar127 + uVar129 + 10)));
  auVar331._16_16_ = auVar36;
  auVar331._0_16_ = auVar169;
  auVar32 = vcvtdq2ps_avx(auVar331);
  auVar169 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar129 * 0x1a + 6)));
  auVar36 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar129 * 0x1a + 10)));
  auVar355._16_16_ = auVar36;
  auVar355._0_16_ = auVar169;
  auVar169 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar129 * 0x1b + 6)));
  auVar36 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar129 * 0x1b + 10)));
  auVar33 = vcvtdq2ps_avx(auVar355);
  auVar367._16_16_ = auVar36;
  auVar367._0_16_ = auVar169;
  auVar34 = vcvtdq2ps_avx(auVar367);
  auVar169 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar129 * 0x1c + 6)));
  auVar36 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar129 * 0x1c + 10)));
  auVar396._16_16_ = auVar36;
  auVar396._0_16_ = auVar169;
  auVar35 = vcvtdq2ps_avx(auVar396);
  auVar169 = vshufps_avx(auVar289,auVar289,0);
  auVar36 = vshufps_avx(auVar289,auVar289,0x55);
  auVar37 = vshufps_avx(auVar289,auVar289,0xaa);
  fVar243 = auVar37._0_4_;
  fVar164 = auVar37._4_4_;
  fVar259 = auVar37._8_4_;
  fVar203 = auVar37._12_4_;
  fVar260 = auVar36._0_4_;
  fVar207 = auVar36._4_4_;
  fVar261 = auVar36._8_4_;
  fVar236 = auVar36._12_4_;
  fVar262 = auVar169._0_4_;
  fVar263 = auVar169._4_4_;
  fVar264 = auVar169._8_4_;
  fVar265 = auVar169._12_4_;
  auVar424._0_4_ = fVar262 * auVar142._0_4_ + fVar260 * auVar152._0_4_ + fVar243 * auVar30._0_4_;
  auVar424._4_4_ = fVar263 * auVar142._4_4_ + fVar207 * auVar152._4_4_ + fVar164 * auVar30._4_4_;
  auVar424._8_4_ = fVar264 * auVar142._8_4_ + fVar261 * auVar152._8_4_ + fVar259 * auVar30._8_4_;
  auVar424._12_4_ = fVar265 * auVar142._12_4_ + fVar236 * auVar152._12_4_ + fVar203 * auVar30._12_4_
  ;
  auVar424._16_4_ = fVar262 * auVar142._16_4_ + fVar260 * auVar152._16_4_ + fVar243 * auVar30._16_4_
  ;
  auVar424._20_4_ = fVar263 * auVar142._20_4_ + fVar207 * auVar152._20_4_ + fVar164 * auVar30._20_4_
  ;
  auVar424._24_4_ = fVar264 * auVar142._24_4_ + fVar261 * auVar152._24_4_ + fVar259 * auVar30._24_4_
  ;
  auVar424._28_4_ = fVar236 + in_register_000015dc + in_register_0000151c;
  auVar406._0_4_ = fVar262 * auVar31._0_4_ + fVar260 * auVar372._0_4_ + fVar243 * auVar32._0_4_;
  auVar406._4_4_ = fVar263 * auVar31._4_4_ + fVar207 * auVar372._4_4_ + fVar164 * auVar32._4_4_;
  auVar406._8_4_ = fVar264 * auVar31._8_4_ + fVar261 * auVar372._8_4_ + fVar259 * auVar32._8_4_;
  auVar406._12_4_ = fVar265 * auVar31._12_4_ + fVar236 * auVar372._12_4_ + fVar203 * auVar32._12_4_;
  auVar406._16_4_ = fVar262 * auVar31._16_4_ + fVar260 * auVar372._16_4_ + fVar243 * auVar32._16_4_;
  auVar406._20_4_ = fVar263 * auVar31._20_4_ + fVar207 * auVar372._20_4_ + fVar164 * auVar32._20_4_;
  auVar406._24_4_ = fVar264 * auVar31._24_4_ + fVar261 * auVar372._24_4_ + fVar259 * auVar32._24_4_;
  auVar406._28_4_ = fVar236 + in_register_000015dc + in_register_0000159c;
  auVar293._0_4_ = fVar262 * auVar33._0_4_ + fVar260 * auVar34._0_4_ + auVar35._0_4_ * fVar243;
  auVar293._4_4_ = fVar263 * auVar33._4_4_ + fVar207 * auVar34._4_4_ + auVar35._4_4_ * fVar164;
  auVar293._8_4_ = fVar264 * auVar33._8_4_ + fVar261 * auVar34._8_4_ + auVar35._8_4_ * fVar259;
  auVar293._12_4_ = fVar265 * auVar33._12_4_ + fVar236 * auVar34._12_4_ + auVar35._12_4_ * fVar203;
  auVar293._16_4_ = fVar262 * auVar33._16_4_ + fVar260 * auVar34._16_4_ + auVar35._16_4_ * fVar243;
  auVar293._20_4_ = fVar263 * auVar33._20_4_ + fVar207 * auVar34._20_4_ + auVar35._20_4_ * fVar164;
  auVar293._24_4_ = fVar264 * auVar33._24_4_ + fVar261 * auVar34._24_4_ + auVar35._24_4_ * fVar259;
  auVar293._28_4_ = fVar265 + fVar236 + fVar203;
  auVar169 = vshufps_avx(auVar165,auVar165,0);
  auVar36 = vshufps_avx(auVar165,auVar165,0x55);
  auVar37 = vshufps_avx(auVar165,auVar165,0xaa);
  fVar164 = auVar37._0_4_;
  fVar259 = auVar37._4_4_;
  fVar203 = auVar37._8_4_;
  fVar260 = auVar37._12_4_;
  fVar263 = auVar36._0_4_;
  fVar264 = auVar36._4_4_;
  fVar265 = auVar36._8_4_;
  fVar280 = auVar36._12_4_;
  fVar207 = auVar169._0_4_;
  fVar261 = auVar169._4_4_;
  fVar236 = auVar169._8_4_;
  fVar262 = auVar169._12_4_;
  fVar243 = auVar142._28_4_;
  auVar223._0_4_ = fVar207 * auVar142._0_4_ + fVar263 * auVar152._0_4_ + fVar164 * auVar30._0_4_;
  auVar223._4_4_ = fVar261 * auVar142._4_4_ + fVar264 * auVar152._4_4_ + fVar259 * auVar30._4_4_;
  auVar223._8_4_ = fVar236 * auVar142._8_4_ + fVar265 * auVar152._8_4_ + fVar203 * auVar30._8_4_;
  auVar223._12_4_ = fVar262 * auVar142._12_4_ + fVar280 * auVar152._12_4_ + fVar260 * auVar30._12_4_
  ;
  auVar223._16_4_ = fVar207 * auVar142._16_4_ + fVar263 * auVar152._16_4_ + fVar164 * auVar30._16_4_
  ;
  auVar223._20_4_ = fVar261 * auVar142._20_4_ + fVar264 * auVar152._20_4_ + fVar259 * auVar30._20_4_
  ;
  auVar223._24_4_ = fVar236 * auVar142._24_4_ + fVar265 * auVar152._24_4_ + fVar203 * auVar30._24_4_
  ;
  auVar223._28_4_ = fVar243 + auVar152._28_4_ + auVar30._28_4_;
  auVar182._0_4_ = fVar207 * auVar31._0_4_ + fVar263 * auVar372._0_4_ + fVar164 * auVar32._0_4_;
  auVar182._4_4_ = fVar261 * auVar31._4_4_ + fVar264 * auVar372._4_4_ + fVar259 * auVar32._4_4_;
  auVar182._8_4_ = fVar236 * auVar31._8_4_ + fVar265 * auVar372._8_4_ + fVar203 * auVar32._8_4_;
  auVar182._12_4_ = fVar262 * auVar31._12_4_ + fVar280 * auVar372._12_4_ + fVar260 * auVar32._12_4_;
  auVar182._16_4_ = fVar207 * auVar31._16_4_ + fVar263 * auVar372._16_4_ + fVar164 * auVar32._16_4_;
  auVar182._20_4_ = fVar261 * auVar31._20_4_ + fVar264 * auVar372._20_4_ + fVar259 * auVar32._20_4_;
  auVar182._24_4_ = fVar236 * auVar31._24_4_ + fVar265 * auVar372._24_4_ + fVar203 * auVar32._24_4_;
  auVar182._28_4_ = fVar243 + auVar30._28_4_ + auVar32._28_4_;
  auVar143._0_4_ = fVar207 * auVar33._0_4_ + fVar263 * auVar34._0_4_ + auVar35._0_4_ * fVar164;
  auVar143._4_4_ = fVar261 * auVar33._4_4_ + fVar264 * auVar34._4_4_ + auVar35._4_4_ * fVar259;
  auVar143._8_4_ = fVar236 * auVar33._8_4_ + fVar265 * auVar34._8_4_ + auVar35._8_4_ * fVar203;
  auVar143._12_4_ = fVar262 * auVar33._12_4_ + fVar280 * auVar34._12_4_ + auVar35._12_4_ * fVar260;
  auVar143._16_4_ = fVar207 * auVar33._16_4_ + fVar263 * auVar34._16_4_ + auVar35._16_4_ * fVar164;
  auVar143._20_4_ = fVar261 * auVar33._20_4_ + fVar264 * auVar34._20_4_ + auVar35._20_4_ * fVar259;
  auVar143._24_4_ = fVar236 * auVar33._24_4_ + fVar265 * auVar34._24_4_ + auVar35._24_4_ * fVar203;
  auVar143._28_4_ = fVar243 + auVar372._28_4_ + fVar260;
  auVar319._8_4_ = 0x7fffffff;
  auVar319._0_8_ = 0x7fffffff7fffffff;
  auVar319._12_4_ = 0x7fffffff;
  auVar319._16_4_ = 0x7fffffff;
  auVar319._20_4_ = 0x7fffffff;
  auVar319._24_4_ = 0x7fffffff;
  auVar319._28_4_ = 0x7fffffff;
  auVar332._8_4_ = 0x219392ef;
  auVar332._0_8_ = 0x219392ef219392ef;
  auVar332._12_4_ = 0x219392ef;
  auVar332._16_4_ = 0x219392ef;
  auVar332._20_4_ = 0x219392ef;
  auVar332._24_4_ = 0x219392ef;
  auVar332._28_4_ = 0x219392ef;
  auVar142 = vandps_avx(auVar424,auVar319);
  auVar142 = vcmpps_avx(auVar142,auVar332,1);
  auVar152 = vblendvps_avx(auVar424,auVar332,auVar142);
  auVar142 = vandps_avx(auVar406,auVar319);
  auVar142 = vcmpps_avx(auVar142,auVar332,1);
  auVar30 = vblendvps_avx(auVar406,auVar332,auVar142);
  auVar142 = vandps_avx(auVar293,auVar319);
  auVar142 = vcmpps_avx(auVar142,auVar332,1);
  auVar142 = vblendvps_avx(auVar293,auVar332,auVar142);
  auVar31 = vrcpps_avx(auVar152);
  fVar243 = auVar31._0_4_;
  fVar259 = auVar31._4_4_;
  auVar372._4_4_ = auVar152._4_4_ * fVar259;
  auVar372._0_4_ = auVar152._0_4_ * fVar243;
  fVar260 = auVar31._8_4_;
  auVar372._8_4_ = auVar152._8_4_ * fVar260;
  fVar261 = auVar31._12_4_;
  auVar372._12_4_ = auVar152._12_4_ * fVar261;
  fVar262 = auVar31._16_4_;
  auVar372._16_4_ = auVar152._16_4_ * fVar262;
  fVar263 = auVar31._20_4_;
  auVar372._20_4_ = auVar152._20_4_ * fVar263;
  fVar264 = auVar31._24_4_;
  auVar372._24_4_ = auVar152._24_4_ * fVar264;
  auVar372._28_4_ = auVar152._28_4_;
  auVar333._8_4_ = 0x3f800000;
  auVar333._0_8_ = &DAT_3f8000003f800000;
  auVar333._12_4_ = 0x3f800000;
  auVar333._16_4_ = 0x3f800000;
  auVar333._20_4_ = 0x3f800000;
  auVar333._24_4_ = 0x3f800000;
  auVar333._28_4_ = 0x3f800000;
  auVar32 = vsubps_avx(auVar333,auVar372);
  fVar243 = fVar243 + fVar243 * auVar32._0_4_;
  fVar259 = fVar259 + fVar259 * auVar32._4_4_;
  fVar260 = fVar260 + fVar260 * auVar32._8_4_;
  fVar261 = fVar261 + fVar261 * auVar32._12_4_;
  fVar262 = fVar262 + fVar262 * auVar32._16_4_;
  fVar263 = fVar263 + fVar263 * auVar32._20_4_;
  fVar264 = fVar264 + fVar264 * auVar32._24_4_;
  auVar372 = vrcpps_avx(auVar30);
  fVar265 = auVar372._0_4_;
  fVar280 = auVar372._4_4_;
  auVar152._4_4_ = fVar280 * auVar30._4_4_;
  auVar152._0_4_ = fVar265 * auVar30._0_4_;
  fVar281 = auVar372._8_4_;
  auVar152._8_4_ = fVar281 * auVar30._8_4_;
  fVar283 = auVar372._12_4_;
  auVar152._12_4_ = fVar283 * auVar30._12_4_;
  fVar284 = auVar372._16_4_;
  auVar152._16_4_ = fVar284 * auVar30._16_4_;
  fVar285 = auVar372._20_4_;
  auVar152._20_4_ = fVar285 * auVar30._20_4_;
  fVar286 = auVar372._24_4_;
  auVar152._24_4_ = fVar286 * auVar30._24_4_;
  auVar152._28_4_ = auVar30._28_4_;
  auVar30 = vsubps_avx(auVar333,auVar152);
  fVar265 = fVar265 + fVar265 * auVar30._0_4_;
  fVar280 = fVar280 + fVar280 * auVar30._4_4_;
  fVar281 = fVar281 + fVar281 * auVar30._8_4_;
  fVar283 = fVar283 + fVar283 * auVar30._12_4_;
  fVar284 = fVar284 + fVar284 * auVar30._16_4_;
  fVar285 = fVar285 + fVar285 * auVar30._20_4_;
  fVar286 = fVar286 + fVar286 * auVar30._24_4_;
  auVar152 = vrcpps_avx(auVar142);
  fVar287 = auVar152._0_4_;
  fVar301 = auVar152._4_4_;
  auVar33._4_4_ = fVar301 * auVar142._4_4_;
  auVar33._0_4_ = fVar287 * auVar142._0_4_;
  fVar303 = auVar152._8_4_;
  auVar33._8_4_ = fVar303 * auVar142._8_4_;
  fVar305 = auVar152._12_4_;
  auVar33._12_4_ = fVar305 * auVar142._12_4_;
  fVar307 = auVar152._16_4_;
  auVar33._16_4_ = fVar307 * auVar142._16_4_;
  fVar309 = auVar152._20_4_;
  auVar33._20_4_ = fVar309 * auVar142._20_4_;
  fVar311 = auVar152._24_4_;
  auVar33._24_4_ = fVar311 * auVar142._24_4_;
  auVar33._28_4_ = auVar142._28_4_;
  auVar142 = vsubps_avx(auVar333,auVar33);
  fVar287 = fVar287 + fVar287 * auVar142._0_4_;
  fVar301 = fVar301 + fVar301 * auVar142._4_4_;
  fVar303 = fVar303 + fVar303 * auVar142._8_4_;
  fVar305 = fVar305 + fVar305 * auVar142._12_4_;
  fVar307 = fVar307 + fVar307 * auVar142._16_4_;
  fVar309 = fVar309 + fVar309 * auVar142._20_4_;
  fVar311 = fVar311 + fVar311 * auVar142._24_4_;
  auVar169 = ZEXT416((uint)((*(float *)(ray + k * 4 + 0xe0) - *(float *)(prim + lVar125 + 0x16)) *
                           *(float *)(prim + lVar125 + 0x1a)));
  auVar248 = vshufps_avx(auVar169,auVar169,0);
  auVar169._8_8_ = 0;
  auVar169._0_8_ = *(ulong *)(prim + uVar129 * 7 + 6);
  auVar169 = vpmovsxwd_avx(auVar169);
  auVar36._8_8_ = 0;
  auVar36._0_8_ = *(ulong *)(prim + uVar129 * 7 + 0xe);
  auVar36 = vpmovsxwd_avx(auVar36);
  auVar334._16_16_ = auVar36;
  auVar334._0_16_ = auVar169;
  auVar37._8_8_ = 0;
  auVar37._0_8_ = *(ulong *)(prim + uVar129 * 0xb + 6);
  auVar169 = vpmovsxwd_avx(auVar37);
  auVar142 = vcvtdq2ps_avx(auVar334);
  auVar179._8_8_ = 0;
  auVar179._0_8_ = *(ulong *)(prim + uVar129 * 0xb + 0xe);
  auVar36 = vpmovsxwd_avx(auVar179);
  auVar356._16_16_ = auVar36;
  auVar356._0_16_ = auVar169;
  auVar152 = vcvtdq2ps_avx(auVar356);
  auVar152 = vsubps_avx(auVar152,auVar142);
  fVar164 = auVar248._0_4_;
  fVar203 = auVar248._4_4_;
  fVar207 = auVar248._8_4_;
  fVar236 = auVar248._12_4_;
  auVar335._0_4_ = auVar152._0_4_ * fVar164 + auVar142._0_4_;
  auVar335._4_4_ = auVar152._4_4_ * fVar203 + auVar142._4_4_;
  auVar335._8_4_ = auVar152._8_4_ * fVar207 + auVar142._8_4_;
  auVar335._12_4_ = auVar152._12_4_ * fVar236 + auVar142._12_4_;
  auVar335._16_4_ = auVar152._16_4_ * fVar164 + auVar142._16_4_;
  auVar335._20_4_ = auVar152._20_4_ * fVar203 + auVar142._20_4_;
  auVar335._24_4_ = auVar152._24_4_ * fVar207 + auVar142._24_4_;
  auVar335._28_4_ = auVar152._28_4_ + auVar142._28_4_;
  auVar248._8_8_ = 0;
  auVar248._0_8_ = *(ulong *)(prim + uVar129 * 9 + 6);
  auVar169 = vpmovsxwd_avx(auVar248);
  auVar138._8_8_ = 0;
  auVar138._0_8_ = *(ulong *)(prim + uVar129 * 9 + 0xe);
  auVar36 = vpmovsxwd_avx(auVar138);
  auVar357._16_16_ = auVar36;
  auVar357._0_16_ = auVar169;
  auVar174._8_8_ = 0;
  auVar174._0_8_ = *(ulong *)(prim + uVar129 * 0xd + 6);
  auVar169 = vpmovsxwd_avx(auVar174);
  auVar142 = vcvtdq2ps_avx(auVar357);
  auVar175._8_8_ = 0;
  auVar175._0_8_ = *(ulong *)(prim + uVar129 * 0xd + 0xe);
  auVar36 = vpmovsxwd_avx(auVar175);
  auVar368._16_16_ = auVar36;
  auVar368._0_16_ = auVar169;
  auVar152 = vcvtdq2ps_avx(auVar368);
  auVar152 = vsubps_avx(auVar152,auVar142);
  auVar358._0_4_ = auVar142._0_4_ + auVar152._0_4_ * fVar164;
  auVar358._4_4_ = auVar142._4_4_ + auVar152._4_4_ * fVar203;
  auVar358._8_4_ = auVar142._8_4_ + auVar152._8_4_ * fVar207;
  auVar358._12_4_ = auVar142._12_4_ + auVar152._12_4_ * fVar236;
  auVar358._16_4_ = auVar142._16_4_ + auVar152._16_4_ * fVar164;
  auVar358._20_4_ = auVar142._20_4_ + auVar152._20_4_ * fVar203;
  auVar358._24_4_ = auVar142._24_4_ + auVar152._24_4_ * fVar207;
  auVar358._28_4_ = auVar142._28_4_ + auVar152._28_4_;
  auVar178._8_8_ = 0;
  auVar178._0_8_ = *(ulong *)(prim + uVar129 * 0x12 + 6);
  auVar169 = vpmovsxwd_avx(auVar178);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar129 * 0x12 + 0xe);
  auVar36 = vpmovsxwd_avx(auVar9);
  auVar369._16_16_ = auVar36;
  auVar369._0_16_ = auVar169;
  uVar123 = (ulong)(uint)((int)lVar27 << 2);
  lVar125 = uVar129 * 2 + uVar123;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + lVar125 + 6);
  auVar169 = vpmovsxwd_avx(auVar10);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + lVar125 + 0xe);
  auVar36 = vpmovsxwd_avx(auVar11);
  auVar142 = vcvtdq2ps_avx(auVar369);
  auVar397._16_16_ = auVar36;
  auVar397._0_16_ = auVar169;
  auVar152 = vcvtdq2ps_avx(auVar397);
  auVar152 = vsubps_avx(auVar152,auVar142);
  auVar370._0_4_ = auVar142._0_4_ + auVar152._0_4_ * fVar164;
  auVar370._4_4_ = auVar142._4_4_ + auVar152._4_4_ * fVar203;
  auVar370._8_4_ = auVar142._8_4_ + auVar152._8_4_ * fVar207;
  auVar370._12_4_ = auVar142._12_4_ + auVar152._12_4_ * fVar236;
  auVar370._16_4_ = auVar142._16_4_ + auVar152._16_4_ * fVar164;
  auVar370._20_4_ = auVar142._20_4_ + auVar152._20_4_ * fVar203;
  auVar370._24_4_ = auVar142._24_4_ + auVar152._24_4_ * fVar207;
  auVar370._28_4_ = auVar142._28_4_ + auVar152._28_4_;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar123 + 6);
  auVar169 = vpmovsxwd_avx(auVar12);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar123 + 0xe);
  auVar36 = vpmovsxwd_avx(auVar13);
  auVar398._16_16_ = auVar36;
  auVar398._0_16_ = auVar169;
  auVar142 = vcvtdq2ps_avx(auVar398);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar129 * 0x18 + 6);
  auVar169 = vpmovsxwd_avx(auVar14);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar129 * 0x18 + 0xe);
  auVar36 = vpmovsxwd_avx(auVar15);
  auVar407._16_16_ = auVar36;
  auVar407._0_16_ = auVar169;
  auVar152 = vcvtdq2ps_avx(auVar407);
  auVar152 = vsubps_avx(auVar152,auVar142);
  auVar399._0_4_ = auVar142._0_4_ + auVar152._0_4_ * fVar164;
  auVar399._4_4_ = auVar142._4_4_ + auVar152._4_4_ * fVar203;
  auVar399._8_4_ = auVar142._8_4_ + auVar152._8_4_ * fVar207;
  auVar399._12_4_ = auVar142._12_4_ + auVar152._12_4_ * fVar236;
  auVar399._16_4_ = auVar142._16_4_ + auVar152._16_4_ * fVar164;
  auVar399._20_4_ = auVar142._20_4_ + auVar152._20_4_ * fVar203;
  auVar399._24_4_ = auVar142._24_4_ + auVar152._24_4_ * fVar207;
  auVar399._28_4_ = auVar142._28_4_ + auVar152._28_4_;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar129 * 0x1d + 6);
  auVar169 = vpmovsxwd_avx(auVar16);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar129 * 0x1d + 0xe);
  auVar36 = vpmovsxwd_avx(auVar17);
  auVar408._16_16_ = auVar36;
  auVar408._0_16_ = auVar169;
  lVar125 = uVar129 + (ulong)(byte)PVar24 * 0x20;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + lVar125 + 6);
  auVar169 = vpmovsxwd_avx(auVar18);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + lVar125 + 0xe);
  auVar36 = vpmovsxwd_avx(auVar19);
  auVar425._16_16_ = auVar36;
  auVar425._0_16_ = auVar169;
  auVar142 = vcvtdq2ps_avx(auVar408);
  auVar152 = vcvtdq2ps_avx(auVar425);
  auVar152 = vsubps_avx(auVar152,auVar142);
  auVar409._0_4_ = auVar142._0_4_ + auVar152._0_4_ * fVar164;
  auVar409._4_4_ = auVar142._4_4_ + auVar152._4_4_ * fVar203;
  auVar409._8_4_ = auVar142._8_4_ + auVar152._8_4_ * fVar207;
  auVar409._12_4_ = auVar142._12_4_ + auVar152._12_4_ * fVar236;
  auVar409._16_4_ = auVar142._16_4_ + auVar152._16_4_ * fVar164;
  auVar409._20_4_ = auVar142._20_4_ + auVar152._20_4_ * fVar203;
  auVar409._24_4_ = auVar142._24_4_ + auVar152._24_4_ * fVar207;
  auVar409._28_4_ = auVar142._28_4_ + auVar152._28_4_;
  lVar125 = (ulong)(byte)PVar24 * 0x20 - uVar129;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + lVar125 + 6);
  auVar169 = vpmovsxwd_avx(auVar20);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + lVar125 + 0xe);
  auVar36 = vpmovsxwd_avx(auVar21);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(prim + uVar129 * 0x23 + 6);
  auVar37 = vpmovsxwd_avx(auVar22);
  auVar426._16_16_ = auVar36;
  auVar426._0_16_ = auVar169;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *(ulong *)(prim + uVar129 * 0x23 + 0xe);
  auVar169 = vpmovsxwd_avx(auVar23);
  auVar450._16_16_ = auVar169;
  auVar450._0_16_ = auVar37;
  auVar142 = vcvtdq2ps_avx(auVar426);
  auVar152 = vcvtdq2ps_avx(auVar450);
  auVar152 = vsubps_avx(auVar152,auVar142);
  auVar427._0_4_ = auVar142._0_4_ + auVar152._0_4_ * fVar164;
  auVar427._4_4_ = auVar142._4_4_ + auVar152._4_4_ * fVar203;
  auVar427._8_4_ = auVar142._8_4_ + auVar152._8_4_ * fVar207;
  auVar427._12_4_ = auVar142._12_4_ + auVar152._12_4_ * fVar236;
  auVar427._16_4_ = auVar142._16_4_ + auVar152._16_4_ * fVar164;
  auVar427._20_4_ = auVar142._20_4_ + auVar152._20_4_ * fVar203;
  auVar427._24_4_ = auVar142._24_4_ + auVar152._24_4_ * fVar207;
  auVar427._28_4_ = auVar142._28_4_ + fVar236;
  auVar142 = vsubps_avx(auVar335,auVar223);
  auVar314._0_4_ = fVar243 * auVar142._0_4_;
  auVar314._4_4_ = fVar259 * auVar142._4_4_;
  auVar314._8_4_ = fVar260 * auVar142._8_4_;
  auVar314._12_4_ = fVar261 * auVar142._12_4_;
  auVar34._16_4_ = fVar262 * auVar142._16_4_;
  auVar34._0_16_ = auVar314;
  auVar34._20_4_ = fVar263 * auVar142._20_4_;
  auVar34._24_4_ = fVar264 * auVar142._24_4_;
  auVar34._28_4_ = auVar142._28_4_;
  auVar142 = vsubps_avx(auVar358,auVar223);
  auVar244._0_4_ = fVar243 * auVar142._0_4_;
  auVar244._4_4_ = fVar259 * auVar142._4_4_;
  auVar244._8_4_ = fVar260 * auVar142._8_4_;
  auVar244._12_4_ = fVar261 * auVar142._12_4_;
  auVar35._16_4_ = fVar262 * auVar142._16_4_;
  auVar35._0_16_ = auVar244;
  auVar35._20_4_ = fVar263 * auVar142._20_4_;
  auVar35._24_4_ = fVar264 * auVar142._24_4_;
  auVar35._28_4_ = auVar31._28_4_ + auVar32._28_4_;
  auVar142 = vsubps_avx(auVar370,auVar182);
  auVar212._0_4_ = fVar265 * auVar142._0_4_;
  auVar212._4_4_ = fVar280 * auVar142._4_4_;
  auVar212._8_4_ = fVar281 * auVar142._8_4_;
  auVar212._12_4_ = fVar283 * auVar142._12_4_;
  auVar31._16_4_ = fVar284 * auVar142._16_4_;
  auVar31._0_16_ = auVar212;
  auVar31._20_4_ = fVar285 * auVar142._20_4_;
  auVar31._24_4_ = fVar286 * auVar142._24_4_;
  auVar31._28_4_ = auVar142._28_4_;
  auVar142 = vsubps_avx(auVar399,auVar182);
  auVar266._0_4_ = fVar265 * auVar142._0_4_;
  auVar266._4_4_ = fVar280 * auVar142._4_4_;
  auVar266._8_4_ = fVar281 * auVar142._8_4_;
  auVar266._12_4_ = fVar283 * auVar142._12_4_;
  auVar32._16_4_ = fVar284 * auVar142._16_4_;
  auVar32._0_16_ = auVar266;
  auVar32._20_4_ = fVar285 * auVar142._20_4_;
  auVar32._24_4_ = fVar286 * auVar142._24_4_;
  auVar32._28_4_ = auVar372._28_4_ + auVar30._28_4_;
  auVar142 = vsubps_avx(auVar409,auVar143);
  auVar166._0_4_ = fVar287 * auVar142._0_4_;
  auVar166._4_4_ = fVar301 * auVar142._4_4_;
  auVar166._8_4_ = fVar303 * auVar142._8_4_;
  auVar166._12_4_ = fVar305 * auVar142._12_4_;
  auVar30._16_4_ = fVar307 * auVar142._16_4_;
  auVar30._0_16_ = auVar166;
  auVar30._20_4_ = fVar309 * auVar142._20_4_;
  auVar30._24_4_ = fVar311 * auVar142._24_4_;
  auVar30._28_4_ = auVar142._28_4_;
  auVar142 = vsubps_avx(auVar427,auVar143);
  auVar131._0_4_ = fVar287 * auVar142._0_4_;
  auVar131._4_4_ = fVar301 * auVar142._4_4_;
  auVar131._8_4_ = fVar303 * auVar142._8_4_;
  auVar131._12_4_ = fVar305 * auVar142._12_4_;
  auVar38._16_4_ = fVar307 * auVar142._16_4_;
  auVar38._0_16_ = auVar131;
  auVar38._20_4_ = fVar309 * auVar142._20_4_;
  auVar38._24_4_ = fVar311 * auVar142._24_4_;
  auVar38._28_4_ = auVar142._28_4_;
  auVar169 = vpminsd_avx(auVar34._16_16_,auVar35._16_16_);
  auVar36 = vpminsd_avx(auVar314,auVar244);
  auVar359._16_16_ = auVar169;
  auVar359._0_16_ = auVar36;
  auVar169 = vpminsd_avx(auVar31._16_16_,auVar32._16_16_);
  auVar36 = vpminsd_avx(auVar212,auVar266);
  auVar410._16_16_ = auVar169;
  auVar410._0_16_ = auVar36;
  auVar142 = vmaxps_avx(auVar359,auVar410);
  auVar169 = vpminsd_avx(auVar30._16_16_,auVar38._16_16_);
  auVar36 = vpminsd_avx(auVar166,auVar131);
  auVar451._16_16_ = auVar169;
  auVar451._0_16_ = auVar36;
  uVar7 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar470._4_4_ = uVar7;
  auVar470._0_4_ = uVar7;
  auVar470._8_4_ = uVar7;
  auVar470._12_4_ = uVar7;
  auVar470._16_4_ = uVar7;
  auVar470._20_4_ = uVar7;
  auVar470._24_4_ = uVar7;
  auVar470._28_4_ = uVar7;
  auVar152 = vmaxps_avx(auVar451,auVar470);
  auVar142 = vmaxps_avx(auVar142,auVar152);
  local_280._4_4_ = auVar142._4_4_ * 0.99999964;
  local_280._0_4_ = auVar142._0_4_ * 0.99999964;
  local_280._8_4_ = auVar142._8_4_ * 0.99999964;
  local_280._12_4_ = auVar142._12_4_ * 0.99999964;
  local_280._16_4_ = auVar142._16_4_ * 0.99999964;
  local_280._20_4_ = auVar142._20_4_ * 0.99999964;
  local_280._24_4_ = auVar142._24_4_ * 0.99999964;
  local_280._28_4_ = auVar142._28_4_;
  auVar169 = vpmaxsd_avx(auVar34._16_16_,auVar35._16_16_);
  auVar36 = vpmaxsd_avx(auVar314,auVar244);
  auVar254._16_16_ = auVar169;
  auVar254._0_16_ = auVar36;
  auVar169 = vpmaxsd_avx(auVar31._16_16_,auVar32._16_16_);
  auVar36 = vpmaxsd_avx(auVar212,auVar266);
  auVar224._16_16_ = auVar169;
  auVar224._0_16_ = auVar36;
  auVar142 = vminps_avx(auVar254,auVar224);
  auVar169 = vpmaxsd_avx(auVar30._16_16_,auVar38._16_16_);
  auVar36 = vpmaxsd_avx(auVar166,auVar131);
  auVar144._16_16_ = auVar169;
  auVar144._0_16_ = auVar36;
  uVar7 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar183._4_4_ = uVar7;
  auVar183._0_4_ = uVar7;
  auVar183._8_4_ = uVar7;
  auVar183._12_4_ = uVar7;
  auVar183._16_4_ = uVar7;
  auVar183._20_4_ = uVar7;
  auVar183._24_4_ = uVar7;
  auVar183._28_4_ = uVar7;
  auVar152 = vminps_avx(auVar144,auVar183);
  auVar142 = vminps_avx(auVar142,auVar152);
  auVar39._4_4_ = auVar142._4_4_ * 1.0000004;
  auVar39._0_4_ = auVar142._0_4_ * 1.0000004;
  auVar39._8_4_ = auVar142._8_4_ * 1.0000004;
  auVar39._12_4_ = auVar142._12_4_ * 1.0000004;
  auVar39._16_4_ = auVar142._16_4_ * 1.0000004;
  auVar39._20_4_ = auVar142._20_4_ * 1.0000004;
  auVar39._24_4_ = auVar142._24_4_ * 1.0000004;
  auVar39._28_4_ = auVar142._28_4_;
  auVar142 = vcmpps_avx(local_280,auVar39,2);
  auVar169 = vpshufd_avx(ZEXT116((byte)PVar24),0);
  auVar184._16_16_ = auVar169;
  auVar184._0_16_ = auVar169;
  auVar152 = vcvtdq2ps_avx(auVar184);
  auVar152 = vcmpps_avx(_DAT_02020f40,auVar152,1);
  auVar142 = vandps_avx(auVar142,auVar152);
  uVar120 = vmovmskps_avx(auVar142);
  local_cc9 = uVar120 != 0;
  if (uVar120 == 0) {
    return local_cc9;
  }
  uVar120 = uVar120 & 0xff;
  auVar145._16_16_ = mm_lookupmask_ps._240_16_;
  auVar145._0_16_ = mm_lookupmask_ps._240_16_;
  local_480 = vblendps_avx(auVar145,ZEXT832(0) << 0x20,0x80);
  local_a20 = (undefined1 (*) [32])&local_540;
  uVar124 = 1 << ((byte)k & 0x1f);
  local_a28 = (undefined8 *)(mm_lookupmask_ps + ((uVar124 & 0xf) << 4));
  local_a30 = (undefined8 *)(mm_lookupmask_ps + (long)((int)uVar124 >> 4) * 0x10);
  local_890 = prim;
LAB_01287320:
  local_888 = (ulong)uVar120;
  lVar125 = 0;
  if (local_888 != 0) {
    for (; (uVar120 >> lVar125 & 1) == 0; lVar125 = lVar125 + 1) {
    }
  }
  local_a18 = (ulong)*(uint *)(local_890 + 2);
  pGVar25 = (context->scene->geometries).items[local_a18].ptr;
  uVar129 = (ulong)*(uint *)(*(long *)&pGVar25->field_0x58 +
                            (ulong)*(uint *)(local_890 + lVar125 * 4 + 6) *
                            pGVar25[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                            _M_i);
  fVar243 = (pGVar25->time_range).lower;
  fVar243 = pGVar25->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0xe0) - fVar243) / ((pGVar25->time_range).upper - fVar243));
  auVar169 = vroundss_avx(ZEXT416((uint)fVar243),ZEXT416((uint)fVar243),9);
  auVar169 = vminss_avx(auVar169,ZEXT416((uint)(pGVar25->fnumTimeSegments + -1.0)));
  auVar169 = vmaxss_avx(ZEXT816(0) << 0x20,auVar169);
  fVar243 = fVar243 - auVar169._0_4_;
  _Var26 = pGVar25[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar128 = (long)(int)auVar169._0_4_ * 0x38;
  lVar27 = *(long *)(_Var26 + lVar128);
  lVar127 = *(long *)(_Var26 + 0x10 + lVar128);
  auVar169 = vshufps_avx(ZEXT416((uint)(1.0 - fVar243)),ZEXT416((uint)(1.0 - fVar243)),0);
  pfVar1 = (float *)(lVar27 + lVar127 * uVar129);
  fVar260 = auVar169._0_4_;
  fVar207 = auVar169._4_4_;
  fVar261 = auVar169._8_4_;
  fVar236 = auVar169._12_4_;
  pfVar2 = (float *)(lVar27 + lVar127 * (uVar129 + 1));
  pfVar3 = (float *)(lVar27 + lVar127 * (uVar129 + 2));
  pfVar4 = (float *)(lVar27 + lVar127 * (uVar129 + 3));
  lVar27 = *(long *)(_Var26 + 0x38 + lVar128);
  lVar127 = *(long *)(_Var26 + 0x48 + lVar128);
  auVar169 = vshufps_avx(ZEXT416((uint)fVar243),ZEXT416((uint)fVar243),0);
  pfVar5 = (float *)(lVar27 + uVar129 * lVar127);
  fVar262 = auVar169._0_4_;
  fVar263 = auVar169._4_4_;
  fVar264 = auVar169._8_4_;
  fVar265 = auVar169._12_4_;
  pfVar6 = (float *)(lVar27 + (uVar129 + 1) * lVar127);
  auVar245._0_4_ = fVar262 * *pfVar5 + fVar260 * *pfVar1;
  auVar245._4_4_ = fVar263 * pfVar5[1] + fVar207 * pfVar1[1];
  auVar245._8_4_ = fVar264 * pfVar5[2] + fVar261 * pfVar1[2];
  auVar245._12_4_ = fVar265 * pfVar5[3] + fVar236 * pfVar1[3];
  auVar169 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x1c);
  auVar36 = vinsertps_avx(auVar169,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  fVar243 = *(float *)(ray + k * 4 + 0x80);
  auVar423._4_4_ = fVar243;
  auVar423._0_4_ = fVar243;
  auVar423._8_4_ = fVar243;
  auVar423._12_4_ = fVar243;
  fStack_ab0 = fVar243;
  _local_ac0 = auVar423;
  fStack_aac = fVar243;
  fStack_aa8 = fVar243;
  fStack_aa4 = fVar243;
  fVar164 = *(float *)(ray + k * 4 + 0xa0);
  auVar449._4_4_ = fVar164;
  auVar449._0_4_ = fVar164;
  auVar449._8_4_ = fVar164;
  auVar449._12_4_ = fVar164;
  fStack_9d0 = fVar164;
  _local_9e0 = auVar449;
  fStack_9cc = fVar164;
  fStack_9c8 = fVar164;
  fStack_9c4 = fVar164;
  auVar213._0_4_ = fVar260 * *pfVar2 + fVar262 * *pfVar6;
  auVar213._4_4_ = fVar207 * pfVar2[1] + fVar263 * pfVar6[1];
  auVar213._8_4_ = fVar261 * pfVar2[2] + fVar264 * pfVar6[2];
  auVar213._12_4_ = fVar236 * pfVar2[3] + fVar265 * pfVar6[3];
  auVar169 = vunpcklps_avx(auVar423,auVar449);
  fVar259 = *(float *)(ray + k * 4 + 0xc0);
  auVar469._4_4_ = fVar259;
  auVar469._0_4_ = fVar259;
  auVar469._8_4_ = fVar259;
  auVar469._12_4_ = fVar259;
  fStack_8d0 = fVar259;
  _local_8e0 = auVar469;
  fStack_8cc = fVar259;
  fStack_8c8 = fVar259;
  fStack_8c4 = fVar259;
  _local_970 = vinsertps_avx(auVar169,auVar469,0x28);
  auVar132._0_4_ = (auVar245._0_4_ + auVar213._0_4_) * 0.5;
  auVar132._4_4_ = (auVar245._4_4_ + auVar213._4_4_) * 0.5;
  auVar132._8_4_ = (auVar245._8_4_ + auVar213._8_4_) * 0.5;
  auVar132._12_4_ = (auVar245._12_4_ + auVar213._12_4_) * 0.5;
  auVar169 = vsubps_avx(auVar132,auVar36);
  auVar169 = vdpps_avx(auVar169,_local_970,0x7f);
  local_980 = vdpps_avx(_local_970,_local_970,0x7f);
  auVar413 = ZEXT1664(local_980);
  pfVar1 = (float *)(lVar27 + (uVar129 + 2) * lVar127);
  auVar167._0_4_ = fVar260 * *pfVar3 + fVar262 * *pfVar1;
  auVar167._4_4_ = fVar207 * pfVar3[1] + fVar263 * pfVar1[1];
  auVar167._8_4_ = fVar261 * pfVar3[2] + fVar264 * pfVar1[2];
  auVar167._12_4_ = fVar236 * pfVar3[3] + fVar265 * pfVar1[3];
  auVar37 = vrcpss_avx(local_980,local_980);
  fVar203 = auVar169._0_4_ * (2.0 - local_980._0_4_ * auVar37._0_4_) * auVar37._0_4_;
  auVar362 = ZEXT464((uint)fVar203);
  auVar37 = vshufps_avx(ZEXT416((uint)fVar203),ZEXT416((uint)fVar203),0);
  auVar315._0_4_ = auVar36._0_4_ + local_970._0_4_ * auVar37._0_4_;
  auVar315._4_4_ = auVar36._4_4_ + local_970._4_4_ * auVar37._4_4_;
  auVar315._8_4_ = auVar36._8_4_ + local_970._8_4_ * auVar37._8_4_;
  auVar315._12_4_ = auVar36._12_4_ + local_970._12_4_ * auVar37._12_4_;
  auVar169 = vblendps_avx(auVar315,_DAT_01feba10,8);
  _local_ad0 = vsubps_avx(auVar245,auVar169);
  _local_ae0 = vsubps_avx(auVar167,auVar169);
  pfVar1 = (float *)(lVar27 + lVar127 * (uVar129 + 3));
  auVar168._0_4_ = fVar260 * *pfVar4 + fVar262 * *pfVar1;
  auVar168._4_4_ = fVar207 * pfVar4[1] + fVar263 * pfVar1[1];
  auVar168._8_4_ = fVar261 * pfVar4[2] + fVar264 * pfVar1[2];
  auVar168._12_4_ = fVar236 * pfVar4[3] + fVar265 * pfVar1[3];
  _local_af0 = vsubps_avx(auVar213,auVar169);
  _local_b00 = vsubps_avx(auVar168,auVar169);
  auVar169 = vshufps_avx(_local_ad0,_local_ad0,0);
  register0x00001250 = auVar169;
  _local_340 = auVar169;
  auVar169 = vshufps_avx(_local_ad0,_local_ad0,0x55);
  register0x00001250 = auVar169;
  _local_1a0 = auVar169;
  auVar169 = vshufps_avx(_local_ad0,_local_ad0,0xaa);
  register0x00001250 = auVar169;
  _local_1c0 = auVar169;
  auVar169 = vshufps_avx(_local_ad0,_local_ad0,0xff);
  register0x00001290 = auVar169;
  _local_1e0 = auVar169;
  auVar169 = vshufps_avx(_local_af0,_local_af0,0);
  register0x00001290 = auVar169;
  _local_360 = auVar169;
  auVar169 = vshufps_avx(_local_af0,_local_af0,0x55);
  register0x00001290 = auVar169;
  _local_380 = auVar169;
  auVar169 = vshufps_avx(_local_af0,_local_af0,0xaa);
  register0x00001290 = auVar169;
  _local_3a0 = auVar169;
  auVar169 = vshufps_avx(_local_af0,_local_af0,0xff);
  register0x00001290 = auVar169;
  _local_3c0 = auVar169;
  auVar169 = vshufps_avx(_local_ae0,_local_ae0,0);
  register0x00001290 = auVar169;
  _local_3e0 = auVar169;
  auVar169 = vshufps_avx(_local_ae0,_local_ae0,0x55);
  register0x00001290 = auVar169;
  _local_400 = auVar169;
  auVar169 = vshufps_avx(_local_ae0,_local_ae0,0xaa);
  register0x00001290 = auVar169;
  _local_420 = auVar169;
  auVar169 = vshufps_avx(_local_ae0,_local_ae0,0xff);
  register0x00001290 = auVar169;
  _local_440 = auVar169;
  auVar169 = vshufps_avx(_local_b00,_local_b00,0);
  local_840._16_16_ = auVar169;
  local_840._0_16_ = auVar169;
  auVar403 = ZEXT3264(local_840);
  auVar36 = vshufps_avx(_local_b00,_local_b00,0x55);
  auVar169 = vshufps_avx(_local_b00,_local_b00,0xaa);
  local_460._16_16_ = auVar169;
  local_460._0_16_ = auVar169;
  auVar169 = vshufps_avx(_local_b00,_local_b00,0xff);
  register0x00001290 = auVar169;
  _local_200 = auVar169;
  auVar169 = ZEXT416((uint)(fVar243 * fVar243 + fVar164 * fVar164 + fVar259 * fVar259));
  auVar169 = vshufps_avx(auVar169,auVar169,0);
  local_220._16_16_ = auVar169;
  local_220._0_16_ = auVar169;
  fVar243 = *(float *)(ray + k * 4 + 0x60);
  local_8b0 = ZEXT416((uint)fVar203);
  auVar169 = vshufps_avx(ZEXT416((uint)(fVar243 - fVar203)),ZEXT416((uint)(fVar243 - fVar203)),0);
  local_260._16_16_ = auVar169;
  local_260._0_16_ = auVar169;
  auVar169 = vpshufd_avx(ZEXT416(*(uint *)(local_890 + 2)),0);
  local_4c0._16_16_ = auVar169;
  local_4c0._0_16_ = auVar169;
  auVar169 = vpshufd_avx(ZEXT416(*(uint *)(local_890 + lVar125 * 4 + 6)),0);
  local_4e0._16_16_ = auVar169;
  local_4e0._0_16_ = auVar169;
  register0x00001210 = auVar37;
  _local_9a0 = auVar37;
  uVar120 = 0;
  uVar123 = 0;
  uVar129 = 1;
  auVar146._8_4_ = 0x7fffffff;
  auVar146._0_8_ = 0x7fffffff7fffffff;
  auVar146._12_4_ = 0x7fffffff;
  auVar146._16_4_ = 0x7fffffff;
  auVar146._20_4_ = 0x7fffffff;
  auVar146._24_4_ = 0x7fffffff;
  auVar146._28_4_ = 0x7fffffff;
  local_4a0 = vandps_avx(local_220,auVar146);
  auVar169 = vsqrtss_avx(local_980,local_980);
  auVar37 = vsqrtss_avx(local_980,local_980);
  local_8a0 = ZEXT816(0x3f80000000000000);
  auVar279 = ZEXT3264(CONCAT428(0x3f800000,
                                CONCAT424(0x3f800000,
                                          CONCAT420(0x3f800000,
                                                    CONCAT416(0x3f800000,
                                                              CONCAT412(0x3f800000,
                                                                        CONCAT48(0x3f800000,
                                                                                 &
                                                  DAT_3f8000003f800000)))))));
  do {
    auVar179 = vmovshdup_avx(local_8a0);
    fVar262 = auVar179._0_4_ - local_8a0._0_4_;
    auVar179 = vshufps_avx(local_8a0,local_8a0,0);
    local_9c0._16_16_ = auVar179;
    local_9c0._0_16_ = auVar179;
    auVar248 = vshufps_avx(ZEXT416((uint)fVar262),ZEXT416((uint)fVar262),0);
    local_900._16_16_ = auVar248;
    local_900._0_16_ = auVar248;
    fVar163 = auVar248._0_4_;
    fVar201 = auVar248._4_4_;
    fVar202 = auVar248._8_4_;
    fVar205 = auVar248._12_4_;
    fVar130 = auVar179._0_4_;
    auVar255._0_4_ = fVar130 + fVar163 * 0.0;
    fVar161 = auVar179._4_4_;
    auVar255._4_4_ = fVar161 + fVar201 * 0.14285715;
    fVar162 = auVar179._8_4_;
    auVar255._8_4_ = fVar162 + fVar202 * 0.2857143;
    fStack_c24 = auVar179._12_4_;
    auVar255._12_4_ = fStack_c24 + fVar205 * 0.42857146;
    auVar255._16_4_ = fVar130 + fVar163 * 0.5714286;
    auVar255._20_4_ = fVar161 + fVar201 * 0.71428573;
    auVar255._24_4_ = fVar162 + fVar202 * 0.8571429;
    auVar255._28_4_ = fStack_c24 + fVar205;
    auVar142 = vsubps_avx(auVar279._0_32_,auVar255);
    local_c40._4_4_ = auVar255._4_4_ * auVar255._4_4_;
    local_c40._0_4_ = auVar255._0_4_ * auVar255._0_4_;
    fStack_c38 = auVar255._8_4_ * auVar255._8_4_;
    fStack_c34 = auVar255._12_4_ * auVar255._12_4_;
    fStack_c30 = auVar255._16_4_ * auVar255._16_4_;
    fStack_c2c = auVar255._20_4_ * auVar255._20_4_;
    fStack_c28 = auVar255._24_4_ * auVar255._24_4_;
    fVar265 = auVar255._0_4_ * 3.0;
    fVar280 = auVar255._4_4_ * 3.0;
    fVar281 = auVar255._8_4_ * 3.0;
    fVar283 = auVar255._12_4_ * 3.0;
    fVar284 = auVar255._16_4_ * 3.0;
    fVar285 = auVar255._20_4_ * 3.0;
    fVar286 = auVar255._24_4_ * 3.0;
    fVar353 = auVar279._28_4_ + -5.0;
    fVar164 = auVar142._0_4_;
    auVar363._0_4_ = fVar164 * fVar164;
    fVar259 = auVar142._4_4_;
    auVar363._4_4_ = fVar259 * fVar259;
    fVar203 = auVar142._8_4_;
    auVar363._8_4_ = fVar203 * fVar203;
    fVar260 = auVar142._12_4_;
    auVar363._12_4_ = fVar260 * fVar260;
    fVar207 = auVar142._16_4_;
    auVar363._16_4_ = fVar207 * fVar207;
    fVar261 = auVar142._20_4_;
    auVar363._20_4_ = fVar261 * fVar261;
    fVar236 = auVar142._24_4_;
    auVar363._28_36_ = auVar362._28_36_;
    auVar363._24_4_ = fVar236 * fVar236;
    fVar263 = auVar142._28_4_;
    fVar287 = (auVar363._0_4_ * (fVar164 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar301 = (auVar363._4_4_ * (fVar259 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar303 = (auVar363._8_4_ * (fVar203 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar305 = (auVar363._12_4_ * (fVar260 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar307 = (auVar363._16_4_ * (fVar207 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar309 = (auVar363._20_4_ * (fVar261 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar311 = (auVar363._24_4_ * (fVar236 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar364 = -fVar164 * auVar255._0_4_ * auVar255._0_4_ * 0.5;
    fVar373 = -fVar259 * auVar255._4_4_ * auVar255._4_4_ * 0.5;
    fVar376 = -fVar203 * auVar255._8_4_ * auVar255._8_4_ * 0.5;
    fVar379 = -fVar260 * auVar255._12_4_ * auVar255._12_4_ * 0.5;
    fVar382 = -fVar207 * auVar255._16_4_ * auVar255._16_4_ * 0.5;
    fVar385 = -fVar261 * auVar255._20_4_ * auVar255._20_4_ * 0.5;
    fVar388 = -fVar236 * auVar255._24_4_ * auVar255._24_4_ * 0.5;
    fVar282 = auVar36._0_4_;
    fVar430 = auVar36._4_4_;
    fVar433 = auVar36._8_4_;
    fVar436 = auVar36._12_4_;
    fVar264 = local_460._28_4_;
    fVar404 = auVar403._28_4_ + fVar264;
    fVar420 = auVar413._28_4_ + fVar264;
    fVar446 = (auVar255._0_4_ * auVar255._0_4_ * (fVar265 + -5.0) + 2.0) * 0.5;
    fVar454 = (auVar255._4_4_ * auVar255._4_4_ * (fVar280 + -5.0) + 2.0) * 0.5;
    fVar457 = (auVar255._8_4_ * auVar255._8_4_ * (fVar281 + -5.0) + 2.0) * 0.5;
    fVar459 = (auVar255._12_4_ * auVar255._12_4_ * (fVar283 + -5.0) + 2.0) * 0.5;
    fVar461 = (auVar255._16_4_ * auVar255._16_4_ * (fVar284 + -5.0) + 2.0) * 0.5;
    fVar463 = (auVar255._20_4_ * auVar255._20_4_ * (fVar285 + -5.0) + 2.0) * 0.5;
    fVar465 = (auVar255._24_4_ * auVar255._24_4_ * (fVar286 + -5.0) + 2.0) * 0.5;
    fVar445 = -auVar255._28_4_;
    fVar421 = -auVar255._0_4_ * fVar164 * fVar164 * 0.5;
    fVar431 = -auVar255._4_4_ * fVar259 * fVar259 * 0.5;
    fVar434 = -auVar255._8_4_ * fVar203 * fVar203 * 0.5;
    fVar437 = -auVar255._12_4_ * fVar260 * fVar260 * 0.5;
    fVar439 = -auVar255._16_4_ * fVar207 * fVar207 * 0.5;
    fVar441 = -auVar255._20_4_ * fVar261 * fVar261 * 0.5;
    fVar443 = -auVar255._24_4_ * fVar236 * fVar236 * 0.5;
    fVar365 = fVar421 * (float)local_340._0_4_ +
              fVar446 * (float)local_360._0_4_ +
              auVar403._0_4_ * fVar364 + fVar287 * (float)local_3e0._0_4_;
    fVar374 = fVar431 * (float)local_340._4_4_ +
              fVar454 * (float)local_360._4_4_ +
              auVar403._4_4_ * fVar373 + fVar301 * (float)local_3e0._4_4_;
    fVar377 = fVar434 * fStack_338 +
              fVar457 * fStack_358 + auVar403._8_4_ * fVar376 + fVar303 * fStack_3d8;
    fVar380 = fVar437 * fStack_334 +
              fVar459 * fStack_354 + auVar403._12_4_ * fVar379 + fVar305 * fStack_3d4;
    fVar383 = fVar439 * fStack_330 +
              fVar461 * fStack_350 + auVar403._16_4_ * fVar382 + fVar307 * fStack_3d0;
    fVar386 = fVar441 * fStack_32c +
              fVar463 * fStack_34c + auVar403._20_4_ * fVar385 + fVar309 * fStack_3cc;
    fVar389 = fVar443 * fStack_328 +
              fVar465 * fStack_348 + auVar403._24_4_ * fVar388 + fVar311 * fStack_3c8;
    fVar392 = fVar264 + 2.0 + -fVar263 + fVar404;
    fVar366 = (float)local_1a0._0_4_ * fVar421 +
              fVar446 * (float)local_380._0_4_ +
              fVar282 * fVar364 + fVar287 * (float)local_400._0_4_;
    fVar375 = (float)local_1a0._4_4_ * fVar431 +
              fVar454 * (float)local_380._4_4_ +
              fVar430 * fVar373 + fVar301 * (float)local_400._4_4_;
    fVar378 = fStack_198 * fVar434 + fVar457 * fStack_378 + fVar433 * fVar376 + fVar303 * fStack_3f8
    ;
    fVar381 = fStack_194 * fVar437 + fVar459 * fStack_374 + fVar436 * fVar379 + fVar305 * fStack_3f4
    ;
    fVar384 = fStack_190 * fVar439 + fVar461 * fStack_370 + fVar282 * fVar382 + fVar307 * fStack_3f0
    ;
    fVar387 = fStack_18c * fVar441 + fVar463 * fStack_36c + fVar430 * fVar385 + fVar309 * fStack_3ec
    ;
    fVar390 = fStack_188 * fVar443 + fVar465 * fStack_368 + fVar433 * fVar388 + fVar311 * fStack_3e8
    ;
    fVar393 = fVar392 + fVar404 + fVar420;
    fVar211 = (float)local_1c0._0_4_ * fVar421 +
              fVar446 * (float)local_3a0._0_4_ +
              local_460._0_4_ * fVar364 + fVar287 * (float)local_420._0_4_;
    fVar235 = (float)local_1c0._4_4_ * fVar431 +
              fVar454 * (float)local_3a0._4_4_ +
              local_460._4_4_ * fVar373 + fVar301 * (float)local_420._4_4_;
    fVar237 = fStack_1b8 * fVar434 +
              fVar457 * fStack_398 + local_460._8_4_ * fVar376 + fVar303 * fStack_418;
    fVar238 = fStack_1b4 * fVar437 +
              fVar459 * fStack_394 + local_460._12_4_ * fVar379 + fVar305 * fStack_414;
    fVar239 = fStack_1b0 * fVar439 +
              fVar461 * fStack_390 + local_460._16_4_ * fVar382 + fVar307 * fStack_410;
    fVar240 = fStack_1ac * fVar441 +
              fVar463 * fStack_38c + local_460._20_4_ * fVar385 + fVar309 * fStack_40c;
    fVar241 = fStack_1a8 * fVar443 +
              fVar465 * fStack_388 + local_460._24_4_ * fVar388 + fVar311 * fStack_408;
    fVar242 = fVar393 + fVar420 + fVar436 + fVar264;
    local_920._0_4_ =
         (float)local_1e0._0_4_ * fVar421 +
         fVar446 * (float)local_3c0._0_4_ +
         fVar364 * (float)local_200._0_4_ + fVar287 * (float)local_440._0_4_;
    local_920._4_4_ =
         (float)local_1e0._4_4_ * fVar431 +
         fVar454 * (float)local_3c0._4_4_ +
         fVar373 * (float)local_200._4_4_ + fVar301 * (float)local_440._4_4_;
    local_920._8_4_ =
         fStack_1d8 * fVar434 + fVar457 * fStack_3b8 + fVar376 * fStack_1f8 + fVar303 * fStack_438;
    local_920._12_4_ =
         fStack_1d4 * fVar437 + fVar459 * fStack_3b4 + fVar379 * fStack_1f4 + fVar305 * fStack_434;
    local_920._16_4_ =
         fStack_1d0 * fVar439 + fVar461 * fStack_3b0 + fVar382 * fStack_1f0 + fVar307 * fStack_430;
    local_920._20_4_ =
         fStack_1cc * fVar441 + fVar463 * fStack_3ac + fVar385 * fStack_1ec + fVar309 * fStack_42c;
    local_920._24_4_ =
         fStack_1c8 * fVar443 + fVar465 * fStack_3a8 + fVar388 * fStack_1e8 + fVar311 * fStack_428;
    local_920._28_4_ = fVar393 + fVar264 + 2.0 + -fVar263 + -3.0;
    fVar437 = auVar255._28_4_ + auVar255._28_4_;
    auVar40._4_4_ = (fVar259 + fVar259) * auVar255._4_4_;
    auVar40._0_4_ = (fVar164 + fVar164) * auVar255._0_4_;
    auVar40._8_4_ = (fVar203 + fVar203) * auVar255._8_4_;
    auVar40._12_4_ = (fVar260 + fVar260) * auVar255._12_4_;
    auVar40._16_4_ = (fVar207 + fVar207) * auVar255._16_4_;
    auVar40._20_4_ = (fVar261 + fVar261) * auVar255._20_4_;
    auVar40._24_4_ = (fVar236 + fVar236) * auVar255._24_4_;
    auVar40._28_4_ = fVar437;
    auVar142 = vsubps_avx(auVar40,auVar363._0_32_);
    fVar364 = auVar279._28_4_ + 2.0;
    auVar41._4_4_ = (fVar259 + fVar259) * (fVar280 + 2.0);
    auVar41._0_4_ = (fVar164 + fVar164) * (fVar265 + 2.0);
    auVar41._8_4_ = (fVar203 + fVar203) * (fVar281 + 2.0);
    auVar41._12_4_ = (fVar260 + fVar260) * (fVar283 + 2.0);
    auVar41._16_4_ = (fVar207 + fVar207) * (fVar284 + 2.0);
    auVar41._20_4_ = (fVar261 + fVar261) * (fVar285 + 2.0);
    auVar41._24_4_ = (fVar236 + fVar236) * (fVar286 + 2.0);
    auVar41._28_4_ = fVar364;
    auVar42._4_4_ = fVar259 * fVar259 * 3.0;
    auVar42._0_4_ = fVar164 * fVar164 * 3.0;
    auVar42._8_4_ = fVar203 * fVar203 * 3.0;
    auVar42._12_4_ = fVar260 * fVar260 * 3.0;
    auVar42._16_4_ = fVar207 * fVar207 * 3.0;
    auVar42._20_4_ = fVar261 * fVar261 * 3.0;
    auVar42._24_4_ = fVar236 * fVar236 * 3.0;
    auVar42._28_4_ = fVar263;
    auVar152 = vsubps_avx(auVar41,auVar42);
    auVar30 = vsubps_avx(_local_c40,auVar40);
    fVar382 = auVar142._0_4_ * 0.5;
    fVar385 = auVar142._4_4_ * 0.5;
    fVar388 = auVar142._8_4_ * 0.5;
    fVar404 = auVar142._12_4_ * 0.5;
    fVar420 = auVar142._16_4_ * 0.5;
    fVar421 = auVar142._20_4_ * 0.5;
    fVar431 = auVar142._24_4_ * 0.5;
    fVar303 = (auVar255._0_4_ * fVar265 + (auVar255._0_4_ + auVar255._0_4_) * (fVar265 + -5.0)) *
              0.5;
    fVar305 = (auVar255._4_4_ * fVar280 + (auVar255._4_4_ + auVar255._4_4_) * (fVar280 + -5.0)) *
              0.5;
    fVar307 = (auVar255._8_4_ * fVar281 + (auVar255._8_4_ + auVar255._8_4_) * (fVar281 + -5.0)) *
              0.5;
    fVar309 = (auVar255._12_4_ * fVar283 + (auVar255._12_4_ + auVar255._12_4_) * (fVar283 + -5.0)) *
              0.5;
    fVar373 = (auVar255._16_4_ * fVar284 + (auVar255._16_4_ + auVar255._16_4_) * (fVar284 + -5.0)) *
              0.5;
    fVar376 = (auVar255._20_4_ * fVar285 + (auVar255._20_4_ + auVar255._20_4_) * (fVar285 + -5.0)) *
              0.5;
    fVar379 = (auVar255._24_4_ * fVar286 + (auVar255._24_4_ + auVar255._24_4_) * (fVar286 + -5.0)) *
              0.5;
    fVar164 = auVar152._0_4_ * 0.5;
    fVar259 = auVar152._4_4_ * 0.5;
    fVar203 = auVar152._8_4_ * 0.5;
    fVar260 = auVar152._12_4_ * 0.5;
    fVar207 = auVar152._16_4_ * 0.5;
    fVar264 = auVar152._20_4_ * 0.5;
    fVar265 = auVar152._24_4_ * 0.5;
    fVar261 = auVar30._0_4_ * 0.5;
    fVar236 = auVar30._4_4_ * 0.5;
    fVar280 = auVar30._8_4_ * 0.5;
    fVar283 = auVar30._12_4_ * 0.5;
    fVar284 = auVar30._16_4_ * 0.5;
    fVar285 = auVar30._20_4_ * 0.5;
    fVar286 = auVar30._24_4_ * 0.5;
    fVar354 = fVar263 + fVar263 + auVar142._28_4_ + fVar263 + fVar263 + fVar353;
    fVar364 = fVar364 + auVar255._28_4_ + fVar353 + auVar152._28_4_ + auVar30._28_4_;
    auVar179 = vpermilps_avx(ZEXT416((uint)(fVar262 * 0.04761905)),0);
    fVar287 = auVar179._0_4_;
    fVar329 = fVar287 * (fVar382 * (float)local_340._0_4_ +
                        fVar303 * (float)local_360._0_4_ +
                        fVar164 * (float)local_3e0._0_4_ + auVar403._0_4_ * fVar261);
    fVar301 = auVar179._4_4_;
    fVar342 = fVar301 * (fVar385 * (float)local_340._4_4_ +
                        fVar305 * (float)local_360._4_4_ +
                        fVar259 * (float)local_3e0._4_4_ + auVar403._4_4_ * fVar236);
    auVar43._4_4_ = fVar342;
    auVar43._0_4_ = fVar329;
    fVar311 = auVar179._8_4_;
    fVar343 = fVar311 * (fVar388 * fStack_338 +
                        fVar307 * fStack_358 + fVar203 * fStack_3d8 + auVar403._8_4_ * fVar280);
    auVar43._8_4_ = fVar343;
    fVar281 = auVar179._12_4_;
    fVar345 = fVar281 * (fVar404 * fStack_334 +
                        fVar309 * fStack_354 + fVar260 * fStack_3d4 + auVar403._12_4_ * fVar283);
    auVar43._12_4_ = fVar345;
    fVar347 = fVar287 * (fVar420 * fStack_330 +
                        fVar373 * fStack_350 + fVar207 * fStack_3d0 + auVar403._16_4_ * fVar284);
    auVar43._16_4_ = fVar347;
    fVar349 = fVar301 * (fVar421 * fStack_32c +
                        fVar376 * fStack_34c + fVar264 * fStack_3cc + auVar403._20_4_ * fVar285);
    auVar43._20_4_ = fVar349;
    fVar351 = fVar311 * (fVar431 * fStack_328 +
                        fVar379 * fStack_348 + fVar265 * fStack_3c8 + auVar403._24_4_ * fVar286);
    auVar43._24_4_ = fVar351;
    auVar43._28_4_ = fVar354;
    fVar422 = fVar287 * ((float)local_1a0._0_4_ * fVar382 +
                        fVar303 * (float)local_380._0_4_ +
                        fVar164 * (float)local_400._0_4_ + fVar261 * fVar282);
    fVar432 = fVar301 * ((float)local_1a0._4_4_ * fVar385 +
                        fVar305 * (float)local_380._4_4_ +
                        fVar259 * (float)local_400._4_4_ + fVar236 * fVar430);
    local_940._4_4_ = fVar432;
    local_940._0_4_ = fVar422;
    fVar435 = fVar311 * (fStack_198 * fVar388 +
                        fVar307 * fStack_378 + fVar203 * fStack_3f8 + fVar280 * fVar433);
    local_940._8_4_ = fVar435;
    fVar438 = fVar281 * (fStack_194 * fVar404 +
                        fVar309 * fStack_374 + fVar260 * fStack_3f4 + fVar283 * fVar436);
    local_940._12_4_ = fVar438;
    fVar440 = fVar287 * (fStack_190 * fVar420 +
                        fVar373 * fStack_370 + fVar207 * fStack_3f0 + fVar284 * fVar282);
    local_940._16_4_ = fVar440;
    fVar442 = fVar301 * (fStack_18c * fVar421 +
                        fVar376 * fStack_36c + fVar264 * fStack_3ec + fVar285 * fVar430);
    local_940._20_4_ = fVar442;
    fVar444 = fVar311 * (fStack_188 * fVar431 +
                        fVar379 * fStack_368 + fVar265 * fStack_3e8 + fVar286 * fVar433);
    local_940._24_4_ = fVar444;
    local_940._28_4_ = fVar445;
    fVar447 = fVar287 * ((float)local_1c0._0_4_ * fVar382 +
                        fVar164 * (float)local_420._0_4_ + fVar261 * local_460._0_4_ +
                        fVar303 * (float)local_3a0._0_4_);
    fVar455 = fVar301 * ((float)local_1c0._4_4_ * fVar385 +
                        fVar259 * (float)local_420._4_4_ + fVar236 * local_460._4_4_ +
                        fVar305 * (float)local_3a0._4_4_);
    auVar44._4_4_ = fVar455;
    auVar44._0_4_ = fVar447;
    fVar458 = fVar311 * (fStack_1b8 * fVar388 +
                        fVar203 * fStack_418 + fVar280 * local_460._8_4_ + fVar307 * fStack_398);
    auVar44._8_4_ = fVar458;
    fVar460 = fVar281 * (fStack_1b4 * fVar404 +
                        fVar260 * fStack_414 + fVar283 * local_460._12_4_ + fVar309 * fStack_394);
    auVar44._12_4_ = fVar460;
    fVar462 = fVar287 * (fStack_1b0 * fVar420 +
                        fVar207 * fStack_410 + fVar284 * local_460._16_4_ + fVar373 * fStack_390);
    auVar44._16_4_ = fVar462;
    fVar464 = fVar301 * (fStack_1ac * fVar421 +
                        fVar264 * fStack_40c + fVar285 * local_460._20_4_ + fVar376 * fStack_38c);
    auVar44._20_4_ = fVar464;
    fVar466 = fVar311 * (fStack_1a8 * fVar431 +
                        fVar265 * fStack_408 + fVar286 * local_460._24_4_ + fVar379 * fStack_388);
    auVar44._24_4_ = fVar466;
    auVar44._28_4_ = uStack_184;
    fVar261 = fVar287 * ((float)local_1e0._0_4_ * fVar382 +
                        fVar303 * (float)local_3c0._0_4_ +
                        fVar164 * (float)local_440._0_4_ + (float)local_200._0_4_ * fVar261);
    fVar236 = fVar301 * ((float)local_1e0._4_4_ * fVar385 +
                        fVar305 * (float)local_3c0._4_4_ +
                        fVar259 * (float)local_440._4_4_ + (float)local_200._4_4_ * fVar236);
    auVar45._4_4_ = fVar236;
    auVar45._0_4_ = fVar261;
    fVar280 = fVar311 * (fStack_1d8 * fVar388 +
                        fVar307 * fStack_3b8 + fVar203 * fStack_438 + fStack_1f8 * fVar280);
    auVar45._8_4_ = fVar280;
    fVar281 = fVar281 * (fStack_1d4 * fVar404 +
                        fVar309 * fStack_3b4 + fVar260 * fStack_434 + fStack_1f4 * fVar283);
    auVar45._12_4_ = fVar281;
    fVar287 = fVar287 * (fStack_1d0 * fVar420 +
                        fVar373 * fStack_3b0 + fVar207 * fStack_430 + fStack_1f0 * fVar284);
    auVar45._16_4_ = fVar287;
    fVar301 = fVar301 * (fStack_1cc * fVar421 +
                        fVar376 * fStack_3ac + fVar264 * fStack_42c + fStack_1ec * fVar285);
    auVar45._20_4_ = fVar301;
    fVar311 = fVar311 * (fStack_1c8 * fVar431 +
                        fVar379 * fStack_3a8 + fVar265 * fStack_428 + fStack_1e8 * fVar286);
    auVar45._24_4_ = fVar311;
    auVar45._28_4_ = fVar364;
    auVar105._4_4_ = fVar375;
    auVar105._0_4_ = fVar366;
    auVar105._8_4_ = fVar378;
    auVar105._12_4_ = fVar381;
    auVar105._16_4_ = fVar384;
    auVar105._20_4_ = fVar387;
    auVar105._24_4_ = fVar390;
    auVar105._28_4_ = fVar393;
    auVar142 = vperm2f128_avx(auVar105,auVar105,1);
    auVar142 = vshufps_avx(auVar142,auVar105,0x30);
    auVar31 = vshufps_avx(auVar105,auVar142,0x29);
    auVar107._4_4_ = fVar235;
    auVar107._0_4_ = fVar211;
    auVar107._8_4_ = fVar237;
    auVar107._12_4_ = fVar238;
    auVar107._16_4_ = fVar239;
    auVar107._20_4_ = fVar240;
    auVar107._24_4_ = fVar241;
    auVar107._28_4_ = fVar242;
    auVar142 = vperm2f128_avx(auVar107,auVar107,1);
    auVar142 = vshufps_avx(auVar142,auVar107,0x30);
    _local_aa0 = vshufps_avx(auVar107,auVar142,0x29);
    auVar152 = vsubps_avx(local_920,auVar45);
    auVar142 = vperm2f128_avx(auVar152,auVar152,1);
    auVar142 = vshufps_avx(auVar142,auVar152,0x30);
    _local_800 = vshufps_avx(auVar152,auVar142,0x29);
    auVar30 = vsubps_avx(auVar31,auVar105);
    auVar372 = vsubps_avx(_local_aa0,auVar107);
    fVar259 = auVar30._0_4_;
    fVar262 = auVar30._4_4_;
    auVar46._4_4_ = fVar455 * fVar262;
    auVar46._0_4_ = fVar447 * fVar259;
    fVar283 = auVar30._8_4_;
    auVar46._8_4_ = fVar458 * fVar283;
    fVar303 = auVar30._12_4_;
    auVar46._12_4_ = fVar460 * fVar303;
    fVar373 = auVar30._16_4_;
    auVar46._16_4_ = fVar462 * fVar373;
    fVar404 = auVar30._20_4_;
    auVar46._20_4_ = fVar464 * fVar404;
    fVar430 = auVar30._24_4_;
    auVar46._24_4_ = fVar466 * fVar430;
    auVar46._28_4_ = auVar152._28_4_;
    fVar203 = auVar372._0_4_;
    fVar263 = auVar372._4_4_;
    auVar47._4_4_ = fVar432 * fVar263;
    auVar47._0_4_ = fVar422 * fVar203;
    fVar284 = auVar372._8_4_;
    auVar47._8_4_ = fVar435 * fVar284;
    fVar305 = auVar372._12_4_;
    auVar47._12_4_ = fVar438 * fVar305;
    fVar376 = auVar372._16_4_;
    auVar47._16_4_ = fVar440 * fVar376;
    fVar420 = auVar372._20_4_;
    auVar47._20_4_ = fVar442 * fVar420;
    fVar433 = auVar372._24_4_;
    auVar47._24_4_ = fVar444 * fVar433;
    auVar47._28_4_ = auVar142._28_4_;
    auVar33 = vsubps_avx(auVar47,auVar46);
    auVar109._4_4_ = fVar374;
    auVar109._0_4_ = fVar365;
    auVar109._8_4_ = fVar377;
    auVar109._12_4_ = fVar380;
    auVar109._16_4_ = fVar383;
    auVar109._20_4_ = fVar386;
    auVar109._24_4_ = fVar389;
    auVar109._28_4_ = fVar392;
    auVar142 = vperm2f128_avx(auVar109,auVar109,1);
    auVar142 = vshufps_avx(auVar142,auVar109,0x30);
    auVar372 = vshufps_avx(auVar109,auVar142,0x29);
    auVar34 = vsubps_avx(auVar372,auVar109);
    auVar48._4_4_ = fVar263 * fVar342;
    auVar48._0_4_ = fVar203 * fVar329;
    auVar48._8_4_ = fVar284 * fVar343;
    auVar48._12_4_ = fVar305 * fVar345;
    auVar48._16_4_ = fVar376 * fVar347;
    auVar48._20_4_ = fVar420 * fVar349;
    auVar48._24_4_ = fVar433 * fVar351;
    auVar48._28_4_ = auVar372._28_4_;
    fVar260 = auVar34._0_4_;
    fVar264 = auVar34._4_4_;
    auVar49._4_4_ = fVar455 * fVar264;
    auVar49._0_4_ = fVar447 * fVar260;
    fVar285 = auVar34._8_4_;
    auVar49._8_4_ = fVar458 * fVar285;
    fVar307 = auVar34._12_4_;
    auVar49._12_4_ = fVar460 * fVar307;
    fVar379 = auVar34._16_4_;
    auVar49._16_4_ = fVar462 * fVar379;
    fVar421 = auVar34._20_4_;
    auVar49._20_4_ = fVar464 * fVar421;
    fVar434 = auVar34._24_4_;
    auVar49._24_4_ = fVar466 * fVar434;
    auVar49._28_4_ = local_aa0._28_4_;
    auVar35 = vsubps_avx(auVar49,auVar48);
    auVar50._4_4_ = fVar432 * fVar264;
    auVar50._0_4_ = fVar422 * fVar260;
    auVar50._8_4_ = fVar435 * fVar285;
    auVar50._12_4_ = fVar438 * fVar307;
    auVar50._16_4_ = fVar440 * fVar379;
    auVar50._20_4_ = fVar442 * fVar421;
    auVar50._24_4_ = fVar444 * fVar434;
    auVar50._28_4_ = local_aa0._28_4_;
    auVar51._4_4_ = fVar342 * fVar262;
    auVar51._0_4_ = fVar329 * fVar259;
    auVar51._8_4_ = fVar343 * fVar283;
    auVar51._12_4_ = fVar345 * fVar303;
    auVar51._16_4_ = fVar347 * fVar373;
    auVar51._20_4_ = fVar349 * fVar404;
    auVar51._24_4_ = fVar351 * fVar430;
    auVar51._28_4_ = fVar437;
    auVar38 = vsubps_avx(auVar51,auVar50);
    fVar164 = auVar38._28_4_;
    fVar385 = auVar35._28_4_ + fVar164;
    auVar256._0_4_ = fVar260 * fVar260 + fVar259 * fVar259 + fVar203 * fVar203;
    auVar256._4_4_ = fVar264 * fVar264 + fVar262 * fVar262 + fVar263 * fVar263;
    auVar256._8_4_ = fVar285 * fVar285 + fVar283 * fVar283 + fVar284 * fVar284;
    auVar256._12_4_ = fVar307 * fVar307 + fVar303 * fVar303 + fVar305 * fVar305;
    auVar256._16_4_ = fVar379 * fVar379 + fVar373 * fVar373 + fVar376 * fVar376;
    auVar256._20_4_ = fVar421 * fVar421 + fVar404 * fVar404 + fVar420 * fVar420;
    auVar256._24_4_ = fVar434 * fVar434 + fVar430 * fVar430 + fVar433 * fVar433;
    auVar256._28_4_ = fVar164 + fVar164 + fVar385;
    auVar142 = vrcpps_avx(auVar256);
    fVar388 = auVar142._0_4_;
    fVar353 = auVar142._4_4_;
    auVar52._4_4_ = fVar353 * auVar256._4_4_;
    auVar52._0_4_ = fVar388 * auVar256._0_4_;
    fVar282 = auVar142._8_4_;
    auVar52._8_4_ = fVar282 * auVar256._8_4_;
    fVar439 = auVar142._12_4_;
    auVar52._12_4_ = fVar439 * auVar256._12_4_;
    fVar441 = auVar142._16_4_;
    auVar52._16_4_ = fVar441 * auVar256._16_4_;
    fVar446 = auVar142._20_4_;
    auVar52._20_4_ = fVar446 * auVar256._20_4_;
    fVar454 = auVar142._24_4_;
    auVar52._24_4_ = fVar454 * auVar256._24_4_;
    auVar52._28_4_ = fVar437;
    auVar411._8_4_ = 0x3f800000;
    auVar411._0_8_ = &DAT_3f8000003f800000;
    auVar411._12_4_ = 0x3f800000;
    auVar411._16_4_ = 0x3f800000;
    auVar411._20_4_ = 0x3f800000;
    auVar411._24_4_ = 0x3f800000;
    auVar411._28_4_ = 0x3f800000;
    auVar39 = vsubps_avx(auVar411,auVar52);
    fVar388 = auVar39._0_4_ * fVar388 + fVar388;
    fVar353 = auVar39._4_4_ * fVar353 + fVar353;
    fVar282 = auVar39._8_4_ * fVar282 + fVar282;
    fVar439 = auVar39._12_4_ * fVar439 + fVar439;
    fVar441 = auVar39._16_4_ * fVar441 + fVar441;
    fVar446 = auVar39._20_4_ * fVar446 + fVar446;
    fVar454 = auVar39._24_4_ * fVar454 + fVar454;
    auVar152 = vperm2f128_avx(local_940,local_940,1);
    auVar152 = vshufps_avx(auVar152,local_940,0x30);
    auVar152 = vshufps_avx(local_940,auVar152,0x29);
    auVar30 = vperm2f128_avx(auVar44,auVar44,1);
    auVar30 = vshufps_avx(auVar30,auVar44,0x30);
    auVar32 = vshufps_avx(auVar44,auVar30,0x29);
    fVar405 = auVar32._0_4_;
    fVar414 = auVar32._4_4_;
    auVar53._4_4_ = fVar414 * fVar262;
    auVar53._0_4_ = fVar405 * fVar259;
    fVar415 = auVar32._8_4_;
    auVar53._8_4_ = fVar415 * fVar283;
    fVar416 = auVar32._12_4_;
    auVar53._12_4_ = fVar416 * fVar303;
    fVar417 = auVar32._16_4_;
    auVar53._16_4_ = fVar417 * fVar373;
    fVar418 = auVar32._20_4_;
    auVar53._20_4_ = fVar418 * fVar404;
    fVar419 = auVar32._24_4_;
    auVar53._24_4_ = fVar419 * fVar430;
    auVar53._28_4_ = auVar30._28_4_;
    fVar467 = auVar152._0_4_;
    fVar473 = auVar152._4_4_;
    auVar54._4_4_ = fVar473 * fVar263;
    auVar54._0_4_ = fVar467 * fVar203;
    fVar475 = auVar152._8_4_;
    auVar54._8_4_ = fVar475 * fVar284;
    fVar477 = auVar152._12_4_;
    auVar54._12_4_ = fVar477 * fVar305;
    fVar479 = auVar152._16_4_;
    auVar54._16_4_ = fVar479 * fVar376;
    fVar481 = auVar152._20_4_;
    auVar54._20_4_ = fVar481 * fVar420;
    fVar483 = auVar152._24_4_;
    auVar54._24_4_ = fVar483 * fVar433;
    auVar54._28_4_ = fVar445;
    auVar143 = vsubps_avx(auVar54,auVar53);
    auVar30 = vperm2f128_avx(auVar43,auVar43,1);
    auVar30 = vshufps_avx(auVar30,auVar43,0x30);
    local_7e0 = vshufps_avx(auVar43,auVar30,0x29);
    fVar207 = local_7e0._0_4_;
    fVar265 = local_7e0._4_4_;
    auVar55._4_4_ = fVar263 * fVar265;
    auVar55._0_4_ = fVar203 * fVar207;
    fVar286 = local_7e0._8_4_;
    auVar55._8_4_ = fVar284 * fVar286;
    fVar309 = local_7e0._12_4_;
    auVar55._12_4_ = fVar305 * fVar309;
    fVar382 = local_7e0._16_4_;
    auVar55._16_4_ = fVar376 * fVar382;
    fVar431 = local_7e0._20_4_;
    auVar55._20_4_ = fVar420 * fVar431;
    fVar437 = local_7e0._24_4_;
    auVar55._24_4_ = fVar433 * fVar437;
    auVar55._28_4_ = auVar30._28_4_;
    auVar56._4_4_ = fVar414 * fVar264;
    auVar56._0_4_ = fVar405 * fVar260;
    auVar56._8_4_ = fVar415 * fVar285;
    auVar56._12_4_ = fVar416 * fVar307;
    auVar56._16_4_ = fVar417 * fVar379;
    auVar56._20_4_ = fVar418 * fVar421;
    auVar56._24_4_ = fVar419 * fVar434;
    auVar56._28_4_ = uStack_184;
    auVar144 = vsubps_avx(auVar56,auVar55);
    auVar57._4_4_ = fVar473 * fVar264;
    auVar57._0_4_ = fVar467 * fVar260;
    auVar57._8_4_ = fVar475 * fVar285;
    auVar57._12_4_ = fVar477 * fVar307;
    auVar57._16_4_ = fVar479 * fVar379;
    auVar57._20_4_ = fVar481 * fVar421;
    auVar57._24_4_ = fVar483 * fVar434;
    auVar57._28_4_ = uStack_184;
    auVar58._4_4_ = fVar265 * fVar262;
    auVar58._0_4_ = fVar207 * fVar259;
    auVar58._8_4_ = fVar286 * fVar283;
    auVar58._12_4_ = fVar309 * fVar303;
    auVar58._16_4_ = fVar382 * fVar373;
    auVar58._20_4_ = fVar431 * fVar404;
    fVar164 = auVar152._28_4_;
    auVar58._24_4_ = fVar437 * fVar430;
    auVar58._28_4_ = fVar164;
    auVar152 = vsubps_avx(auVar58,auVar57);
    fVar443 = auVar152._28_4_;
    auVar59._4_4_ =
         (auVar33._4_4_ * auVar33._4_4_ +
         auVar35._4_4_ * auVar35._4_4_ + auVar38._4_4_ * auVar38._4_4_) * fVar353;
    auVar59._0_4_ =
         (auVar33._0_4_ * auVar33._0_4_ +
         auVar35._0_4_ * auVar35._0_4_ + auVar38._0_4_ * auVar38._0_4_) * fVar388;
    auVar59._8_4_ =
         (auVar33._8_4_ * auVar33._8_4_ +
         auVar35._8_4_ * auVar35._8_4_ + auVar38._8_4_ * auVar38._8_4_) * fVar282;
    auVar59._12_4_ =
         (auVar33._12_4_ * auVar33._12_4_ +
         auVar35._12_4_ * auVar35._12_4_ + auVar38._12_4_ * auVar38._12_4_) * fVar439;
    auVar59._16_4_ =
         (auVar33._16_4_ * auVar33._16_4_ +
         auVar35._16_4_ * auVar35._16_4_ + auVar38._16_4_ * auVar38._16_4_) * fVar441;
    auVar59._20_4_ =
         (auVar33._20_4_ * auVar33._20_4_ +
         auVar35._20_4_ * auVar35._20_4_ + auVar38._20_4_ * auVar38._20_4_) * fVar446;
    auVar59._24_4_ =
         (auVar33._24_4_ * auVar33._24_4_ +
         auVar35._24_4_ * auVar35._24_4_ + auVar38._24_4_ * auVar38._24_4_) * fVar454;
    auVar59._28_4_ = auVar33._28_4_ + fVar385;
    auVar60._4_4_ =
         (auVar143._4_4_ * auVar143._4_4_ +
         auVar144._4_4_ * auVar144._4_4_ + auVar152._4_4_ * auVar152._4_4_) * fVar353;
    auVar60._0_4_ =
         (auVar143._0_4_ * auVar143._0_4_ +
         auVar144._0_4_ * auVar144._0_4_ + auVar152._0_4_ * auVar152._0_4_) * fVar388;
    auVar60._8_4_ =
         (auVar143._8_4_ * auVar143._8_4_ +
         auVar144._8_4_ * auVar144._8_4_ + auVar152._8_4_ * auVar152._8_4_) * fVar282;
    auVar60._12_4_ =
         (auVar143._12_4_ * auVar143._12_4_ +
         auVar144._12_4_ * auVar144._12_4_ + auVar152._12_4_ * auVar152._12_4_) * fVar439;
    auVar60._16_4_ =
         (auVar143._16_4_ * auVar143._16_4_ +
         auVar144._16_4_ * auVar144._16_4_ + auVar152._16_4_ * auVar152._16_4_) * fVar441;
    auVar60._20_4_ =
         (auVar143._20_4_ * auVar143._20_4_ +
         auVar144._20_4_ * auVar144._20_4_ + auVar152._20_4_ * auVar152._20_4_) * fVar446;
    auVar60._24_4_ =
         (auVar143._24_4_ * auVar143._24_4_ +
         auVar144._24_4_ * auVar144._24_4_ + auVar152._24_4_ * auVar152._24_4_) * fVar454;
    auVar60._28_4_ = auVar39._28_4_ + auVar142._28_4_;
    auVar142 = vmaxps_avx(auVar59,auVar60);
    auVar152 = vperm2f128_avx(local_920,local_920,1);
    auVar152 = vshufps_avx(auVar152,local_920,0x30);
    local_820 = vshufps_avx(local_920,auVar152,0x29);
    auVar185._0_4_ = (float)local_920._0_4_ + fVar261;
    auVar185._4_4_ = local_920._4_4_ + fVar236;
    auVar185._8_4_ = local_920._8_4_ + fVar280;
    auVar185._12_4_ = local_920._12_4_ + fVar281;
    auVar185._16_4_ = local_920._16_4_ + fVar287;
    auVar185._20_4_ = local_920._20_4_ + fVar301;
    auVar185._24_4_ = local_920._24_4_ + fVar311;
    auVar185._28_4_ = local_920._28_4_ + fVar364;
    auVar152 = vmaxps_avx(local_920,auVar185);
    auVar30 = vmaxps_avx(_local_800,local_820);
    auVar30 = vmaxps_avx(auVar152,auVar30);
    auVar152 = vrsqrtps_avx(auVar256);
    fVar261 = auVar152._0_4_;
    fVar236 = auVar152._4_4_;
    fVar280 = auVar152._8_4_;
    fVar281 = auVar152._12_4_;
    fVar287 = auVar152._16_4_;
    fVar301 = auVar152._20_4_;
    fVar311 = auVar152._24_4_;
    auVar61._4_4_ = fVar236 * fVar236 * fVar236 * auVar256._4_4_ * 0.5;
    auVar61._0_4_ = fVar261 * fVar261 * fVar261 * auVar256._0_4_ * 0.5;
    auVar61._8_4_ = fVar280 * fVar280 * fVar280 * auVar256._8_4_ * 0.5;
    auVar61._12_4_ = fVar281 * fVar281 * fVar281 * auVar256._12_4_ * 0.5;
    auVar61._16_4_ = fVar287 * fVar287 * fVar287 * auVar256._16_4_ * 0.5;
    auVar61._20_4_ = fVar301 * fVar301 * fVar301 * auVar256._20_4_ * 0.5;
    auVar61._24_4_ = fVar311 * fVar311 * fVar311 * auVar256._24_4_ * 0.5;
    auVar61._28_4_ = auVar256._28_4_;
    auVar62._4_4_ = fVar236 * 1.5;
    auVar62._0_4_ = fVar261 * 1.5;
    auVar62._8_4_ = fVar280 * 1.5;
    auVar62._12_4_ = fVar281 * 1.5;
    auVar62._16_4_ = fVar287 * 1.5;
    auVar62._20_4_ = fVar301 * 1.5;
    auVar62._24_4_ = fVar311 * 1.5;
    auVar62._28_4_ = auVar152._28_4_;
    auVar152 = vsubps_avx(auVar62,auVar61);
    auVar413 = ZEXT3264(auVar152);
    auVar106._4_4_ = fVar375;
    auVar106._0_4_ = fVar366;
    auVar106._8_4_ = fVar378;
    auVar106._12_4_ = fVar381;
    auVar106._16_4_ = fVar384;
    auVar106._20_4_ = fVar387;
    auVar106._24_4_ = fVar390;
    auVar106._28_4_ = fVar393;
    auVar35 = vsubps_avx(ZEXT832(0) << 0x20,auVar106);
    auVar108._4_4_ = fVar235;
    auVar108._0_4_ = fVar211;
    auVar108._8_4_ = fVar237;
    auVar108._12_4_ = fVar238;
    auVar108._16_4_ = fVar239;
    auVar108._20_4_ = fVar240;
    auVar108._24_4_ = fVar241;
    auVar108._28_4_ = fVar242;
    local_a60 = vsubps_avx(ZEXT832(0) << 0x20,auVar108);
    fVar261 = local_a60._0_4_;
    fVar280 = local_a60._4_4_;
    fVar287 = local_a60._8_4_;
    fVar311 = local_a60._12_4_;
    fVar385 = local_a60._16_4_;
    fVar353 = local_a60._20_4_;
    fVar439 = local_a60._24_4_;
    fVar236 = auVar35._0_4_;
    fVar281 = auVar35._4_4_;
    fVar301 = auVar35._8_4_;
    fVar364 = auVar35._12_4_;
    fVar388 = auVar35._16_4_;
    fVar282 = auVar35._20_4_;
    fVar441 = auVar35._24_4_;
    local_a80 = vsubps_avx(ZEXT832(0) << 0x20,auVar109);
    fVar486 = local_a80._0_4_;
    fVar488 = local_a80._4_4_;
    fVar489 = local_a80._8_4_;
    fVar490 = local_a80._12_4_;
    fVar491 = local_a80._16_4_;
    fVar492 = local_a80._20_4_;
    fVar493 = local_a80._24_4_;
    auVar428._0_4_ =
         fVar486 * (float)local_ac0._0_4_ +
         (float)local_9e0._0_4_ * fVar236 + (float)local_8e0._0_4_ * fVar261;
    auVar428._4_4_ =
         fVar488 * (float)local_ac0._4_4_ +
         (float)local_9e0._4_4_ * fVar281 + (float)local_8e0._4_4_ * fVar280;
    auVar428._8_4_ = fVar489 * fStack_ab8 + fStack_9d8 * fVar301 + fStack_8d8 * fVar287;
    auVar428._12_4_ = fVar490 * fStack_ab4 + fStack_9d4 * fVar364 + fStack_8d4 * fVar311;
    auVar428._16_4_ = fVar491 * fStack_ab0 + fStack_9d0 * fVar388 + fStack_8d0 * fVar385;
    auVar428._20_4_ = fVar492 * fStack_aac + fStack_9cc * fVar282 + fStack_8cc * fVar353;
    auVar428._24_4_ = fVar493 * fStack_aa8 + fStack_9c8 * fVar441 + fStack_8c8 * fVar439;
    auVar428._28_4_ = fVar443 + fVar443 + auVar144._28_4_ + fVar443;
    auVar452._0_4_ = fVar486 * fVar486 + fVar236 * fVar236 + fVar261 * fVar261;
    auVar452._4_4_ = fVar488 * fVar488 + fVar281 * fVar281 + fVar280 * fVar280;
    auVar452._8_4_ = fVar489 * fVar489 + fVar301 * fVar301 + fVar287 * fVar287;
    auVar452._12_4_ = fVar490 * fVar490 + fVar364 * fVar364 + fVar311 * fVar311;
    auVar452._16_4_ = fVar491 * fVar491 + fVar388 * fVar388 + fVar385 * fVar385;
    auVar452._20_4_ = fVar492 * fVar492 + fVar282 * fVar282 + fVar353 * fVar353;
    auVar452._24_4_ = fVar493 * fVar493 + fVar441 * fVar441 + fVar439 * fVar439;
    auVar452._28_4_ = fVar164 + fVar164 + fVar443;
    fVar288 = auVar152._0_4_;
    fVar302 = auVar152._4_4_;
    fVar304 = auVar152._8_4_;
    fVar306 = auVar152._12_4_;
    fVar308 = auVar152._16_4_;
    fVar310 = auVar152._20_4_;
    fVar312 = auVar152._24_4_;
    fVar443 = (float)local_ac0._0_4_ * fVar260 * fVar288 +
              fVar288 * fVar259 * (float)local_9e0._0_4_ +
              fVar203 * fVar288 * (float)local_8e0._0_4_;
    fVar446 = (float)local_ac0._4_4_ * fVar264 * fVar302 +
              fVar302 * fVar262 * (float)local_9e0._4_4_ +
              fVar263 * fVar302 * (float)local_8e0._4_4_;
    fVar454 = fStack_ab8 * fVar285 * fVar304 +
              fVar304 * fVar283 * fStack_9d8 + fVar284 * fVar304 * fStack_8d8;
    fVar457 = fStack_ab4 * fVar307 * fVar306 +
              fVar306 * fVar303 * fStack_9d4 + fVar305 * fVar306 * fStack_8d4;
    fVar459 = fStack_ab0 * fVar379 * fVar308 +
              fVar308 * fVar373 * fStack_9d0 + fVar376 * fVar308 * fStack_8d0;
    fVar461 = fStack_aac * fVar421 * fVar310 +
              fVar310 * fVar404 * fStack_9cc + fVar420 * fVar310 * fStack_8cc;
    fVar463 = fStack_aa8 * fVar434 * fVar312 +
              fVar312 * fVar430 * fStack_9c8 + fVar433 * fVar312 * fStack_8c8;
    fVar164 = fStack_aa4 + fStack_9c4 + fStack_8c4;
    fVar468 = fVar486 * fVar260 * fVar288 +
              fVar288 * fVar259 * fVar236 + fVar203 * fVar288 * fVar261;
    fVar474 = fVar488 * fVar264 * fVar302 +
              fVar302 * fVar262 * fVar281 + fVar263 * fVar302 * fVar280;
    fVar476 = fVar489 * fVar285 * fVar304 +
              fVar304 * fVar283 * fVar301 + fVar284 * fVar304 * fVar287;
    fVar478 = fVar490 * fVar307 * fVar306 +
              fVar306 * fVar303 * fVar364 + fVar305 * fVar306 * fVar311;
    fVar480 = fVar491 * fVar379 * fVar308 +
              fVar308 * fVar373 * fVar388 + fVar376 * fVar308 * fVar385;
    fVar482 = fVar492 * fVar421 * fVar310 +
              fVar310 * fVar404 * fVar282 + fVar420 * fVar310 * fVar353;
    fVar484 = fVar493 * fVar434 * fVar312 +
              fVar312 * fVar430 * fVar441 + fVar433 * fVar312 * fVar439;
    fVar485 = fStack_9c4 + fVar164;
    auVar63._4_4_ = fVar474 * fVar446;
    auVar63._0_4_ = fVar468 * fVar443;
    auVar63._8_4_ = fVar476 * fVar454;
    auVar63._12_4_ = fVar478 * fVar457;
    auVar63._16_4_ = fVar480 * fVar459;
    auVar63._20_4_ = fVar482 * fVar461;
    auVar63._24_4_ = fVar484 * fVar463;
    auVar63._28_4_ = fVar164;
    auVar38 = vsubps_avx(auVar428,auVar63);
    auVar64._4_4_ = fVar474 * fVar474;
    auVar64._0_4_ = fVar468 * fVar468;
    auVar64._8_4_ = fVar476 * fVar476;
    auVar64._12_4_ = fVar478 * fVar478;
    auVar64._16_4_ = fVar480 * fVar480;
    auVar64._20_4_ = fVar482 * fVar482;
    auVar64._24_4_ = fVar484 * fVar484;
    auVar64._28_4_ = fStack_9c4;
    auVar39 = vsubps_avx(auVar452,auVar64);
    auVar33 = vsqrtps_avx(auVar142);
    fVar164 = (auVar33._0_4_ + auVar30._0_4_) * 1.0000002;
    fVar465 = (auVar33._4_4_ + auVar30._4_4_) * 1.0000002;
    fVar204 = (auVar33._8_4_ + auVar30._8_4_) * 1.0000002;
    fVar206 = (auVar33._12_4_ + auVar30._12_4_) * 1.0000002;
    fVar208 = (auVar33._16_4_ + auVar30._16_4_) * 1.0000002;
    fVar209 = (auVar33._20_4_ + auVar30._20_4_) * 1.0000002;
    fVar210 = (auVar33._24_4_ + auVar30._24_4_) * 1.0000002;
    auVar65._4_4_ = fVar465 * fVar465;
    auVar65._0_4_ = fVar164 * fVar164;
    auVar65._8_4_ = fVar204 * fVar204;
    auVar65._12_4_ = fVar206 * fVar206;
    auVar65._16_4_ = fVar208 * fVar208;
    auVar65._20_4_ = fVar209 * fVar209;
    auVar65._24_4_ = fVar210 * fVar210;
    auVar65._28_4_ = auVar33._28_4_ + auVar30._28_4_;
    fVar448 = auVar38._0_4_ + auVar38._0_4_;
    fVar456 = auVar38._4_4_ + auVar38._4_4_;
    local_240._0_8_ = CONCAT44(fVar456,fVar448);
    local_240._8_4_ = auVar38._8_4_ + auVar38._8_4_;
    local_240._12_4_ = auVar38._12_4_ + auVar38._12_4_;
    local_240._16_4_ = auVar38._16_4_ + auVar38._16_4_;
    local_240._20_4_ = auVar38._20_4_ + auVar38._20_4_;
    local_240._24_4_ = auVar38._24_4_ + auVar38._24_4_;
    local_240._28_4_ = auVar38._28_4_ + auVar38._28_4_;
    auVar30 = vsubps_avx(auVar39,auVar65);
    auVar66._4_4_ = fVar446 * fVar446;
    auVar66._0_4_ = fVar443 * fVar443;
    auVar66._8_4_ = fVar454 * fVar454;
    auVar66._12_4_ = fVar457 * fVar457;
    auVar66._16_4_ = fVar459 * fVar459;
    auVar66._20_4_ = fVar461 * fVar461;
    auVar66._24_4_ = fVar463 * fVar463;
    auVar66._28_4_ = auVar34._28_4_;
    auVar362 = ZEXT3264(auVar66);
    local_500 = vsubps_avx(local_220,auVar66);
    auVar67._4_4_ = fVar456 * fVar456;
    auVar67._0_4_ = fVar448 * fVar448;
    auVar67._8_4_ = local_240._8_4_ * local_240._8_4_;
    auVar67._12_4_ = local_240._12_4_ * local_240._12_4_;
    auVar67._16_4_ = local_240._16_4_ * local_240._16_4_;
    auVar67._20_4_ = local_240._20_4_ * local_240._20_4_;
    auVar67._24_4_ = local_240._24_4_ * local_240._24_4_;
    auVar67._28_4_ = local_220._28_4_;
    fVar465 = local_500._0_4_;
    fVar204 = local_500._4_4_;
    fVar206 = local_500._8_4_;
    fVar208 = local_500._12_4_;
    fVar209 = local_500._16_4_;
    fVar210 = local_500._20_4_;
    fVar391 = local_500._24_4_;
    auVar68._4_4_ = fVar204 * 4.0 * auVar30._4_4_;
    auVar68._0_4_ = fVar465 * 4.0 * auVar30._0_4_;
    auVar68._8_4_ = fVar206 * 4.0 * auVar30._8_4_;
    auVar68._12_4_ = fVar208 * 4.0 * auVar30._12_4_;
    auVar68._16_4_ = fVar209 * 4.0 * auVar30._16_4_;
    auVar68._20_4_ = fVar210 * 4.0 * auVar30._20_4_;
    auVar68._24_4_ = fVar391 * 4.0 * auVar30._24_4_;
    auVar68._28_4_ = 0x40800000;
    auVar38 = vsubps_avx(auVar67,auVar68);
    auVar142 = vcmpps_avx(auVar38,ZEXT432(0) << 0x20,5);
    fVar164 = local_500._28_4_;
    if ((((((((auVar142 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar142 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar142 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar142 >> 0x7f,0) == '\0') &&
          (auVar142 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar142 >> 0xbf,0) == '\0') &&
        (auVar142 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar142[0x1f])
    {
      auVar147._8_4_ = 0x7f800000;
      auVar147._0_8_ = 0x7f8000007f800000;
      auVar147._12_4_ = 0x7f800000;
      auVar147._16_4_ = 0x7f800000;
      auVar147._20_4_ = 0x7f800000;
      auVar147._24_4_ = 0x7f800000;
      auVar147._28_4_ = 0x7f800000;
      auVar471._8_4_ = 0xff800000;
      auVar471._0_8_ = 0xff800000ff800000;
      auVar471._12_4_ = 0xff800000;
      auVar471._16_4_ = 0xff800000;
      auVar471._20_4_ = 0xff800000;
      auVar471._24_4_ = 0xff800000;
      auVar471._28_4_ = 0xff800000;
    }
    else {
      auVar182 = vsqrtps_avx(auVar38);
      auVar320._0_4_ = fVar465 + fVar465;
      auVar320._4_4_ = fVar204 + fVar204;
      auVar320._8_4_ = fVar206 + fVar206;
      auVar320._12_4_ = fVar208 + fVar208;
      auVar320._16_4_ = fVar209 + fVar209;
      auVar320._20_4_ = fVar210 + fVar210;
      auVar320._24_4_ = fVar391 + fVar391;
      auVar320._28_4_ = fVar164 + fVar164;
      auVar144 = vrcpps_avx(auVar320);
      auVar143 = vcmpps_avx(auVar38,ZEXT432(0) << 0x20,5);
      fVar313 = auVar144._0_4_;
      fVar323 = auVar144._4_4_;
      auVar69._4_4_ = auVar320._4_4_ * fVar323;
      auVar69._0_4_ = auVar320._0_4_ * fVar313;
      fVar324 = auVar144._8_4_;
      auVar69._8_4_ = auVar320._8_4_ * fVar324;
      fVar325 = auVar144._12_4_;
      auVar69._12_4_ = auVar320._12_4_ * fVar325;
      fVar326 = auVar144._16_4_;
      auVar69._16_4_ = auVar320._16_4_ * fVar326;
      fVar327 = auVar144._20_4_;
      auVar69._20_4_ = auVar320._20_4_ * fVar327;
      fVar328 = auVar144._24_4_;
      auVar69._24_4_ = auVar320._24_4_ * fVar328;
      auVar69._28_4_ = auVar320._28_4_;
      auVar148._8_4_ = 0x3f800000;
      auVar148._0_8_ = &DAT_3f8000003f800000;
      auVar148._12_4_ = 0x3f800000;
      auVar148._16_4_ = 0x3f800000;
      auVar148._20_4_ = 0x3f800000;
      auVar148._24_4_ = 0x3f800000;
      auVar148._28_4_ = 0x3f800000;
      auVar38 = vsubps_avx(auVar148,auVar69);
      fVar313 = fVar313 + fVar313 * auVar38._0_4_;
      fVar323 = fVar323 + fVar323 * auVar38._4_4_;
      fVar324 = fVar324 + fVar324 * auVar38._8_4_;
      fVar325 = fVar325 + fVar325 * auVar38._12_4_;
      fVar326 = fVar326 + fVar326 * auVar38._16_4_;
      fVar327 = fVar327 + fVar327 * auVar38._20_4_;
      fVar328 = fVar328 + fVar328 * auVar38._24_4_;
      auVar336._0_8_ = CONCAT44(fVar456,fVar448) ^ 0x8000000080000000;
      auVar336._8_4_ = -local_240._8_4_;
      auVar336._12_4_ = -local_240._12_4_;
      auVar336._16_4_ = -local_240._16_4_;
      auVar336._20_4_ = -local_240._20_4_;
      auVar336._24_4_ = -local_240._24_4_;
      auVar336._28_4_ = -local_240._28_4_;
      auVar183 = vsubps_avx(auVar336,auVar182);
      fVar448 = auVar183._0_4_ * fVar313;
      fVar456 = auVar183._4_4_ * fVar323;
      auVar70._4_4_ = fVar456;
      auVar70._0_4_ = fVar448;
      fVar344 = auVar183._8_4_ * fVar324;
      auVar70._8_4_ = fVar344;
      fVar346 = auVar183._12_4_ * fVar325;
      auVar70._12_4_ = fVar346;
      fVar348 = auVar183._16_4_ * fVar326;
      auVar70._16_4_ = fVar348;
      fVar350 = auVar183._20_4_ * fVar327;
      auVar70._20_4_ = fVar350;
      fVar352 = auVar183._24_4_ * fVar328;
      auVar70._24_4_ = fVar352;
      auVar70._28_4_ = auVar183._28_4_;
      auVar182 = vsubps_avx(auVar182,local_240);
      fVar313 = auVar182._0_4_ * fVar313;
      fVar323 = auVar182._4_4_ * fVar323;
      auVar71._4_4_ = fVar323;
      auVar71._0_4_ = fVar313;
      fVar324 = auVar182._8_4_ * fVar324;
      auVar71._8_4_ = fVar324;
      fVar325 = auVar182._12_4_ * fVar325;
      auVar71._12_4_ = fVar325;
      fVar326 = auVar182._16_4_ * fVar326;
      auVar71._16_4_ = fVar326;
      fVar327 = auVar182._20_4_ * fVar327;
      auVar71._20_4_ = fVar327;
      fVar328 = auVar182._24_4_ * fVar328;
      auVar71._24_4_ = fVar328;
      auVar71._28_4_ = auVar182._28_4_;
      fStack_624 = fVar485 + auVar144._28_4_ + auVar38._28_4_;
      local_640[0] = fVar288 * (fVar468 + fVar443 * fVar448);
      local_640[1] = fVar302 * (fVar474 + fVar446 * fVar456);
      local_640[2] = fVar304 * (fVar476 + fVar454 * fVar344);
      local_640[3] = fVar306 * (fVar478 + fVar457 * fVar346);
      fStack_630 = fVar308 * (fVar480 + fVar459 * fVar348);
      fStack_62c = fVar310 * (fVar482 + fVar461 * fVar350);
      fStack_628 = fVar312 * (fVar484 + fVar463 * fVar352);
      local_660[0] = fVar288 * (fVar468 + fVar443 * fVar313);
      local_660[1] = fVar302 * (fVar474 + fVar446 * fVar323);
      local_660[2] = fVar304 * (fVar476 + fVar454 * fVar324);
      local_660[3] = fVar306 * (fVar478 + fVar457 * fVar325);
      fStack_650 = fVar308 * (fVar480 + fVar459 * fVar326);
      fStack_64c = fVar310 * (fVar482 + fVar461 * fVar327);
      fStack_648 = fVar312 * (fVar484 + fVar463 * fVar328);
      fStack_644 = fVar485 + fStack_624;
      auVar321._8_4_ = 0x7f800000;
      auVar321._0_8_ = 0x7f8000007f800000;
      auVar321._12_4_ = 0x7f800000;
      auVar321._16_4_ = 0x7f800000;
      auVar321._20_4_ = 0x7f800000;
      auVar321._24_4_ = 0x7f800000;
      auVar321._28_4_ = 0x7f800000;
      auVar147 = vblendvps_avx(auVar321,auVar70,auVar143);
      auVar337._8_4_ = 0x7fffffff;
      auVar337._0_8_ = 0x7fffffff7fffffff;
      auVar337._12_4_ = 0x7fffffff;
      auVar337._16_4_ = 0x7fffffff;
      auVar337._20_4_ = 0x7fffffff;
      auVar337._24_4_ = 0x7fffffff;
      auVar337._28_4_ = 0x7fffffff;
      auVar38 = vandps_avx(auVar66,auVar337);
      auVar38 = vmaxps_avx(local_4a0,auVar38);
      auVar362 = ZEXT3264(CONCAT428(0x36000000,
                                    CONCAT424(0x36000000,
                                              CONCAT420(0x36000000,
                                                        CONCAT416(0x36000000,
                                                                  CONCAT412(0x36000000,
                                                                            CONCAT48(0x36000000,
                                                                                                                                                                          
                                                  0x3600000036000000)))))));
      auVar72._4_4_ = auVar38._4_4_ * 1.9073486e-06;
      auVar72._0_4_ = auVar38._0_4_ * 1.9073486e-06;
      auVar72._8_4_ = auVar38._8_4_ * 1.9073486e-06;
      auVar72._12_4_ = auVar38._12_4_ * 1.9073486e-06;
      auVar72._16_4_ = auVar38._16_4_ * 1.9073486e-06;
      auVar72._20_4_ = auVar38._20_4_ * 1.9073486e-06;
      auVar72._24_4_ = auVar38._24_4_ * 1.9073486e-06;
      auVar72._28_4_ = auVar38._28_4_;
      auVar38 = vandps_avx(local_500,auVar337);
      auVar38 = vcmpps_avx(auVar38,auVar72,1);
      auVar322._8_4_ = 0xff800000;
      auVar322._0_8_ = 0xff800000ff800000;
      auVar322._12_4_ = 0xff800000;
      auVar322._16_4_ = 0xff800000;
      auVar322._20_4_ = 0xff800000;
      auVar322._24_4_ = 0xff800000;
      auVar322._28_4_ = 0xff800000;
      auVar471 = vblendvps_avx(auVar322,auVar71,auVar143);
      auVar144 = auVar143 & auVar38;
      if ((((((((auVar144 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar144 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar144 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar144 >> 0x7f,0) != '\0') ||
            (auVar144 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar144 >> 0xbf,0) != '\0') ||
          (auVar144 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar144[0x1f] < '\0') {
        auVar142 = vandps_avx(auVar38,auVar143);
        auVar179 = vpackssdw_avx(auVar142._0_16_,auVar142._16_16_);
        auVar98 = ZEXT812(0);
        auVar362 = ZEXT1264(auVar98) << 0x20;
        auVar38 = vcmpps_avx(auVar30,ZEXT1232(auVar98) << 0x20,2);
        auVar402._8_4_ = 0xff800000;
        auVar402._0_8_ = 0xff800000ff800000;
        auVar402._12_4_ = 0xff800000;
        auVar402._16_4_ = 0xff800000;
        auVar402._20_4_ = 0xff800000;
        auVar402._24_4_ = 0xff800000;
        auVar402._28_4_ = 0xff800000;
        auVar453._8_4_ = 0x7f800000;
        auVar453._0_8_ = 0x7f8000007f800000;
        auVar453._12_4_ = 0x7f800000;
        auVar453._16_4_ = 0x7f800000;
        auVar453._20_4_ = 0x7f800000;
        auVar453._24_4_ = 0x7f800000;
        auVar453._28_4_ = 0x7f800000;
        auVar30 = vblendvps_avx(auVar453,auVar402,auVar38);
        auVar248 = vpmovsxwd_avx(auVar179);
        auVar179 = vpunpckhwd_avx(auVar179,auVar179);
        auVar300._16_16_ = auVar179;
        auVar300._0_16_ = auVar248;
        auVar147 = vblendvps_avx(auVar147,auVar30,auVar300);
        auVar30 = vblendvps_avx(auVar402,auVar453,auVar38);
        auVar471 = vblendvps_avx(auVar471,auVar30,auVar300);
        auVar30 = vcmpps_avx(ZEXT1232(auVar98) << 0x20,ZEXT1232(auVar98) << 0x20,0xf);
        auVar199._0_4_ = auVar142._0_4_ ^ auVar30._0_4_;
        auVar199._4_4_ = auVar142._4_4_ ^ auVar30._4_4_;
        auVar199._8_4_ = auVar142._8_4_ ^ auVar30._8_4_;
        auVar199._12_4_ = auVar142._12_4_ ^ auVar30._12_4_;
        auVar199._16_4_ = auVar142._16_4_ ^ auVar30._16_4_;
        auVar199._20_4_ = auVar142._20_4_ ^ auVar30._20_4_;
        auVar199._24_4_ = auVar142._24_4_ ^ auVar30._24_4_;
        auVar199._28_4_ = auVar142._28_4_ ^ auVar30._28_4_;
        auVar142 = vorps_avx(auVar38,auVar199);
        auVar142 = vandps_avx(auVar143,auVar142);
      }
    }
    auVar30 = local_480 & auVar142;
    if ((((((((auVar30 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar30 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar30 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar30 >> 0x7f,0) == '\0') &&
          (auVar30 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar30 >> 0xbf,0) == '\0') &&
        (auVar30 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar30[0x1f]) {
LAB_01287f2a:
      auVar403 = ZEXT3264(local_840);
      auVar279 = ZEXT3264(CONCAT428(0x3f800000,
                                    CONCAT424(0x3f800000,
                                              CONCAT420(0x3f800000,
                                                        CONCAT416(0x3f800000,
                                                                  CONCAT412(0x3f800000,
                                                                            CONCAT48(0x3f800000,
                                                                                     &
                                                  DAT_3f8000003f800000)))))));
    }
    else {
      local_2a0 = auVar152;
      auVar179 = vshufps_avx(ZEXT416((uint)(*(float *)(ray + k * 4 + 0x100) - (float)local_8b0._0_4_
                                           )),
                             ZEXT416((uint)(*(float *)(ray + k * 4 + 0x100) - (float)local_8b0._0_4_
                                           )),0);
      auVar225._16_16_ = auVar179;
      auVar225._0_16_ = auVar179;
      auVar143 = vminps_avx(auVar225,auVar471);
      fVar326 = auVar35._28_4_;
      auVar149._0_4_ =
           (float)local_ac0._0_4_ * fVar329 +
           (float)local_9e0._0_4_ * fVar422 + (float)local_8e0._0_4_ * fVar447;
      auVar149._4_4_ =
           (float)local_ac0._4_4_ * fVar342 +
           (float)local_9e0._4_4_ * fVar432 + (float)local_8e0._4_4_ * fVar455;
      auVar149._8_4_ = fStack_ab8 * fVar343 + fStack_9d8 * fVar435 + fStack_8d8 * fVar458;
      auVar149._12_4_ = fStack_ab4 * fVar345 + fStack_9d4 * fVar438 + fStack_8d4 * fVar460;
      auVar149._16_4_ = fStack_ab0 * fVar347 + fStack_9d0 * fVar440 + fStack_8d0 * fVar462;
      auVar149._20_4_ = fStack_aac * fVar349 + fStack_9cc * fVar442 + fStack_8cc * fVar464;
      auVar149._24_4_ = fStack_aa8 * fVar351 + fStack_9c8 * fVar444 + fStack_8c8 * fVar466;
      auVar149._28_4_ = fVar354 + fVar445 + fVar326;
      auVar30 = vrcpps_avx(auVar149);
      fVar354 = auVar30._0_4_;
      fVar448 = auVar30._4_4_;
      auVar73._4_4_ = auVar149._4_4_ * fVar448;
      auVar73._0_4_ = auVar149._0_4_ * fVar354;
      fVar456 = auVar30._8_4_;
      auVar73._8_4_ = auVar149._8_4_ * fVar456;
      fVar313 = auVar30._12_4_;
      auVar73._12_4_ = auVar149._12_4_ * fVar313;
      fVar323 = auVar30._16_4_;
      auVar73._16_4_ = auVar149._16_4_ * fVar323;
      fVar324 = auVar30._20_4_;
      auVar73._20_4_ = auVar149._20_4_ * fVar324;
      fVar325 = auVar30._24_4_;
      auVar73._24_4_ = auVar149._24_4_ * fVar325;
      auVar73._28_4_ = fVar445;
      auVar400._8_4_ = 0x3f800000;
      auVar400._0_8_ = &DAT_3f8000003f800000;
      auVar400._12_4_ = 0x3f800000;
      auVar400._16_4_ = 0x3f800000;
      auVar400._20_4_ = 0x3f800000;
      auVar400._24_4_ = 0x3f800000;
      auVar400._28_4_ = 0x3f800000;
      auVar38 = vsubps_avx(auVar400,auVar73);
      auVar338._8_4_ = 0x7fffffff;
      auVar338._0_8_ = 0x7fffffff7fffffff;
      auVar338._12_4_ = 0x7fffffff;
      auVar338._16_4_ = 0x7fffffff;
      auVar338._20_4_ = 0x7fffffff;
      auVar338._24_4_ = 0x7fffffff;
      auVar338._28_4_ = 0x7fffffff;
      auVar30 = vandps_avx(auVar149,auVar338);
      auVar371._8_4_ = 0x219392ef;
      auVar371._0_8_ = 0x219392ef219392ef;
      auVar371._12_4_ = 0x219392ef;
      auVar371._16_4_ = 0x219392ef;
      auVar371._20_4_ = 0x219392ef;
      auVar371._24_4_ = 0x219392ef;
      auVar371._28_4_ = 0x219392ef;
      auVar35 = vcmpps_avx(auVar30,auVar371,1);
      auVar362 = ZEXT3264(CONCAT428(0x80000000,
                                    CONCAT424(0x80000000,
                                              CONCAT420(0x80000000,
                                                        CONCAT416(0x80000000,
                                                                  CONCAT412(0x80000000,
                                                                            CONCAT48(0x80000000,
                                                                                                                                                                          
                                                  0x8000000080000000)))))));
      auVar74._4_4_ =
           (fVar448 + fVar448 * auVar38._4_4_) *
           -(fVar342 * fVar488 + fVar432 * fVar281 + fVar455 * fVar280);
      auVar74._0_4_ =
           (fVar354 + fVar354 * auVar38._0_4_) *
           -(fVar329 * fVar486 + fVar422 * fVar236 + fVar447 * fVar261);
      auVar74._8_4_ =
           (fVar456 + fVar456 * auVar38._8_4_) *
           -(fVar343 * fVar489 + fVar435 * fVar301 + fVar458 * fVar287);
      auVar74._12_4_ =
           (fVar313 + fVar313 * auVar38._12_4_) *
           -(fVar345 * fVar490 + fVar438 * fVar364 + fVar460 * fVar311);
      auVar74._16_4_ =
           (fVar323 + fVar323 * auVar38._16_4_) *
           -(fVar347 * fVar491 + fVar440 * fVar388 + fVar462 * fVar385);
      auVar74._20_4_ =
           (fVar324 + fVar324 * auVar38._20_4_) *
           -(fVar349 * fVar492 + fVar442 * fVar282 + fVar464 * fVar353);
      auVar74._24_4_ =
           (fVar325 + fVar325 * auVar38._24_4_) *
           -(fVar351 * fVar493 + fVar444 * fVar441 + fVar466 * fVar439);
      auVar74._28_4_ = -(fVar326 + local_a60._28_4_ + fVar326);
      auVar98 = ZEXT812(0);
      auVar30 = vcmpps_avx(auVar149,ZEXT1232(auVar98) << 0x20,1);
      auVar30 = vorps_avx(auVar35,auVar30);
      auVar412._8_4_ = 0xff800000;
      auVar412._0_8_ = 0xff800000ff800000;
      auVar412._12_4_ = 0xff800000;
      auVar412._16_4_ = 0xff800000;
      auVar412._20_4_ = 0xff800000;
      auVar412._24_4_ = 0xff800000;
      auVar412._28_4_ = 0xff800000;
      auVar413 = ZEXT3264(auVar412);
      auVar30 = vblendvps_avx(auVar74,auVar412,auVar30);
      auVar38 = vcmpps_avx(auVar149,ZEXT1232(auVar98) << 0x20,6);
      auVar35 = vorps_avx(auVar35,auVar38);
      auVar429._8_4_ = 0x7f800000;
      auVar429._0_8_ = 0x7f8000007f800000;
      auVar429._12_4_ = 0x7f800000;
      auVar429._16_4_ = 0x7f800000;
      auVar429._20_4_ = 0x7f800000;
      auVar429._24_4_ = 0x7f800000;
      auVar429._28_4_ = 0x7f800000;
      auVar35 = vblendvps_avx(auVar74,auVar429,auVar35);
      auVar38 = vmaxps_avx(local_260,auVar147);
      auVar38 = vmaxps_avx(auVar38,auVar30);
      auVar35 = vminps_avx(auVar143,auVar35);
      uStack_b84 = auVar32._28_4_;
      auVar144 = ZEXT1232(auVar98) << 0x20;
      auVar30 = vsubps_avx(auVar144,auVar31);
      auVar31 = vsubps_avx(auVar144,_local_aa0);
      auVar75._4_4_ = auVar31._4_4_ * -fVar414;
      auVar75._0_4_ = auVar31._0_4_ * -fVar405;
      auVar75._8_4_ = auVar31._8_4_ * -fVar415;
      auVar75._12_4_ = auVar31._12_4_ * -fVar416;
      auVar75._16_4_ = auVar31._16_4_ * -fVar417;
      auVar75._20_4_ = auVar31._20_4_ * -fVar418;
      auVar75._24_4_ = auVar31._24_4_ * -fVar419;
      auVar75._28_4_ = auVar31._28_4_;
      auVar76._4_4_ = fVar473 * auVar30._4_4_;
      auVar76._0_4_ = fVar467 * auVar30._0_4_;
      auVar76._8_4_ = fVar475 * auVar30._8_4_;
      auVar76._12_4_ = fVar477 * auVar30._12_4_;
      auVar76._16_4_ = fVar479 * auVar30._16_4_;
      auVar76._20_4_ = fVar481 * auVar30._20_4_;
      auVar76._24_4_ = fVar483 * auVar30._24_4_;
      auVar76._28_4_ = auVar30._28_4_;
      auVar30 = vsubps_avx(auVar75,auVar76);
      auVar31 = vsubps_avx(auVar144,auVar372);
      auVar77._4_4_ = fVar265 * auVar31._4_4_;
      auVar77._0_4_ = fVar207 * auVar31._0_4_;
      auVar77._8_4_ = fVar286 * auVar31._8_4_;
      auVar77._12_4_ = fVar309 * auVar31._12_4_;
      auVar77._16_4_ = fVar382 * auVar31._16_4_;
      auVar77._20_4_ = fVar431 * auVar31._20_4_;
      uVar7 = auVar31._28_4_;
      auVar77._24_4_ = fVar437 * auVar31._24_4_;
      auVar77._28_4_ = uVar7;
      auVar372 = vsubps_avx(auVar30,auVar77);
      auVar78._4_4_ = (float)local_8e0._4_4_ * -fVar414;
      auVar78._0_4_ = (float)local_8e0._0_4_ * -fVar405;
      auVar78._8_4_ = fStack_8d8 * -fVar415;
      auVar78._12_4_ = fStack_8d4 * -fVar416;
      auVar78._16_4_ = fStack_8d0 * -fVar417;
      auVar78._20_4_ = fStack_8cc * -fVar418;
      auVar78._24_4_ = fStack_8c8 * -fVar419;
      auVar78._28_4_ = uStack_b84 ^ 0x80000000;
      auVar79._4_4_ = (float)local_9e0._4_4_ * fVar473;
      auVar79._0_4_ = (float)local_9e0._0_4_ * fVar467;
      auVar79._8_4_ = fStack_9d8 * fVar475;
      auVar79._12_4_ = fStack_9d4 * fVar477;
      auVar79._16_4_ = fStack_9d0 * fVar479;
      auVar79._20_4_ = fStack_9cc * fVar481;
      auVar79._24_4_ = fStack_9c8 * fVar483;
      auVar79._28_4_ = uVar7;
      auVar401._8_4_ = 0x3f800000;
      auVar401._0_8_ = &DAT_3f8000003f800000;
      auVar401._12_4_ = 0x3f800000;
      auVar401._16_4_ = 0x3f800000;
      auVar401._20_4_ = 0x3f800000;
      auVar401._24_4_ = 0x3f800000;
      auVar401._28_4_ = 0x3f800000;
      auVar30 = vsubps_avx(auVar78,auVar79);
      auVar80._4_4_ = fVar265 * (float)local_ac0._4_4_;
      auVar80._0_4_ = fVar207 * (float)local_ac0._0_4_;
      auVar80._8_4_ = fVar286 * fStack_ab8;
      auVar80._12_4_ = fVar309 * fStack_ab4;
      auVar80._16_4_ = fVar382 * fStack_ab0;
      auVar80._20_4_ = fVar431 * fStack_aac;
      auVar80._24_4_ = fVar437 * fStack_aa8;
      auVar80._28_4_ = uVar7;
      auVar32 = vsubps_avx(auVar30,auVar80);
      auVar30 = vrcpps_avx(auVar32);
      fVar207 = auVar30._0_4_;
      fVar261 = auVar30._4_4_;
      auVar81._4_4_ = auVar32._4_4_ * fVar261;
      auVar81._0_4_ = auVar32._0_4_ * fVar207;
      fVar236 = auVar30._8_4_;
      auVar81._8_4_ = auVar32._8_4_ * fVar236;
      fVar265 = auVar30._12_4_;
      auVar81._12_4_ = auVar32._12_4_ * fVar265;
      fVar280 = auVar30._16_4_;
      auVar81._16_4_ = auVar32._16_4_ * fVar280;
      fVar281 = auVar30._20_4_;
      auVar81._20_4_ = auVar32._20_4_ * fVar281;
      fVar286 = auVar30._24_4_;
      auVar81._24_4_ = auVar32._24_4_ * fVar286;
      auVar81._28_4_ = fStack_aa4;
      auVar143 = vsubps_avx(auVar401,auVar81);
      auVar30 = vandps_avx(auVar32,auVar338);
      auVar339._8_4_ = 0x219392ef;
      auVar339._0_8_ = 0x219392ef219392ef;
      auVar339._12_4_ = 0x219392ef;
      auVar339._16_4_ = 0x219392ef;
      auVar339._20_4_ = 0x219392ef;
      auVar339._24_4_ = 0x219392ef;
      auVar339._28_4_ = 0x219392ef;
      auVar31 = vcmpps_avx(auVar30,auVar339,1);
      auVar82._4_4_ = (fVar261 + fVar261 * auVar143._4_4_) * -auVar372._4_4_;
      auVar82._0_4_ = (fVar207 + fVar207 * auVar143._0_4_) * -auVar372._0_4_;
      auVar82._8_4_ = (fVar236 + fVar236 * auVar143._8_4_) * -auVar372._8_4_;
      auVar82._12_4_ = (fVar265 + fVar265 * auVar143._12_4_) * -auVar372._12_4_;
      auVar82._16_4_ = (fVar280 + fVar280 * auVar143._16_4_) * -auVar372._16_4_;
      auVar82._20_4_ = (fVar281 + fVar281 * auVar143._20_4_) * -auVar372._20_4_;
      auVar82._24_4_ = (fVar286 + fVar286 * auVar143._24_4_) * -auVar372._24_4_;
      auVar82._28_4_ = auVar372._28_4_ ^ 0x80000000;
      auVar30 = vcmpps_avx(auVar32,auVar144,1);
      auVar30 = vorps_avx(auVar31,auVar30);
      auVar30 = vblendvps_avx(auVar82,auVar412,auVar30);
      _local_6c0 = vmaxps_avx(auVar38,auVar30);
      auVar372 = ZEXT1232(auVar98) << 0x20;
      auVar30 = vcmpps_avx(auVar32,auVar372,6);
      auVar30 = vorps_avx(auVar31,auVar30);
      auVar30 = vblendvps_avx(auVar82,auVar429,auVar30);
      auVar142 = vandps_avx(auVar142,local_480);
      local_2c0 = vminps_avx(auVar35,auVar30);
      auVar30 = vcmpps_avx(_local_6c0,local_2c0,2);
      auVar31 = auVar142 & auVar30;
      if ((((((((auVar31 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar31 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar31 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar31 >> 0x7f,0) == '\0') &&
            (auVar31 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar31 >> 0xbf,0) == '\0') &&
          (auVar31 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar31[0x1f])
      {
        auVar279 = ZEXT3264(auVar401);
        auVar403 = ZEXT3264(local_840);
      }
      else {
        auVar31 = vminps_avx(local_920,auVar185);
        auVar32 = vminps_avx(_local_800,local_820);
        auVar31 = vminps_avx(auVar31,auVar32);
        auVar31 = vsubps_avx(auVar31,auVar33);
        auVar142 = vandps_avx(auVar30,auVar142);
        auVar119._4_4_ = local_640[1];
        auVar119._0_4_ = local_640[0];
        auVar119._8_4_ = local_640[2];
        auVar119._12_4_ = local_640[3];
        auVar119._16_4_ = fStack_630;
        auVar119._20_4_ = fStack_62c;
        auVar119._24_4_ = fStack_628;
        auVar119._28_4_ = fStack_624;
        auVar30 = vminps_avx(auVar119,auVar401);
        auVar30 = vmaxps_avx(auVar30,ZEXT832(0) << 0x20);
        local_640[0] = fVar130 + fVar163 * (auVar30._0_4_ + 0.0) * 0.125;
        local_640[1] = fVar161 + fVar201 * (auVar30._4_4_ + 1.0) * 0.125;
        local_640[2] = fVar162 + fVar202 * (auVar30._8_4_ + 2.0) * 0.125;
        local_640[3] = fStack_c24 + fVar205 * (auVar30._12_4_ + 3.0) * 0.125;
        fStack_630 = fVar130 + fVar163 * (auVar30._16_4_ + 4.0) * 0.125;
        fStack_62c = fVar161 + fVar201 * (auVar30._20_4_ + 5.0) * 0.125;
        fStack_628 = fVar162 + fVar202 * (auVar30._24_4_ + 6.0) * 0.125;
        fStack_624 = fStack_c24 + auVar30._28_4_ + 7.0;
        auVar118._4_4_ = local_660[1];
        auVar118._0_4_ = local_660[0];
        auVar118._8_4_ = local_660[2];
        auVar118._12_4_ = local_660[3];
        auVar118._16_4_ = fStack_650;
        auVar118._20_4_ = fStack_64c;
        auVar118._24_4_ = fStack_648;
        auVar118._28_4_ = fStack_644;
        auVar30 = vminps_avx(auVar118,auVar401);
        auVar30 = vmaxps_avx(auVar30,ZEXT832(0) << 0x20);
        local_660[0] = fVar130 + fVar163 * (auVar30._0_4_ + 0.0) * 0.125;
        local_660[1] = fVar161 + fVar201 * (auVar30._4_4_ + 1.0) * 0.125;
        local_660[2] = fVar162 + fVar202 * (auVar30._8_4_ + 2.0) * 0.125;
        local_660[3] = fStack_c24 + fVar205 * (auVar30._12_4_ + 3.0) * 0.125;
        fStack_650 = fVar130 + fVar163 * (auVar30._16_4_ + 4.0) * 0.125;
        fStack_64c = fVar161 + fVar201 * (auVar30._20_4_ + 5.0) * 0.125;
        fStack_648 = fVar162 + fVar202 * (auVar30._24_4_ + 6.0) * 0.125;
        fStack_644 = fStack_c24 + auVar30._28_4_ + 7.0;
        auVar84._4_4_ = auVar31._4_4_ * 0.99999976;
        auVar84._0_4_ = auVar31._0_4_ * 0.99999976;
        auVar84._8_4_ = auVar31._8_4_ * 0.99999976;
        auVar84._12_4_ = auVar31._12_4_ * 0.99999976;
        auVar84._16_4_ = auVar31._16_4_ * 0.99999976;
        auVar84._20_4_ = auVar31._20_4_ * 0.99999976;
        auVar84._24_4_ = auVar31._24_4_ * 0.99999976;
        auVar84._28_4_ = 0x3f7ffffc;
        auVar30 = vmaxps_avx(auVar372,auVar84);
        auVar85._4_4_ = auVar30._4_4_ * auVar30._4_4_;
        auVar85._0_4_ = auVar30._0_4_ * auVar30._0_4_;
        auVar85._8_4_ = auVar30._8_4_ * auVar30._8_4_;
        auVar85._12_4_ = auVar30._12_4_ * auVar30._12_4_;
        auVar85._16_4_ = auVar30._16_4_ * auVar30._16_4_;
        auVar85._20_4_ = auVar30._20_4_ * auVar30._20_4_;
        auVar85._24_4_ = auVar30._24_4_ * auVar30._24_4_;
        auVar85._28_4_ = auVar30._28_4_;
        auVar31 = vsubps_avx(auVar39,auVar85);
        auVar86._4_4_ = auVar31._4_4_ * fVar204 * 4.0;
        auVar86._0_4_ = auVar31._0_4_ * fVar465 * 4.0;
        auVar86._8_4_ = auVar31._8_4_ * fVar206 * 4.0;
        auVar86._12_4_ = auVar31._12_4_ * fVar208 * 4.0;
        auVar86._16_4_ = auVar31._16_4_ * fVar209 * 4.0;
        auVar86._20_4_ = auVar31._20_4_ * fVar210 * 4.0;
        auVar86._24_4_ = auVar31._24_4_ * fVar391 * 4.0;
        auVar86._28_4_ = auVar30._28_4_;
        auVar32 = vsubps_avx(auVar67,auVar86);
        _local_880 = ZEXT432(0) << 0x20;
        auVar30 = vcmpps_avx(auVar32,ZEXT832(0) << 0x20,5);
        if ((((((((auVar30 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar30 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar30 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar30 >> 0x7f,0) == '\0') &&
              (auVar30 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar30 >> 0xbf,0) == '\0') &&
            (auVar30 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar30[0x1f]) {
          _local_760 = ZEXT832(0) << 0x20;
          auVar251 = ZEXT1228(ZEXT812(0)) << 0x20;
          auVar275 = ZEXT828(0) << 0x20;
          auVar362 = ZEXT864(0) << 0x20;
          auVar227._8_4_ = 0x7f800000;
          auVar227._0_8_ = 0x7f8000007f800000;
          auVar227._12_4_ = 0x7f800000;
          auVar227._16_4_ = 0x7f800000;
          auVar227._20_4_ = 0x7f800000;
          auVar227._24_4_ = 0x7f800000;
          auVar227._28_4_ = 0x7f800000;
          auVar294._8_4_ = 0xff800000;
          auVar294._0_8_ = 0xff800000ff800000;
          auVar294._12_4_ = 0xff800000;
          auVar294._16_4_ = 0xff800000;
          auVar294._20_4_ = 0xff800000;
          auVar294._24_4_ = 0xff800000;
          auVar294._28_4_ = 0xff800000;
          _local_740 = _local_760;
        }
        else {
          auVar35 = vsqrtps_avx(auVar32);
          auVar276._0_4_ = fVar465 + fVar465;
          auVar276._4_4_ = fVar204 + fVar204;
          auVar276._8_4_ = fVar206 + fVar206;
          auVar276._12_4_ = fVar208 + fVar208;
          auVar276._16_4_ = fVar209 + fVar209;
          auVar276._20_4_ = fVar210 + fVar210;
          auVar276._24_4_ = fVar391 + fVar391;
          auVar276._28_4_ = fVar164 + fVar164;
          auVar33 = vrcpps_avx(auVar276);
          fVar164 = auVar33._0_4_;
          fVar207 = auVar33._4_4_;
          auVar87._4_4_ = auVar276._4_4_ * fVar207;
          auVar87._0_4_ = auVar276._0_4_ * fVar164;
          fVar261 = auVar33._8_4_;
          auVar87._8_4_ = auVar276._8_4_ * fVar261;
          fVar236 = auVar33._12_4_;
          auVar87._12_4_ = auVar276._12_4_ * fVar236;
          fVar265 = auVar33._16_4_;
          auVar87._16_4_ = auVar276._16_4_ * fVar265;
          fVar280 = auVar33._20_4_;
          auVar87._20_4_ = auVar276._20_4_ * fVar280;
          fVar281 = auVar33._24_4_;
          auVar87._24_4_ = auVar276._24_4_ * fVar281;
          auVar87._28_4_ = auVar276._28_4_;
          auVar38 = vsubps_avx(auVar401,auVar87);
          fVar164 = fVar164 + fVar164 * auVar38._0_4_;
          fVar207 = fVar207 + fVar207 * auVar38._4_4_;
          fVar261 = fVar261 + fVar261 * auVar38._8_4_;
          fVar236 = fVar236 + fVar236 * auVar38._12_4_;
          fVar265 = fVar265 + fVar265 * auVar38._16_4_;
          fVar280 = fVar280 + fVar280 * auVar38._20_4_;
          fVar281 = fVar281 + fVar281 * auVar38._24_4_;
          fVar286 = auVar33._28_4_ + auVar38._28_4_;
          auVar295._0_8_ = local_240._0_8_ ^ 0x8000000080000000;
          auVar295._8_4_ = -local_240._8_4_;
          auVar295._12_4_ = -local_240._12_4_;
          auVar295._16_4_ = -local_240._16_4_;
          auVar295._20_4_ = -local_240._20_4_;
          auVar295._24_4_ = -local_240._24_4_;
          auVar295._28_4_ = -local_240._28_4_;
          auVar33 = vsubps_avx(auVar295,auVar35);
          fVar388 = auVar33._0_4_ * fVar164;
          fVar431 = auVar33._4_4_ * fVar207;
          auVar88._4_4_ = fVar431;
          auVar88._0_4_ = fVar388;
          fVar353 = auVar33._8_4_ * fVar261;
          auVar88._8_4_ = fVar353;
          fVar282 = auVar33._12_4_ * fVar236;
          auVar88._12_4_ = fVar282;
          fVar437 = auVar33._16_4_ * fVar265;
          auVar88._16_4_ = fVar437;
          fVar439 = auVar33._20_4_ * fVar280;
          auVar88._20_4_ = fVar439;
          fVar441 = auVar33._24_4_ * fVar281;
          auVar88._24_4_ = fVar441;
          auVar88._28_4_ = fStack_9c4;
          auVar35 = vsubps_avx(auVar35,local_240);
          fVar164 = auVar35._0_4_ * fVar164;
          fVar207 = auVar35._4_4_ * fVar207;
          auVar89._4_4_ = fVar207;
          auVar89._0_4_ = fVar164;
          fVar261 = auVar35._8_4_ * fVar261;
          auVar89._8_4_ = fVar261;
          fVar236 = auVar35._12_4_ * fVar236;
          auVar89._12_4_ = fVar236;
          fVar265 = auVar35._16_4_ * fVar265;
          auVar89._16_4_ = fVar265;
          fVar280 = auVar35._20_4_ * fVar280;
          auVar89._20_4_ = fVar280;
          fVar281 = auVar35._24_4_ * fVar281;
          auVar89._24_4_ = fVar281;
          auVar89._28_4_ = fVar436;
          fVar287 = fVar288 * (fVar388 * fVar443 + fVar468);
          fVar301 = fVar302 * (fVar431 * fVar446 + fVar474);
          fVar309 = fVar304 * (fVar353 * fVar454 + fVar476);
          fVar311 = fVar306 * (fVar282 * fVar457 + fVar478);
          fVar364 = fVar308 * (fVar437 * fVar459 + fVar480);
          fVar382 = fVar310 * (fVar439 * fVar461 + fVar482);
          fVar385 = fVar312 * (fVar441 * fVar463 + fVar484);
          auVar258._0_4_ = fVar365 + fVar260 * fVar287;
          auVar258._4_4_ = fVar374 + fVar264 * fVar301;
          auVar258._8_4_ = fVar377 + fVar285 * fVar309;
          auVar258._12_4_ = fVar380 + fVar307 * fVar311;
          auVar258._16_4_ = fVar383 + fVar379 * fVar364;
          auVar258._20_4_ = fVar386 + fVar421 * fVar382;
          auVar258._24_4_ = fVar389 + fVar434 * fVar385;
          auVar258._28_4_ = fVar392 + auVar35._28_4_ + fVar485;
          auVar90._4_4_ = (float)local_ac0._4_4_ * fVar431;
          auVar90._0_4_ = (float)local_ac0._0_4_ * fVar388;
          auVar90._8_4_ = fStack_ab8 * fVar353;
          auVar90._12_4_ = fStack_ab4 * fVar282;
          auVar90._16_4_ = fStack_ab0 * fVar437;
          auVar90._20_4_ = fStack_aac * fVar439;
          auVar90._24_4_ = fStack_aa8 * fVar441;
          auVar90._28_4_ = fVar286;
          _local_aa0 = vsubps_avx(auVar90,auVar258);
          auVar277._0_4_ = fVar366 + fVar287 * fVar259;
          auVar277._4_4_ = fVar375 + fVar301 * fVar262;
          auVar277._8_4_ = fVar378 + fVar309 * fVar283;
          auVar277._12_4_ = fVar381 + fVar311 * fVar303;
          auVar277._16_4_ = fVar384 + fVar364 * fVar373;
          auVar277._20_4_ = fVar387 + fVar382 * fVar404;
          auVar277._24_4_ = fVar390 + fVar385 * fVar430;
          auVar277._28_4_ = fVar393 + fVar286;
          auVar91._4_4_ = fVar431 * (float)local_9e0._4_4_;
          auVar91._0_4_ = fVar388 * (float)local_9e0._0_4_;
          auVar91._8_4_ = fVar353 * fStack_9d8;
          auVar91._12_4_ = fVar282 * fStack_9d4;
          auVar91._16_4_ = fVar437 * fStack_9d0;
          auVar91._20_4_ = fVar439 * fStack_9cc;
          auVar91._24_4_ = fVar441 * fStack_9c8;
          auVar91._28_4_ = fStack_c24;
          auVar35 = vsubps_avx(auVar91,auVar277);
          auVar296._0_4_ = fVar211 + fVar203 * fVar287;
          auVar296._4_4_ = fVar235 + fVar263 * fVar301;
          auVar296._8_4_ = fVar237 + fVar284 * fVar309;
          auVar296._12_4_ = fVar238 + fVar305 * fVar311;
          auVar296._16_4_ = fVar239 + fVar376 * fVar364;
          auVar296._20_4_ = fVar240 + fVar420 * fVar382;
          auVar296._24_4_ = fVar241 + fVar433 * fVar385;
          auVar296._28_4_ = fVar242 + auVar33._28_4_;
          auVar92._4_4_ = (float)local_8e0._4_4_ * fVar431;
          auVar92._0_4_ = (float)local_8e0._0_4_ * fVar388;
          auVar92._8_4_ = fStack_8d8 * fVar353;
          auVar92._12_4_ = fStack_8d4 * fVar282;
          auVar92._16_4_ = fStack_8d0 * fVar437;
          auVar92._20_4_ = fStack_8cc * fVar439;
          auVar92._24_4_ = fStack_8c8 * fVar441;
          auVar92._28_4_ = fStack_c24;
          local_940 = vsubps_avx(auVar92,auVar296);
          fVar288 = fVar288 * (fVar164 * fVar443 + fVar468);
          fVar302 = fVar302 * (fVar207 * fVar446 + fVar474);
          fVar304 = fVar304 * (fVar261 * fVar454 + fVar476);
          fVar306 = fVar306 * (fVar236 * fVar457 + fVar478);
          fVar308 = fVar308 * (fVar265 * fVar459 + fVar480);
          fVar310 = fVar310 * (fVar280 * fVar461 + fVar482);
          fVar312 = fVar312 * (fVar281 * fVar463 + fVar484);
          auVar340._0_4_ = fVar365 + fVar260 * fVar288;
          auVar340._4_4_ = fVar374 + fVar264 * fVar302;
          auVar340._8_4_ = fVar377 + fVar285 * fVar304;
          auVar340._12_4_ = fVar380 + fVar307 * fVar306;
          auVar340._16_4_ = fVar383 + fVar379 * fVar308;
          auVar340._20_4_ = fVar386 + fVar421 * fVar310;
          auVar340._24_4_ = fVar389 + fVar434 * fVar312;
          auVar340._28_4_ = fVar392 + fStack_c24;
          auVar93._4_4_ = (float)local_ac0._4_4_ * fVar207;
          auVar93._0_4_ = (float)local_ac0._0_4_ * fVar164;
          auVar93._8_4_ = fStack_ab8 * fVar261;
          auVar93._12_4_ = fStack_ab4 * fVar236;
          auVar93._16_4_ = fStack_ab0 * fVar265;
          auVar93._20_4_ = fStack_aac * fVar280;
          auVar93._24_4_ = fStack_aa8 * fVar281;
          auVar93._28_4_ = fStack_aa4;
          _local_880 = vsubps_avx(auVar93,auVar340);
          auVar341._0_4_ = fVar366 + fVar288 * fVar259;
          auVar341._4_4_ = fVar375 + fVar302 * fVar262;
          auVar341._8_4_ = fVar378 + fVar304 * fVar283;
          auVar341._12_4_ = fVar381 + fVar306 * fVar303;
          auVar341._16_4_ = fVar384 + fVar308 * fVar373;
          auVar341._20_4_ = fVar387 + fVar310 * fVar404;
          auVar341._24_4_ = fVar390 + fVar312 * fVar430;
          auVar341._28_4_ = fVar393 + local_880._28_4_;
          auVar94._4_4_ = fVar207 * (float)local_9e0._4_4_;
          auVar94._0_4_ = fVar164 * (float)local_9e0._0_4_;
          auVar94._8_4_ = fVar261 * fStack_9d8;
          auVar94._12_4_ = fVar236 * fStack_9d4;
          auVar94._16_4_ = fVar265 * fStack_9d0;
          auVar94._20_4_ = fVar280 * fStack_9cc;
          auVar94._24_4_ = fVar281 * fStack_9c8;
          auVar94._28_4_ = fStack_aa4;
          _local_740 = vsubps_avx(auVar94,auVar341);
          auVar297._0_4_ = fVar211 + fVar203 * fVar288;
          auVar297._4_4_ = fVar235 + fVar263 * fVar302;
          auVar297._8_4_ = fVar237 + fVar284 * fVar304;
          auVar297._12_4_ = fVar238 + fVar305 * fVar306;
          auVar297._16_4_ = fVar239 + fVar376 * fVar308;
          auVar297._20_4_ = fVar240 + fVar420 * fVar310;
          auVar297._24_4_ = fVar241 + fVar433 * fVar312;
          auVar297._28_4_ = fVar242 + local_940._28_4_ + fVar485;
          auVar95._4_4_ = (float)local_8e0._4_4_ * fVar207;
          auVar95._0_4_ = (float)local_8e0._0_4_ * fVar164;
          auVar95._8_4_ = fStack_8d8 * fVar261;
          auVar95._12_4_ = fStack_8d4 * fVar236;
          auVar95._16_4_ = fStack_8d0 * fVar265;
          auVar95._20_4_ = fStack_8cc * fVar280;
          auVar95._24_4_ = fStack_8c8 * fVar281;
          auVar95._28_4_ = local_740._28_4_;
          _local_760 = vsubps_avx(auVar95,auVar297);
          auVar32 = vcmpps_avx(auVar32,auVar372,5);
          auVar228._8_4_ = 0x7f800000;
          auVar228._0_8_ = 0x7f8000007f800000;
          auVar228._12_4_ = 0x7f800000;
          auVar228._16_4_ = 0x7f800000;
          auVar228._20_4_ = 0x7f800000;
          auVar228._24_4_ = 0x7f800000;
          auVar228._28_4_ = 0x7f800000;
          auVar227 = vblendvps_avx(auVar228,auVar88,auVar32);
          auVar360._8_4_ = 0x7fffffff;
          auVar360._0_8_ = 0x7fffffff7fffffff;
          auVar360._12_4_ = 0x7fffffff;
          auVar360._16_4_ = 0x7fffffff;
          auVar360._20_4_ = 0x7fffffff;
          auVar360._24_4_ = 0x7fffffff;
          auVar360._28_4_ = 0x7fffffff;
          auVar372 = vandps_avx(auVar360,auVar66);
          auVar372 = vmaxps_avx(local_4a0,auVar372);
          auVar96._4_4_ = auVar372._4_4_ * 1.9073486e-06;
          auVar96._0_4_ = auVar372._0_4_ * 1.9073486e-06;
          auVar96._8_4_ = auVar372._8_4_ * 1.9073486e-06;
          auVar96._12_4_ = auVar372._12_4_ * 1.9073486e-06;
          auVar96._16_4_ = auVar372._16_4_ * 1.9073486e-06;
          auVar96._20_4_ = auVar372._20_4_ * 1.9073486e-06;
          auVar96._24_4_ = auVar372._24_4_ * 1.9073486e-06;
          auVar96._28_4_ = auVar372._28_4_;
          auVar372 = vandps_avx(auVar360,local_500);
          auVar372 = vcmpps_avx(auVar372,auVar96,1);
          auVar298._8_4_ = 0xff800000;
          auVar298._0_8_ = 0xff800000ff800000;
          auVar298._12_4_ = 0xff800000;
          auVar298._16_4_ = 0xff800000;
          auVar298._20_4_ = 0xff800000;
          auVar298._24_4_ = 0xff800000;
          auVar298._28_4_ = 0xff800000;
          auVar294 = vblendvps_avx(auVar298,auVar89,auVar32);
          auVar33 = auVar32 & auVar372;
          if ((((((((auVar33 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar33 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar33 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar33 >> 0x7f,0) != '\0') ||
                (auVar33 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar33 >> 0xbf,0) != '\0') ||
              (auVar33 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar33[0x1f] < '\0') {
            auVar30 = vandps_avx(auVar372,auVar32);
            auVar179 = vpackssdw_avx(auVar30._0_16_,auVar30._16_16_);
            auVar372 = ZEXT1232(ZEXT412(0)) << 0x20;
            auVar31 = vcmpps_avx(auVar31,auVar372,2);
            auVar472._8_4_ = 0xff800000;
            auVar472._0_8_ = 0xff800000ff800000;
            auVar472._12_4_ = 0xff800000;
            auVar472._16_4_ = 0xff800000;
            auVar472._20_4_ = 0xff800000;
            auVar472._24_4_ = 0xff800000;
            auVar472._28_4_ = 0xff800000;
            auVar487._8_4_ = 0x7f800000;
            auVar487._0_8_ = 0x7f8000007f800000;
            auVar487._12_4_ = 0x7f800000;
            auVar487._16_4_ = 0x7f800000;
            auVar487._20_4_ = 0x7f800000;
            auVar487._24_4_ = 0x7f800000;
            auVar487._28_4_ = 0x7f800000;
            auVar152 = vblendvps_avx(auVar487,auVar472,auVar31);
            auVar248 = vpmovsxwd_avx(auVar179);
            auVar179 = vpunpckhwd_avx(auVar179,auVar179);
            auVar361._16_16_ = auVar179;
            auVar361._0_16_ = auVar248;
            auVar227 = vblendvps_avx(auVar227,auVar152,auVar361);
            auVar152 = vblendvps_avx(auVar472,auVar487,auVar31);
            auVar294 = vblendvps_avx(auVar294,auVar152,auVar361);
            auVar372 = vcmpps_avx(auVar372,ZEXT1232(ZEXT412(0)) << 0x20,0xf);
            auVar200._0_4_ = auVar372._0_4_ ^ auVar30._0_4_;
            auVar200._4_4_ = auVar372._4_4_ ^ auVar30._4_4_;
            auVar200._8_4_ = auVar372._8_4_ ^ auVar30._8_4_;
            auVar200._12_4_ = auVar372._12_4_ ^ auVar30._12_4_;
            auVar200._16_4_ = auVar372._16_4_ ^ auVar30._16_4_;
            auVar200._20_4_ = auVar372._20_4_ ^ auVar30._20_4_;
            auVar200._24_4_ = auVar372._24_4_ ^ auVar30._24_4_;
            auVar200._28_4_ = auVar372._28_4_ ^ auVar30._28_4_;
            auVar30 = vorps_avx(auVar31,auVar200);
            auVar30 = vandps_avx(auVar32,auVar30);
          }
          auVar413 = ZEXT3264(auVar152);
          auVar251 = local_aa0._0_28_;
          auVar275 = auVar35._0_28_;
          auVar362 = ZEXT3264(local_940);
        }
        _local_320 = _local_6c0;
        local_300 = vminps_avx(local_2c0,auVar227);
        auVar31 = vmaxps_avx(_local_6c0,auVar294);
        _local_2e0 = auVar31;
        auVar152 = vcmpps_avx(_local_6c0,local_300,2);
        local_780 = vandps_avx(auVar152,auVar142);
        auVar152 = vcmpps_avx(auVar31,local_2c0,2);
        auVar142 = vandps_avx(auVar152,auVar142);
        auVar152 = vorps_avx(auVar142,local_780);
        if ((((((((auVar152 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar152 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar152 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar152 >> 0x7f,0) == '\0') &&
              (auVar152 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar152 >> 0xbf,0) == '\0') &&
            (auVar152 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar152[0x1f]) goto LAB_01287f2a;
        local_960 = vcmpps_avx(ZEXT1632(ZEXT816(0) << 0x20),ZEXT1632(ZEXT816(0) << 0x20),0xf);
        local_680._0_4_ = auVar30._0_4_ ^ local_960._0_4_;
        local_680._4_4_ = auVar30._4_4_ ^ local_960._4_4_;
        local_680._8_4_ = auVar30._8_4_ ^ local_960._8_4_;
        local_680._12_4_ = auVar30._12_4_ ^ local_960._12_4_;
        local_680._16_4_ = auVar30._16_4_ ^ local_960._16_4_;
        local_680._20_4_ = auVar30._20_4_ ^ local_960._20_4_;
        local_680._24_4_ = auVar30._24_4_ ^ local_960._24_4_;
        local_680._28_4_ = auVar30._28_4_ ^ (uint)local_960._28_4_;
        auVar151._0_4_ =
             (float)local_ac0._0_4_ * auVar251._0_4_ +
             (float)local_9e0._0_4_ * auVar275._0_4_ + (float)local_8e0._0_4_ * auVar362._0_4_;
        auVar151._4_4_ =
             (float)local_ac0._4_4_ * auVar251._4_4_ +
             (float)local_9e0._4_4_ * auVar275._4_4_ + (float)local_8e0._4_4_ * auVar362._4_4_;
        auVar151._8_4_ =
             fStack_ab8 * auVar251._8_4_ + fStack_9d8 * auVar275._8_4_ + fStack_8d8 * auVar362._8_4_
        ;
        auVar151._12_4_ =
             fStack_ab4 * auVar251._12_4_ +
             fStack_9d4 * auVar275._12_4_ + fStack_8d4 * auVar362._12_4_;
        auVar151._16_4_ =
             fStack_ab0 * auVar251._16_4_ +
             fStack_9d0 * auVar275._16_4_ + fStack_8d0 * auVar362._16_4_;
        auVar151._20_4_ =
             fStack_aac * auVar251._20_4_ +
             fStack_9cc * auVar275._20_4_ + fStack_8cc * auVar362._20_4_;
        auVar151._24_4_ =
             fStack_aa8 * auVar251._24_4_ +
             fStack_9c8 * auVar275._24_4_ + fStack_8c8 * auVar362._24_4_;
        auVar151._28_4_ = local_960._28_4_ + fStack_aa4 + local_780._28_4_;
        auVar186._8_4_ = 0x7fffffff;
        auVar186._0_8_ = 0x7fffffff7fffffff;
        auVar186._12_4_ = 0x7fffffff;
        auVar186._16_4_ = 0x7fffffff;
        auVar186._20_4_ = 0x7fffffff;
        auVar186._24_4_ = 0x7fffffff;
        auVar186._28_4_ = 0x7fffffff;
        auVar152 = vandps_avx(auVar151,auVar186);
        auVar187._8_4_ = 0x3e99999a;
        auVar187._0_8_ = 0x3e99999a3e99999a;
        auVar187._12_4_ = 0x3e99999a;
        auVar187._16_4_ = 0x3e99999a;
        auVar187._20_4_ = 0x3e99999a;
        auVar187._24_4_ = 0x3e99999a;
        auVar187._28_4_ = 0x3e99999a;
        auVar152 = vcmpps_avx(auVar152,auVar187,1);
        auVar152 = vorps_avx(auVar152,local_680);
        auVar188._8_4_ = 3;
        auVar188._0_8_ = 0x300000003;
        auVar188._12_4_ = 3;
        auVar188._16_4_ = 3;
        auVar188._20_4_ = 3;
        auVar188._24_4_ = 3;
        auVar188._28_4_ = 3;
        auVar229._8_4_ = 2;
        auVar229._0_8_ = 0x200000002;
        auVar229._12_4_ = 2;
        auVar229._16_4_ = 2;
        auVar229._20_4_ = 2;
        auVar229._24_4_ = 2;
        auVar229._28_4_ = 2;
        auVar152 = vblendvps_avx(auVar229,auVar188,auVar152);
        local_7c0 = ZEXT432((uint)uVar129);
        local_6a0 = vpshufd_avx(ZEXT416((uint)uVar129),0);
        auVar179 = vpcmpgtd_avx(auVar152._16_16_,local_6a0);
        auStack_690 = auVar34._16_16_;
        auVar248 = vpcmpgtd_avx(auVar152._0_16_,local_6a0);
        auVar189._16_16_ = auVar179;
        auVar189._0_16_ = auVar248;
        auVar152 = vblendps_avx(ZEXT1632(auVar248),auVar189,0xf0);
        local_6e0 = vandnps_avx(auVar152,local_780);
        auVar279 = ZEXT3264(local_6e0);
        auVar30 = local_780 & ~auVar152;
        auStack_718 = auVar185._8_24_;
        local_720 = uVar129;
        local_7a0 = auVar152;
        if ((((((((auVar30 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar30 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar30 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar30 >> 0x7f,0) == '\0') &&
              (auVar30 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar30 >> 0xbf,0) == '\0') &&
            (auVar30 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar30[0x1f]) {
          auVar403 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
          fVar203 = (float)local_9e0._0_4_;
          fVar260 = (float)local_9e0._4_4_;
          fVar236 = fStack_9d8;
          fVar262 = fStack_9d4;
          fVar263 = fStack_9d0;
          fVar264 = fStack_9cc;
          fVar265 = fStack_9c8;
          fVar301 = (float)local_ac0._0_4_;
          fVar303 = (float)local_ac0._4_4_;
          fVar305 = fStack_ab8;
          fVar307 = fStack_ab4;
          fVar309 = fStack_ab0;
          fVar311 = fStack_aac;
          fVar364 = fStack_aa8;
          fVar280 = (float)local_8e0._0_4_;
          fVar281 = (float)local_8e0._4_4_;
          fVar283 = fStack_8d8;
          fVar284 = fStack_8d4;
          fVar285 = fStack_8d0;
          fVar286 = fStack_8cc;
          fVar287 = fStack_8c8;
        }
        else {
          local_860._4_4_ = (float)local_6c0._4_4_ + (float)local_9a0._4_4_;
          local_860._0_4_ = (float)local_6c0._0_4_ + (float)local_9a0._0_4_;
          fStack_858 = fStack_6b8 + fStack_998;
          fStack_854 = fStack_6b4 + fStack_994;
          fStack_850 = fStack_6b0 + fStack_990;
          fStack_84c = fStack_6ac + fStack_98c;
          fStack_848 = fStack_6a8 + fStack_988;
          fStack_844 = fStack_6a4 + fStack_984;
          auVar403 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
          local_700 = auVar142;
          do {
            auVar267 = auVar403._0_16_;
            auVar190._8_4_ = 0x7f800000;
            auVar190._0_8_ = 0x7f8000007f800000;
            auVar190._12_4_ = 0x7f800000;
            auVar190._16_4_ = 0x7f800000;
            auVar190._20_4_ = 0x7f800000;
            auVar190._24_4_ = 0x7f800000;
            auVar190._28_4_ = 0x7f800000;
            auVar152 = auVar279._0_32_;
            auVar30 = vblendvps_avx(auVar190,_local_6c0,auVar152);
            auVar372 = vshufps_avx(auVar30,auVar30,0xb1);
            auVar372 = vminps_avx(auVar30,auVar372);
            auVar32 = vshufpd_avx(auVar372,auVar372,5);
            auVar372 = vminps_avx(auVar372,auVar32);
            auVar32 = vperm2f128_avx(auVar372,auVar372,1);
            auVar372 = vminps_avx(auVar372,auVar32);
            auVar30 = vcmpps_avx(auVar30,auVar372,0);
            auVar372 = auVar152 & auVar30;
            if ((((((((auVar372 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar372 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar372 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar372 >> 0x7f,0) != '\0') ||
                  (auVar372 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar372 >> 0xbf,0) != '\0') ||
                (auVar372 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar372[0x1f] < '\0') {
              auVar152 = vandps_avx(auVar30,auVar152);
            }
            local_820._0_8_ = uVar123;
            uVar121 = vmovmskps_avx(auVar152);
            uVar124 = 0;
            if (uVar121 != 0) {
              for (; (uVar121 >> uVar124 & 1) == 0; uVar124 = uVar124 + 1) {
              }
            }
            uVar129 = (ulong)uVar124;
            *(undefined4 *)(local_6e0 + uVar129 * 4) = 0;
            fVar164 = local_640[uVar129];
            uVar124 = *(uint *)(local_320 + uVar129 * 4);
            fVar259 = auVar169._0_4_;
            if ((float)local_980._0_4_ < 0.0) {
              fVar259 = sqrtf((float)local_980._0_4_);
              auVar267._8_4_ = 0x7fffffff;
              auVar267._0_8_ = 0x7fffffff7fffffff;
              auVar267._12_4_ = 0x7fffffff;
            }
            auVar279 = ZEXT464(uVar124);
            auVar413 = ZEXT464((uint)fVar164);
            auVar248 = vminps_avx(_local_ad0,_local_af0);
            auVar179 = vmaxps_avx(_local_ad0,_local_af0);
            auVar138 = vminps_avx(_local_ae0,_local_b00);
            auVar174 = vminps_avx(auVar248,auVar138);
            auVar248 = vmaxps_avx(_local_ae0,_local_b00);
            auVar138 = vmaxps_avx(auVar179,auVar248);
            auVar179 = vandps_avx(auVar174,auVar267);
            auVar248 = vandps_avx(auVar138,auVar267);
            auVar179 = vmaxps_avx(auVar179,auVar248);
            auVar248 = vmovshdup_avx(auVar179);
            auVar248 = vmaxss_avx(auVar248,auVar179);
            auVar179 = vshufpd_avx(auVar179,auVar179,1);
            auVar179 = vmaxss_avx(auVar179,auVar248);
            fVar164 = auVar179._0_4_ * 1.9073486e-06;
            local_7e0._0_4_ = fVar259 * 1.9073486e-06;
            _local_800 = vshufps_avx(auVar138,auVar138,0xff);
            lVar125 = 5;
            do {
              auVar179 = vshufps_avx(auVar279._0_16_,auVar279._0_16_,0);
              auVar133._0_4_ = auVar179._0_4_ * (float)local_970._0_4_ + 0.0;
              auVar133._4_4_ = auVar179._4_4_ * (float)local_970._4_4_ + 0.0;
              auVar133._8_4_ = auVar179._8_4_ * fStack_968 + 0.0;
              auVar133._12_4_ = auVar179._12_4_ * fStack_964 + 0.0;
              fVar207 = auVar413._0_4_;
              fVar260 = 1.0 - fVar207;
              fVar203 = fVar207 * 3.0;
              fVar259 = fVar203 + -5.0;
              auVar179 = ZEXT416((uint)(fVar207 * fVar207 * -fVar260 * 0.5));
              auVar179 = vshufps_avx(auVar179,auVar179,0);
              auVar248 = ZEXT416((uint)((fVar260 * fVar260 * (fVar260 * 3.0 + -5.0) + 2.0) * 0.5));
              auVar248 = vshufps_avx(auVar248,auVar248,0);
              auVar138 = ZEXT416((uint)((fVar207 * fVar207 * fVar259 + 2.0) * 0.5));
              auVar138 = vshufps_avx(auVar138,auVar138,0);
              auVar174 = ZEXT416((uint)(fVar260 * fVar260 * -fVar207 * 0.5));
              auVar174 = vshufps_avx(auVar174,auVar174,0);
              auVar214._0_4_ =
                   auVar174._0_4_ * (float)local_ad0._0_4_ +
                   auVar138._0_4_ * (float)local_af0._0_4_ +
                   auVar248._0_4_ * (float)local_ae0._0_4_ + auVar179._0_4_ * (float)local_b00._0_4_
              ;
              auVar214._4_4_ =
                   auVar174._4_4_ * (float)local_ad0._4_4_ +
                   auVar138._4_4_ * (float)local_af0._4_4_ +
                   auVar248._4_4_ * (float)local_ae0._4_4_ + auVar179._4_4_ * (float)local_b00._4_4_
              ;
              auVar214._8_4_ =
                   auVar174._8_4_ * fStack_ac8 +
                   auVar138._8_4_ * fStack_ae8 +
                   auVar248._8_4_ * fStack_ad8 + auVar179._8_4_ * fStack_af8;
              auVar214._12_4_ =
                   auVar174._12_4_ * fStack_ac4 +
                   auVar138._12_4_ * fStack_ae4 +
                   auVar248._12_4_ * fStack_ad4 + auVar179._12_4_ * fStack_af4;
              local_940._0_16_ = auVar214;
              auVar179 = vsubps_avx(auVar133,auVar214);
              _local_aa0 = auVar179;
              auVar179 = vdpps_avx(auVar179,auVar179,0x7f);
              fVar261 = auVar179._0_4_;
              local_cc0 = auVar279._0_4_;
              if (fVar261 < 0.0) {
                local_a60._0_16_ = ZEXT416((uint)fVar260);
                local_a80._0_4_ = fVar203;
                local_9c0._0_4_ = fVar207 * 9.0;
                local_900._0_4_ = fVar259;
                local_920._0_4_ = fVar260 * -2.0;
                fVar236 = sqrtf(fVar261);
                fVar259 = (float)local_900._0_4_;
                fVar264 = (float)local_9c0._0_4_;
                fVar262 = (float)local_920._0_4_;
                fVar263 = (float)local_a80._0_4_;
                fVar265 = (float)local_a60._0_4_;
              }
              else {
                auVar248 = vsqrtss_avx(auVar179,auVar179);
                fVar236 = auVar248._0_4_;
                fVar264 = fVar207 * 9.0;
                fVar262 = fVar260 * -2.0;
                fVar263 = fVar203;
                fVar265 = fVar260;
              }
              auVar248 = ZEXT416((uint)((fVar207 * fVar207 + fVar207 * fVar262) * 0.5));
              auVar248 = vshufps_avx(auVar248,auVar248,0);
              auVar138 = ZEXT416((uint)(((fVar265 + fVar265) * (fVar263 + 2.0) +
                                        fVar265 * fVar265 * -3.0) * 0.5));
              auVar138 = vshufps_avx(auVar138,auVar138,0);
              auVar174 = ZEXT416((uint)((fVar259 * (fVar207 + fVar207) + fVar207 * fVar263) * 0.5));
              auVar174 = vshufps_avx(auVar174,auVar174,0);
              auVar175 = ZEXT416((uint)((fVar207 * (fVar265 + fVar265) - fVar260 * fVar260) * 0.5));
              auVar175 = vshufps_avx(auVar175,auVar175,0);
              auVar394._0_4_ =
                   (float)local_ad0._0_4_ * auVar175._0_4_ +
                   (float)local_af0._0_4_ * auVar174._0_4_ +
                   (float)local_b00._0_4_ * auVar248._0_4_ + (float)local_ae0._0_4_ * auVar138._0_4_
              ;
              auVar394._4_4_ =
                   (float)local_ad0._4_4_ * auVar175._4_4_ +
                   (float)local_af0._4_4_ * auVar174._4_4_ +
                   (float)local_b00._4_4_ * auVar248._4_4_ + (float)local_ae0._4_4_ * auVar138._4_4_
              ;
              auVar394._8_4_ =
                   fStack_ac8 * auVar175._8_4_ +
                   fStack_ae8 * auVar174._8_4_ +
                   fStack_af8 * auVar248._8_4_ + fStack_ad8 * auVar138._8_4_;
              auVar394._12_4_ =
                   fStack_ac4 * auVar175._12_4_ +
                   fStack_ae4 * auVar174._12_4_ +
                   fStack_af4 * auVar248._12_4_ + fStack_ad4 * auVar138._12_4_;
              auVar175 = vpermilps_avx(ZEXT416((uint)(fVar203 + -1.0)),0);
              auVar178 = vpermilps_avx(ZEXT416((uint)(fVar207 * -9.0 + 4.0)),0);
              auVar248 = vshufps_avx(ZEXT416((uint)(fVar264 + -5.0)),ZEXT416((uint)(fVar264 + -5.0))
                                     ,0);
              auVar138 = ZEXT416((uint)(fVar207 * -3.0 + 2.0));
              auVar174 = vshufps_avx(auVar138,auVar138,0);
              auVar138 = vdpps_avx(auVar394,auVar394,0x7f);
              auVar170._0_4_ =
                   (float)local_ad0._0_4_ * auVar174._0_4_ +
                   (float)local_af0._0_4_ * auVar248._0_4_ +
                   (float)local_ae0._0_4_ * auVar178._0_4_ + (float)local_b00._0_4_ * auVar175._0_4_
              ;
              auVar170._4_4_ =
                   (float)local_ad0._4_4_ * auVar174._4_4_ +
                   (float)local_af0._4_4_ * auVar248._4_4_ +
                   (float)local_ae0._4_4_ * auVar178._4_4_ + (float)local_b00._4_4_ * auVar175._4_4_
              ;
              auVar170._8_4_ =
                   fStack_ac8 * auVar174._8_4_ +
                   fStack_ae8 * auVar248._8_4_ +
                   fStack_ad8 * auVar178._8_4_ + fStack_af8 * auVar175._8_4_;
              auVar170._12_4_ =
                   fStack_ac4 * auVar174._12_4_ +
                   fStack_ae4 * auVar248._12_4_ +
                   fStack_ad4 * auVar178._12_4_ + fStack_af4 * auVar175._12_4_;
              auVar248 = vblendps_avx(auVar138,_DAT_01feba10,0xe);
              auVar174 = vrsqrtss_avx(auVar248,auVar248);
              fVar203 = auVar174._0_4_;
              fVar259 = auVar138._0_4_;
              auVar174 = vdpps_avx(auVar394,auVar170,0x7f);
              auVar175 = vshufps_avx(auVar138,auVar138,0);
              auVar171._0_4_ = auVar170._0_4_ * auVar175._0_4_;
              auVar171._4_4_ = auVar170._4_4_ * auVar175._4_4_;
              auVar171._8_4_ = auVar170._8_4_ * auVar175._8_4_;
              auVar171._12_4_ = auVar170._12_4_ * auVar175._12_4_;
              auVar174 = vshufps_avx(auVar174,auVar174,0);
              auVar268._0_4_ = auVar394._0_4_ * auVar174._0_4_;
              auVar268._4_4_ = auVar394._4_4_ * auVar174._4_4_;
              auVar268._8_4_ = auVar394._8_4_ * auVar174._8_4_;
              auVar268._12_4_ = auVar394._12_4_ * auVar174._12_4_;
              auVar178 = vsubps_avx(auVar171,auVar268);
              auVar174 = vrcpss_avx(auVar248,auVar248);
              auVar248 = vmaxss_avx(ZEXT416((uint)fVar164),
                                    ZEXT416((uint)(local_cc0 * (float)local_7e0._0_4_)));
              auVar362 = ZEXT1664(auVar248);
              auVar174 = ZEXT416((uint)(auVar174._0_4_ * (2.0 - fVar259 * auVar174._0_4_)));
              auVar174 = vshufps_avx(auVar174,auVar174,0);
              uVar129 = CONCAT44(auVar394._4_4_,auVar394._0_4_);
              auVar330._0_8_ = uVar129 ^ 0x8000000080000000;
              auVar330._8_4_ = -auVar394._8_4_;
              auVar330._12_4_ = -auVar394._12_4_;
              auVar175 = ZEXT416((uint)(fVar203 * 1.5 + fVar259 * -0.5 * fVar203 * fVar203 * fVar203
                                       ));
              auVar175 = vshufps_avx(auVar175,auVar175,0);
              auVar246._0_4_ = auVar175._0_4_ * auVar178._0_4_ * auVar174._0_4_;
              auVar246._4_4_ = auVar175._4_4_ * auVar178._4_4_ * auVar174._4_4_;
              auVar246._8_4_ = auVar175._8_4_ * auVar178._8_4_ * auVar174._8_4_;
              auVar246._12_4_ = auVar175._12_4_ * auVar178._12_4_ * auVar174._12_4_;
              auVar316._0_4_ = auVar394._0_4_ * auVar175._0_4_;
              auVar316._4_4_ = auVar394._4_4_ * auVar175._4_4_;
              auVar316._8_4_ = auVar394._8_4_ * auVar175._8_4_;
              auVar316._12_4_ = auVar394._12_4_ * auVar175._12_4_;
              if (fVar259 < 0.0) {
                local_a60._0_16_ = auVar316;
                local_a80._0_16_ = auVar246;
                fVar259 = sqrtf(fVar259);
                auVar362 = ZEXT464(auVar248._0_4_);
                auVar246 = local_a80._0_16_;
                auVar316 = local_a60._0_16_;
              }
              else {
                auVar138 = vsqrtss_avx(auVar138,auVar138);
                fVar259 = auVar138._0_4_;
              }
              auVar138 = vdpps_avx(_local_aa0,auVar316,0x7f);
              fVar259 = (fVar164 / fVar259) * (fVar236 + 1.0) + auVar362._0_4_ + fVar236 * fVar164;
              auVar174 = vdpps_avx(auVar330,auVar316,0x7f);
              auVar175 = vdpps_avx(_local_aa0,auVar246,0x7f);
              auVar178 = vdpps_avx(_local_970,auVar316,0x7f);
              auVar9 = vdpps_avx(_local_aa0,auVar330,0x7f);
              fVar203 = auVar174._0_4_ + auVar175._0_4_;
              fVar260 = auVar138._0_4_;
              auVar134._0_4_ = fVar260 * fVar260;
              auVar134._4_4_ = auVar138._4_4_ * auVar138._4_4_;
              auVar134._8_4_ = auVar138._8_4_ * auVar138._8_4_;
              auVar134._12_4_ = auVar138._12_4_ * auVar138._12_4_;
              auVar175 = vsubps_avx(auVar179,auVar134);
              auVar174 = vdpps_avx(_local_aa0,_local_970,0x7f);
              fVar236 = auVar9._0_4_ - fVar260 * fVar203;
              fVar262 = auVar174._0_4_ - fVar260 * auVar178._0_4_;
              auVar174 = vrsqrtss_avx(auVar175,auVar175);
              fVar263 = auVar175._0_4_;
              fVar260 = auVar174._0_4_;
              fVar260 = fVar260 * 1.5 + fVar263 * -0.5 * fVar260 * fVar260 * fVar260;
              if (fVar263 < 0.0) {
                local_a60._0_16_ = auVar138;
                local_a80._0_16_ = auVar178;
                local_9c0._0_4_ = fVar236;
                local_900._0_4_ = fVar262;
                local_920._0_4_ = fVar260;
                fVar263 = sqrtf(fVar263);
                auVar362 = ZEXT464(auVar248._0_4_);
                fVar260 = (float)local_920._0_4_;
                fVar236 = (float)local_9c0._0_4_;
                auVar178 = local_a80._0_16_;
                auVar138 = local_a60._0_16_;
                fVar262 = (float)local_900._0_4_;
              }
              else {
                auVar248 = vsqrtss_avx(auVar175,auVar175);
                fVar263 = auVar248._0_4_;
              }
              auVar175 = vpermilps_avx(local_940._0_16_,0xff);
              auVar9 = vpermilps_avx(auVar394,0xff);
              fVar236 = fVar236 * fVar260 - auVar9._0_4_;
              auVar269._0_8_ = auVar178._0_8_ ^ 0x8000000080000000;
              auVar269._8_4_ = auVar178._8_4_ ^ 0x80000000;
              auVar269._12_4_ = auVar178._12_4_ ^ 0x80000000;
              auVar290._0_4_ = -fVar236;
              auVar290._4_4_ = 0x80000000;
              auVar290._8_4_ = 0x80000000;
              auVar290._12_4_ = 0x80000000;
              auVar248 = vinsertps_avx(ZEXT416((uint)(fVar262 * fVar260)),auVar269,0x10);
              auVar174 = vmovsldup_avx(ZEXT416((uint)(fVar203 * fVar262 * fVar260 -
                                                     auVar178._0_4_ * fVar236)));
              auVar248 = vdivps_avx(auVar248,auVar174);
              auVar178 = ZEXT416((uint)(fVar263 - auVar175._0_4_));
              auVar175 = vinsertps_avx(auVar138,auVar178,0x10);
              auVar247._0_4_ = auVar175._0_4_ * auVar248._0_4_;
              auVar247._4_4_ = auVar175._4_4_ * auVar248._4_4_;
              auVar247._8_4_ = auVar175._8_4_ * auVar248._8_4_;
              auVar247._12_4_ = auVar175._12_4_ * auVar248._12_4_;
              auVar248 = vinsertps_avx(auVar290,ZEXT416((uint)fVar203),0x1c);
              auVar248 = vdivps_avx(auVar248,auVar174);
              auVar174 = vhaddps_avx(auVar247,auVar247);
              auVar215._0_4_ = auVar175._0_4_ * auVar248._0_4_;
              auVar215._4_4_ = auVar175._4_4_ * auVar248._4_4_;
              auVar215._8_4_ = auVar175._8_4_ * auVar248._8_4_;
              auVar215._12_4_ = auVar175._12_4_ * auVar248._12_4_;
              auVar248 = vhaddps_avx(auVar215,auVar215);
              fVar207 = fVar207 - auVar174._0_4_;
              local_cc0 = local_cc0 - auVar248._0_4_;
              auVar270._8_4_ = 0x7fffffff;
              auVar270._0_8_ = 0x7fffffff7fffffff;
              auVar270._12_4_ = 0x7fffffff;
              auVar403 = ZEXT1664(auVar270);
              auVar248 = vandps_avx(auVar138,auVar270);
              bVar83 = true;
              fVar203 = (float)local_9e0._0_4_;
              fVar260 = (float)local_9e0._4_4_;
              fVar236 = fStack_9d8;
              fVar262 = fStack_9d4;
              fVar263 = fStack_9d0;
              fVar264 = fStack_9cc;
              fVar265 = fStack_9c8;
              fVar301 = (float)local_ac0._0_4_;
              fVar303 = (float)local_ac0._4_4_;
              fVar305 = fStack_ab8;
              fVar307 = fStack_ab4;
              fVar309 = fStack_ab0;
              fVar311 = fStack_aac;
              fVar364 = fStack_aa8;
              fVar280 = (float)local_8e0._0_4_;
              fVar281 = (float)local_8e0._4_4_;
              fVar283 = fStack_8d8;
              fVar284 = fStack_8d4;
              fVar285 = fStack_8d0;
              fVar286 = fStack_8cc;
              fVar287 = fStack_8c8;
              if (fVar259 <= auVar248._0_4_) {
LAB_01288f93:
                auVar279 = ZEXT464((uint)local_cc0);
              }
              else {
                auVar248 = vandps_avx(auVar178,auVar270);
                if ((float)local_800._0_4_ * 1.9073486e-06 + auVar362._0_4_ + fVar259 <=
                    auVar248._0_4_) goto LAB_01288f93;
                local_cc0 = local_cc0 + (float)local_8b0._0_4_;
                if (local_cc0 < fVar243) {
                  bVar83 = false;
                  unaff_R13B = 0;
                  goto LAB_01288f93;
                }
                fVar259 = *(float *)(ray + k * 4 + 0x100);
                auVar362 = ZEXT464((uint)fVar259);
                if (((fVar259 < local_cc0) || (fVar207 < 0.0)) || (1.0 < fVar207)) {
                  bVar83 = false;
                  unaff_R13B = 0;
                  auVar279 = ZEXT1664(ZEXT416((uint)local_cc0));
                }
                else {
                  auVar179 = vrsqrtss_avx(auVar179,auVar179);
                  fVar373 = auVar179._0_4_;
                  pGVar25 = (context->scene->geometries).items[local_a18].ptr;
                  auVar279 = ZEXT1664(ZEXT416((uint)local_cc0));
                  if ((pGVar25->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                    unaff_R13B = 0;
                  }
                  else {
                    if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                       (pGVar25->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                      auVar179 = ZEXT416((uint)(fVar373 * 1.5 +
                                               fVar261 * -0.5 * fVar373 * fVar373 * fVar373));
                      auVar179 = vshufps_avx(auVar179,auVar179,0);
                      auVar172._0_4_ = auVar179._0_4_ * (float)local_aa0._0_4_;
                      auVar172._4_4_ = auVar179._4_4_ * (float)local_aa0._4_4_;
                      auVar172._8_4_ = auVar179._8_4_ * fStack_a98;
                      auVar172._12_4_ = auVar179._12_4_ * fStack_a94;
                      auVar135._0_4_ = auVar394._0_4_ + auVar9._0_4_ * auVar172._0_4_;
                      auVar135._4_4_ = auVar394._4_4_ + auVar9._4_4_ * auVar172._4_4_;
                      auVar135._8_4_ = auVar394._8_4_ + auVar9._8_4_ * auVar172._8_4_;
                      auVar135._12_4_ = auVar394._12_4_ + auVar9._12_4_ * auVar172._12_4_;
                      auVar179 = vshufps_avx(auVar172,auVar172,0xc9);
                      auVar248 = vshufps_avx(auVar394,auVar394,0xc9);
                      auVar173._0_4_ = auVar248._0_4_ * auVar172._0_4_;
                      auVar173._4_4_ = auVar248._4_4_ * auVar172._4_4_;
                      auVar173._8_4_ = auVar248._8_4_ * auVar172._8_4_;
                      auVar173._12_4_ = auVar248._12_4_ * auVar172._12_4_;
                      auVar216._0_4_ = auVar394._0_4_ * auVar179._0_4_;
                      auVar216._4_4_ = auVar394._4_4_ * auVar179._4_4_;
                      auVar216._8_4_ = auVar394._8_4_ * auVar179._8_4_;
                      auVar216._12_4_ = auVar394._12_4_ * auVar179._12_4_;
                      auVar138 = vsubps_avx(auVar216,auVar173);
                      auVar179 = vshufps_avx(auVar138,auVar138,0xc9);
                      auVar248 = vshufps_avx(auVar135,auVar135,0xc9);
                      auVar217._0_4_ = auVar248._0_4_ * auVar179._0_4_;
                      auVar217._4_4_ = auVar248._4_4_ * auVar179._4_4_;
                      auVar217._8_4_ = auVar248._8_4_ * auVar179._8_4_;
                      auVar217._12_4_ = auVar248._12_4_ * auVar179._12_4_;
                      auVar179 = vshufps_avx(auVar138,auVar138,0xd2);
                      auVar136._0_4_ = auVar135._0_4_ * auVar179._0_4_;
                      auVar136._4_4_ = auVar135._4_4_ * auVar179._4_4_;
                      auVar136._8_4_ = auVar135._8_4_ * auVar179._8_4_;
                      auVar136._12_4_ = auVar135._12_4_ * auVar179._12_4_;
                      auVar179 = vsubps_avx(auVar217,auVar136);
                      pRVar28 = context->user;
                      local_5b0 = vshufps_avx(ZEXT416((uint)fVar207),ZEXT416((uint)fVar207),0);
                      auStack_610 = vshufps_avx(auVar179,auVar179,0x55);
                      local_5f0 = vshufps_avx(auVar179,auVar179,0xaa);
                      local_5d0 = vshufps_avx(auVar179,auVar179,0);
                      local_620 = (RTCHitN  [16])auStack_610;
                      local_600 = local_5f0;
                      local_5e0 = local_5d0;
                      local_5c0 = local_5b0;
                      local_5a0 = ZEXT832(0) << 0x20;
                      local_580 = local_4e0._0_8_;
                      uStack_578 = local_4e0._8_8_;
                      uStack_570 = local_4e0._16_8_;
                      uStack_568 = local_4e0._24_8_;
                      local_560 = local_4c0._0_8_;
                      uStack_558 = local_4c0._8_8_;
                      uStack_550 = local_4c0._16_8_;
                      uStack_548 = local_4c0._24_8_;
                      local_a20[1] = local_960;
                      *local_a20 = local_960;
                      local_540 = pRVar28->instID[0];
                      uStack_53c = local_540;
                      uStack_538 = local_540;
                      uStack_534 = local_540;
                      uStack_530 = local_540;
                      uStack_52c = local_540;
                      uStack_528 = local_540;
                      uStack_524 = local_540;
                      local_520 = pRVar28->instPrimID[0];
                      uStack_51c = local_520;
                      uStack_518 = local_520;
                      uStack_514 = local_520;
                      uStack_510 = local_520;
                      uStack_50c = local_520;
                      uStack_508 = local_520;
                      uStack_504 = local_520;
                      *(float *)(ray + k * 4 + 0x100) = local_cc0;
                      local_b20 = *local_a28;
                      uStack_b18 = local_a28[1];
                      local_b10 = *local_a30;
                      uStack_b08 = local_a30[1];
                      local_a10.valid = (int *)&local_b20;
                      local_a10.geometryUserPtr = pGVar25->userPtr;
                      local_a10.context = context->user;
                      local_a10.hit = local_620;
                      local_a10.N = 8;
                      local_a10.ray = (RTCRayN *)ray;
                      if (pGVar25->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                        (*pGVar25->occlusionFilterN)(&local_a10);
                        auVar279 = ZEXT464((uint)local_cc0);
                        auVar403 = ZEXT1664(CONCAT412(0x7fffffff,
                                                      CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                        fVar203 = (float)local_9e0._0_4_;
                        fVar260 = (float)local_9e0._4_4_;
                        fVar236 = fStack_9d8;
                        fVar262 = fStack_9d4;
                        fVar263 = fStack_9d0;
                        fVar264 = fStack_9cc;
                        fVar265 = fStack_9c8;
                        fVar280 = (float)local_8e0._0_4_;
                        fVar281 = (float)local_8e0._4_4_;
                        fVar283 = fStack_8d8;
                        fVar284 = fStack_8d4;
                        fVar285 = fStack_8d0;
                        fVar286 = fStack_8cc;
                        fVar287 = fStack_8c8;
                      }
                      auVar110._8_8_ = uStack_b18;
                      auVar110._0_8_ = local_b20;
                      auVar179 = vpcmpeqd_avx((undefined1  [16])0x0,auVar110);
                      auVar114._8_8_ = uStack_b08;
                      auVar114._0_8_ = local_b10;
                      auVar248 = vpcmpeqd_avx((undefined1  [16])0x0,auVar114);
                      auVar153._16_16_ = auVar248;
                      auVar153._0_16_ = auVar179;
                      auVar152 = local_960 & ~auVar153;
                      fVar301 = (float)local_ac0._0_4_;
                      fVar303 = (float)local_ac0._4_4_;
                      fVar305 = fStack_ab8;
                      fVar307 = fStack_ab4;
                      fVar309 = fStack_ab0;
                      fVar311 = fStack_aac;
                      fVar364 = fStack_aa8;
                      if ((((((((auVar152 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               && (auVar152 >> 0x3f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0) &&
                              (auVar152 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                             && SUB321(auVar152 >> 0x7f,0) == '\0') &&
                            (auVar152 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                           SUB321(auVar152 >> 0xbf,0) == '\0') &&
                          (auVar152 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                          -1 < auVar152[0x1f]) {
                        auVar154._0_4_ = auVar179._0_4_ ^ local_960._0_4_;
                        auVar154._4_4_ = auVar179._4_4_ ^ local_960._4_4_;
                        auVar154._8_4_ = auVar179._8_4_ ^ local_960._8_4_;
                        auVar154._12_4_ = auVar179._12_4_ ^ local_960._12_4_;
                        auVar154._16_4_ = auVar248._0_4_ ^ local_960._16_4_;
                        auVar154._20_4_ = auVar248._4_4_ ^ local_960._20_4_;
                        auVar154._24_4_ = auVar248._8_4_ ^ local_960._24_4_;
                        auVar154._28_4_ = auVar248._12_4_ ^ local_960._28_4_;
                      }
                      else {
                        p_Var29 = context->args->filter;
                        if ((p_Var29 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar25->field_8).field_0x2 & 0x40) != 0)))) {
                          (*p_Var29)(&local_a10);
                          auVar279 = ZEXT1664(auVar279._0_16_);
                          auVar403 = ZEXT1664(CONCAT412(0x7fffffff,
                                                        CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                          fVar203 = (float)local_9e0._0_4_;
                          fVar260 = (float)local_9e0._4_4_;
                          fVar236 = fStack_9d8;
                          fVar262 = fStack_9d4;
                          fVar263 = fStack_9d0;
                          fVar264 = fStack_9cc;
                          fVar265 = fStack_9c8;
                          fVar301 = (float)local_ac0._0_4_;
                          fVar303 = (float)local_ac0._4_4_;
                          fVar305 = fStack_ab8;
                          fVar307 = fStack_ab4;
                          fVar309 = fStack_ab0;
                          fVar311 = fStack_aac;
                          fVar364 = fStack_aa8;
                          fVar280 = (float)local_8e0._0_4_;
                          fVar281 = (float)local_8e0._4_4_;
                          fVar283 = fStack_8d8;
                          fVar284 = fStack_8d4;
                          fVar285 = fStack_8d0;
                          fVar286 = fStack_8cc;
                          fVar287 = fStack_8c8;
                        }
                        auVar111._8_8_ = uStack_b18;
                        auVar111._0_8_ = local_b20;
                        auVar179 = vpcmpeqd_avx((undefined1  [16])0x0,auVar111);
                        auVar115._8_8_ = uStack_b08;
                        auVar115._0_8_ = local_b10;
                        auVar248 = vpcmpeqd_avx((undefined1  [16])0x0,auVar115);
                        auVar191._16_16_ = auVar248;
                        auVar191._0_16_ = auVar179;
                        auVar154._0_4_ = auVar179._0_4_ ^ local_960._0_4_;
                        auVar154._4_4_ = auVar179._4_4_ ^ local_960._4_4_;
                        auVar154._8_4_ = auVar179._8_4_ ^ local_960._8_4_;
                        auVar154._12_4_ = auVar179._12_4_ ^ local_960._12_4_;
                        auVar154._16_4_ = auVar248._0_4_ ^ local_960._16_4_;
                        auVar154._20_4_ = auVar248._4_4_ ^ local_960._20_4_;
                        auVar154._24_4_ = auVar248._8_4_ ^ local_960._24_4_;
                        auVar154._28_4_ = auVar248._12_4_ ^ local_960._28_4_;
                        auVar230._8_4_ = 0xff800000;
                        auVar230._0_8_ = 0xff800000ff800000;
                        auVar230._12_4_ = 0xff800000;
                        auVar230._16_4_ = 0xff800000;
                        auVar230._20_4_ = 0xff800000;
                        auVar230._24_4_ = 0xff800000;
                        auVar230._28_4_ = 0xff800000;
                        auVar152 = vblendvps_avx(auVar230,*(undefined1 (*) [32])
                                                           (local_a10.ray + 0x100),auVar191);
                        *(undefined1 (*) [32])(local_a10.ray + 0x100) = auVar152;
                      }
                      auVar362 = ZEXT464((uint)fVar259);
                      bVar103 = (auVar154 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                      bVar104 = (auVar154 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                      bVar102 = (auVar154 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                      bVar101 = SUB321(auVar154 >> 0x7f,0) != '\0';
                      bVar100 = (auVar154 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0;
                      bVar99 = SUB321(auVar154 >> 0xbf,0) != '\0';
                      bVar97 = (auVar154 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0;
                      bVar83 = auVar154[0x1f] < '\0';
                      unaff_R13B = ((((((bVar103 || bVar104) || bVar102) || bVar101) || bVar100) ||
                                    bVar99) || bVar97) || bVar83;
                      if (((((((!bVar103 && !bVar104) && !bVar102) && !bVar101) && !bVar100) &&
                           !bVar99) && !bVar97) && !bVar83) {
                        *(float *)(ray + k * 4 + 0x100) = fVar259;
                      }
                      bVar83 = false;
                      goto LAB_01288fa1;
                    }
                    unaff_R13B = 1;
                  }
                  bVar83 = false;
                }
              }
LAB_01288fa1:
              auVar413 = ZEXT464((uint)fVar207);
              if (!bVar83) goto LAB_01289402;
              lVar125 = lVar125 + -1;
            } while (lVar125 != 0);
            unaff_R13B = 0;
            fVar301 = (float)local_ac0._0_4_;
            fVar303 = (float)local_ac0._4_4_;
            fVar305 = fStack_ab8;
            fVar307 = fStack_ab4;
            fVar309 = fStack_ab0;
            fVar311 = fStack_aac;
            fVar364 = fStack_aa8;
LAB_01289402:
            unaff_R13B = unaff_R13B & 1;
            uVar123 = CONCAT71(local_820._1_7_,local_820[0] | unaff_R13B);
            uVar7 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar155._4_4_ = uVar7;
            auVar155._0_4_ = uVar7;
            auVar155._8_4_ = uVar7;
            auVar155._12_4_ = uVar7;
            auVar155._16_4_ = uVar7;
            auVar155._20_4_ = uVar7;
            auVar155._24_4_ = uVar7;
            auVar155._28_4_ = uVar7;
            auVar152 = vcmpps_avx(_local_860,auVar155,2);
            auVar30 = vandps_avx(auVar152,local_6e0);
            auVar279 = ZEXT3264(auVar30);
            auVar372 = local_6e0 & auVar152;
            uVar129 = local_720;
            local_6e0 = auVar30;
          } while ((((((((auVar372 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                        (auVar372 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar372 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      SUB321(auVar372 >> 0x7f,0) != '\0') ||
                     (auVar372 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    SUB321(auVar372 >> 0xbf,0) != '\0') ||
                   (auVar372 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   auVar372[0x1f] < '\0');
        }
        auVar156._0_4_ =
             fVar301 * (float)local_880._0_4_ +
             fVar203 * (float)local_740._0_4_ + fVar280 * (float)local_760._0_4_;
        auVar156._4_4_ =
             fVar303 * (float)local_880._4_4_ +
             fVar260 * (float)local_740._4_4_ + fVar281 * (float)local_760._4_4_;
        auVar156._8_4_ = fVar305 * fStack_878 + fVar236 * fStack_738 + fVar283 * fStack_758;
        auVar156._12_4_ = fVar307 * fStack_874 + fVar262 * fStack_734 + fVar284 * fStack_754;
        auVar156._16_4_ = fVar309 * fStack_870 + fVar263 * fStack_730 + fVar285 * fStack_750;
        auVar156._20_4_ = fVar311 * fStack_86c + fVar264 * fStack_72c + fVar286 * fStack_74c;
        auVar156._24_4_ = fVar364 * fStack_868 + fVar265 * fStack_728 + fVar287 * fStack_748;
        auVar156._28_4_ = auVar152._28_4_ + auVar152._28_4_ + auVar279._28_4_;
        auVar192._8_4_ = 0x7fffffff;
        auVar192._0_8_ = 0x7fffffff7fffffff;
        auVar192._12_4_ = 0x7fffffff;
        auVar192._16_4_ = 0x7fffffff;
        auVar192._20_4_ = 0x7fffffff;
        auVar192._24_4_ = 0x7fffffff;
        auVar192._28_4_ = 0x7fffffff;
        auVar152 = vandps_avx(auVar156,auVar192);
        auVar193._8_4_ = 0x3e99999a;
        auVar193._0_8_ = 0x3e99999a3e99999a;
        auVar193._12_4_ = 0x3e99999a;
        auVar193._16_4_ = 0x3e99999a;
        auVar193._20_4_ = 0x3e99999a;
        auVar193._24_4_ = 0x3e99999a;
        auVar193._28_4_ = 0x3e99999a;
        auVar152 = vcmpps_avx(auVar152,auVar193,1);
        auVar30 = vorps_avx(auVar152,local_680);
        auVar194._0_4_ = (float)local_9a0._0_4_ + auVar31._0_4_;
        auVar194._4_4_ = (float)local_9a0._4_4_ + auVar31._4_4_;
        auVar194._8_4_ = fStack_998 + auVar31._8_4_;
        auVar194._12_4_ = fStack_994 + auVar31._12_4_;
        auVar194._16_4_ = fStack_990 + auVar31._16_4_;
        auVar194._20_4_ = fStack_98c + auVar31._20_4_;
        auVar194._24_4_ = fStack_988 + auVar31._24_4_;
        auVar194._28_4_ = fStack_984 + auVar31._28_4_;
        uVar7 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar231._4_4_ = uVar7;
        auVar231._0_4_ = uVar7;
        auVar231._8_4_ = uVar7;
        auVar231._12_4_ = uVar7;
        auVar231._16_4_ = uVar7;
        auVar231._20_4_ = uVar7;
        auVar231._24_4_ = uVar7;
        auVar231._28_4_ = uVar7;
        auVar152 = vcmpps_avx(auVar194,auVar231,2);
        _local_860 = vandps_avx(auVar152,auVar142);
        auVar195._8_4_ = 3;
        auVar195._0_8_ = 0x300000003;
        auVar195._12_4_ = 3;
        auVar195._16_4_ = 3;
        auVar195._20_4_ = 3;
        auVar195._24_4_ = 3;
        auVar195._28_4_ = 3;
        auVar232._8_4_ = 2;
        auVar232._0_8_ = 0x200000002;
        auVar232._12_4_ = 2;
        auVar232._16_4_ = 2;
        auVar232._20_4_ = 2;
        auVar232._24_4_ = 2;
        auVar232._28_4_ = 2;
        auVar142 = vblendvps_avx(auVar232,auVar195,auVar30);
        auVar179 = vpcmpgtd_avx(auVar142._16_16_,local_6a0);
        auVar248 = vpshufd_avx(local_7c0._0_16_,0);
        auVar248 = vpcmpgtd_avx(auVar142._0_16_,auVar248);
        auVar196._16_16_ = auVar179;
        auVar196._0_16_ = auVar248;
        _local_880 = vblendps_avx(ZEXT1632(auVar248),auVar196,0xf0);
        auVar142 = vandnps_avx(_local_880,_local_860);
        auVar152 = _local_860 & ~_local_880;
        if ((((((((auVar152 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar152 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar152 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar152 >> 0x7f,0) != '\0') ||
              (auVar152 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar152 >> 0xbf,0) != '\0') ||
            (auVar152 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar152[0x1f] < '\0') {
          local_920 = _local_2e0;
          local_800._4_4_ = (float)local_9a0._4_4_ + (float)local_2e0._4_4_;
          local_800._0_4_ = (float)local_9a0._0_4_ + (float)local_2e0._0_4_;
          fStack_7f8 = fStack_998 + fStack_2d8;
          fStack_7f4 = fStack_994 + fStack_2d4;
          fStack_7f0 = fStack_990 + fStack_2d0;
          fStack_7ec = fStack_98c + fStack_2cc;
          fStack_7e8 = fStack_988 + fStack_2c8;
          fStack_7e4 = fStack_984 + fStack_2c4;
          do {
            auVar271 = auVar403._0_16_;
            auVar197._8_4_ = 0x7f800000;
            auVar197._0_8_ = 0x7f8000007f800000;
            auVar197._12_4_ = 0x7f800000;
            auVar197._16_4_ = 0x7f800000;
            auVar197._20_4_ = 0x7f800000;
            auVar197._24_4_ = 0x7f800000;
            auVar197._28_4_ = 0x7f800000;
            auVar152 = vblendvps_avx(auVar197,local_920,auVar142);
            auVar30 = vshufps_avx(auVar152,auVar152,0xb1);
            auVar30 = vminps_avx(auVar152,auVar30);
            auVar31 = vshufpd_avx(auVar30,auVar30,5);
            auVar30 = vminps_avx(auVar30,auVar31);
            auVar31 = vperm2f128_avx(auVar30,auVar30,1);
            auVar30 = vminps_avx(auVar30,auVar31);
            auVar30 = vcmpps_avx(auVar152,auVar30,0);
            auVar31 = auVar142 & auVar30;
            auVar152 = auVar142;
            if ((((((((auVar31 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar31 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar31 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar31 >> 0x7f,0) != '\0') ||
                  (auVar31 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar31 >> 0xbf,0) != '\0') ||
                (auVar31 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar31[0x1f] < '\0') {
              auVar152 = vandps_avx(auVar30,auVar142);
            }
            local_820._0_8_ = uVar123;
            uVar121 = vmovmskps_avx(auVar152);
            uVar124 = 0;
            if (uVar121 != 0) {
              for (; (uVar121 >> uVar124 & 1) == 0; uVar124 = uVar124 + 1) {
              }
            }
            uVar129 = (ulong)uVar124;
            local_700 = auVar142;
            *(undefined4 *)(local_700 + uVar129 * 4) = 0;
            fVar164 = local_660[uVar129];
            uVar124 = *(uint *)(local_2c0 + uVar129 * 4);
            fVar259 = auVar37._0_4_;
            if ((float)local_980._0_4_ < 0.0) {
              fVar259 = sqrtf((float)local_980._0_4_);
              auVar271._8_4_ = 0x7fffffff;
              auVar271._0_8_ = 0x7fffffff7fffffff;
              auVar271._12_4_ = 0x7fffffff;
            }
            auVar279 = ZEXT464(uVar124);
            auVar413 = ZEXT464((uint)fVar164);
            auVar248 = vminps_avx(_local_ad0,_local_af0);
            auVar179 = vmaxps_avx(_local_ad0,_local_af0);
            auVar138 = vminps_avx(_local_ae0,_local_b00);
            auVar174 = vminps_avx(auVar248,auVar138);
            auVar248 = vmaxps_avx(_local_ae0,_local_b00);
            auVar138 = vmaxps_avx(auVar179,auVar248);
            auVar179 = vandps_avx(auVar174,auVar271);
            auVar248 = vandps_avx(auVar138,auVar271);
            auVar179 = vmaxps_avx(auVar179,auVar248);
            auVar248 = vmovshdup_avx(auVar179);
            auVar248 = vmaxss_avx(auVar248,auVar179);
            auVar179 = vshufpd_avx(auVar179,auVar179,1);
            auVar179 = vmaxss_avx(auVar179,auVar248);
            fVar164 = auVar179._0_4_ * 1.9073486e-06;
            local_7e0._0_4_ = fVar259 * 1.9073486e-06;
            local_900._0_16_ = vshufps_avx(auVar138,auVar138,0xff);
            lVar125 = 5;
            do {
              auVar179 = vshufps_avx(auVar279._0_16_,auVar279._0_16_,0);
              auVar137._0_4_ = auVar179._0_4_ * (float)local_970._0_4_ + 0.0;
              auVar137._4_4_ = auVar179._4_4_ * (float)local_970._4_4_ + 0.0;
              auVar137._8_4_ = auVar179._8_4_ * fStack_968 + 0.0;
              auVar137._12_4_ = auVar179._12_4_ * fStack_964 + 0.0;
              fVar207 = auVar413._0_4_;
              fVar260 = 1.0 - fVar207;
              fVar203 = fVar207 * 3.0;
              fVar259 = fVar203 + -5.0;
              auVar179 = ZEXT416((uint)(fVar207 * fVar207 * -fVar260 * 0.5));
              auVar179 = vshufps_avx(auVar179,auVar179,0);
              auVar248 = ZEXT416((uint)((fVar260 * fVar260 * (fVar260 * 3.0 + -5.0) + 2.0) * 0.5));
              auVar248 = vshufps_avx(auVar248,auVar248,0);
              auVar138 = ZEXT416((uint)((fVar207 * fVar207 * fVar259 + 2.0) * 0.5));
              auVar138 = vshufps_avx(auVar138,auVar138,0);
              auVar174 = ZEXT416((uint)(fVar260 * fVar260 * -fVar207 * 0.5));
              auVar174 = vshufps_avx(auVar174,auVar174,0);
              auVar218._0_4_ =
                   auVar174._0_4_ * (float)local_ad0._0_4_ +
                   auVar138._0_4_ * (float)local_af0._0_4_ +
                   auVar248._0_4_ * (float)local_ae0._0_4_ + auVar179._0_4_ * (float)local_b00._0_4_
              ;
              auVar218._4_4_ =
                   auVar174._4_4_ * (float)local_ad0._4_4_ +
                   auVar138._4_4_ * (float)local_af0._4_4_ +
                   auVar248._4_4_ * (float)local_ae0._4_4_ + auVar179._4_4_ * (float)local_b00._4_4_
              ;
              auVar218._8_4_ =
                   auVar174._8_4_ * fStack_ac8 +
                   auVar138._8_4_ * fStack_ae8 +
                   auVar248._8_4_ * fStack_ad8 + auVar179._8_4_ * fStack_af8;
              auVar218._12_4_ =
                   auVar174._12_4_ * fStack_ac4 +
                   auVar138._12_4_ * fStack_ae4 +
                   auVar248._12_4_ * fStack_ad4 + auVar179._12_4_ * fStack_af4;
              local_940._0_16_ = auVar218;
              auVar179 = vsubps_avx(auVar137,auVar218);
              _local_aa0 = auVar179;
              auVar179 = vdpps_avx(auVar179,auVar179,0x7f);
              fVar261 = auVar179._0_4_;
              local_cc0 = auVar279._0_4_;
              if (fVar261 < 0.0) {
                local_a60._0_4_ = fVar207 * 9.0;
                local_a80._0_4_ = fVar259;
                local_9c0._0_4_ = fVar260 * -2.0;
                fVar236 = sqrtf(fVar261);
                fVar262 = (float)local_9c0._0_4_;
                fVar263 = (float)local_a60._0_4_;
                fVar259 = (float)local_a80._0_4_;
              }
              else {
                auVar248 = vsqrtss_avx(auVar179,auVar179);
                fVar236 = auVar248._0_4_;
                fVar262 = fVar260 * -2.0;
                fVar263 = fVar207 * 9.0;
              }
              auVar248 = ZEXT416((uint)((fVar207 * fVar207 + fVar207 * fVar262) * 0.5));
              auVar248 = vshufps_avx(auVar248,auVar248,0);
              auVar138 = ZEXT416((uint)(((fVar260 + fVar260) * (fVar203 + 2.0) +
                                        fVar260 * fVar260 * -3.0) * 0.5));
              auVar138 = vshufps_avx(auVar138,auVar138,0);
              auVar174 = ZEXT416((uint)((fVar259 * (fVar207 + fVar207) + fVar207 * fVar203) * 0.5));
              auVar174 = vshufps_avx(auVar174,auVar174,0);
              auVar175 = ZEXT416((uint)((fVar207 * (fVar260 + fVar260) - fVar260 * fVar260) * 0.5));
              auVar175 = vshufps_avx(auVar175,auVar175,0);
              auVar395._0_4_ =
                   (float)local_ad0._0_4_ * auVar175._0_4_ +
                   (float)local_af0._0_4_ * auVar174._0_4_ +
                   (float)local_b00._0_4_ * auVar248._0_4_ + (float)local_ae0._0_4_ * auVar138._0_4_
              ;
              auVar395._4_4_ =
                   (float)local_ad0._4_4_ * auVar175._4_4_ +
                   (float)local_af0._4_4_ * auVar174._4_4_ +
                   (float)local_b00._4_4_ * auVar248._4_4_ + (float)local_ae0._4_4_ * auVar138._4_4_
              ;
              auVar395._8_4_ =
                   fStack_ac8 * auVar175._8_4_ +
                   fStack_ae8 * auVar174._8_4_ +
                   fStack_af8 * auVar248._8_4_ + fStack_ad8 * auVar138._8_4_;
              auVar395._12_4_ =
                   fStack_ac4 * auVar175._12_4_ +
                   fStack_ae4 * auVar174._12_4_ +
                   fStack_af4 * auVar248._12_4_ + fStack_ad4 * auVar138._12_4_;
              auVar175 = vpermilps_avx(ZEXT416((uint)(fVar203 + -1.0)),0);
              auVar178 = vpermilps_avx(ZEXT416((uint)(fVar207 * -9.0 + 4.0)),0);
              auVar248 = vshufps_avx(ZEXT416((uint)(fVar263 + -5.0)),ZEXT416((uint)(fVar263 + -5.0))
                                     ,0);
              auVar138 = ZEXT416((uint)(fVar207 * -3.0 + 2.0));
              auVar174 = vshufps_avx(auVar138,auVar138,0);
              auVar138 = vdpps_avx(auVar395,auVar395,0x7f);
              auVar176._0_4_ =
                   (float)local_ad0._0_4_ * auVar174._0_4_ +
                   (float)local_af0._0_4_ * auVar248._0_4_ +
                   (float)local_ae0._0_4_ * auVar178._0_4_ + (float)local_b00._0_4_ * auVar175._0_4_
              ;
              auVar176._4_4_ =
                   (float)local_ad0._4_4_ * auVar174._4_4_ +
                   (float)local_af0._4_4_ * auVar248._4_4_ +
                   (float)local_ae0._4_4_ * auVar178._4_4_ + (float)local_b00._4_4_ * auVar175._4_4_
              ;
              auVar176._8_4_ =
                   fStack_ac8 * auVar174._8_4_ +
                   fStack_ae8 * auVar248._8_4_ +
                   fStack_ad8 * auVar178._8_4_ + fStack_af8 * auVar175._8_4_;
              auVar176._12_4_ =
                   fStack_ac4 * auVar174._12_4_ +
                   fStack_ae4 * auVar248._12_4_ +
                   fStack_ad4 * auVar178._12_4_ + fStack_af4 * auVar175._12_4_;
              auVar248 = vblendps_avx(auVar138,_DAT_01feba10,0xe);
              auVar174 = vrsqrtss_avx(auVar248,auVar248);
              fVar203 = auVar174._0_4_;
              fVar259 = auVar138._0_4_;
              auVar174 = vdpps_avx(auVar395,auVar176,0x7f);
              auVar175 = vshufps_avx(auVar138,auVar138,0);
              auVar177._0_4_ = auVar176._0_4_ * auVar175._0_4_;
              auVar177._4_4_ = auVar176._4_4_ * auVar175._4_4_;
              auVar177._8_4_ = auVar176._8_4_ * auVar175._8_4_;
              auVar177._12_4_ = auVar176._12_4_ * auVar175._12_4_;
              auVar174 = vshufps_avx(auVar174,auVar174,0);
              auVar272._0_4_ = auVar395._0_4_ * auVar174._0_4_;
              auVar272._4_4_ = auVar395._4_4_ * auVar174._4_4_;
              auVar272._8_4_ = auVar395._8_4_ * auVar174._8_4_;
              auVar272._12_4_ = auVar395._12_4_ * auVar174._12_4_;
              auVar178 = vsubps_avx(auVar177,auVar272);
              auVar174 = vrcpss_avx(auVar248,auVar248);
              auVar248 = vmaxss_avx(ZEXT416((uint)fVar164),
                                    ZEXT416((uint)(local_cc0 * (float)local_7e0._0_4_)));
              auVar362 = ZEXT1664(auVar248);
              auVar174 = ZEXT416((uint)(auVar174._0_4_ * (2.0 - fVar259 * auVar174._0_4_)));
              auVar174 = vshufps_avx(auVar174,auVar174,0);
              uVar129 = CONCAT44(auVar395._4_4_,auVar395._0_4_);
              auVar291._0_8_ = uVar129 ^ 0x8000000080000000;
              auVar291._8_4_ = -auVar395._8_4_;
              auVar291._12_4_ = -auVar395._12_4_;
              auVar175 = ZEXT416((uint)(fVar203 * 1.5 + fVar259 * -0.5 * fVar203 * fVar203 * fVar203
                                       ));
              auVar175 = vshufps_avx(auVar175,auVar175,0);
              auVar249._0_4_ = auVar175._0_4_ * auVar178._0_4_ * auVar174._0_4_;
              auVar249._4_4_ = auVar175._4_4_ * auVar178._4_4_ * auVar174._4_4_;
              auVar249._8_4_ = auVar175._8_4_ * auVar178._8_4_ * auVar174._8_4_;
              auVar249._12_4_ = auVar175._12_4_ * auVar178._12_4_ * auVar174._12_4_;
              auVar317._0_4_ = auVar395._0_4_ * auVar175._0_4_;
              auVar317._4_4_ = auVar395._4_4_ * auVar175._4_4_;
              auVar317._8_4_ = auVar395._8_4_ * auVar175._8_4_;
              auVar317._12_4_ = auVar395._12_4_ * auVar175._12_4_;
              if (fVar259 < 0.0) {
                fVar259 = sqrtf(fVar259);
                auVar362 = ZEXT464(auVar248._0_4_);
              }
              else {
                auVar138 = vsqrtss_avx(auVar138,auVar138);
                fVar259 = auVar138._0_4_;
              }
              auVar138 = vdpps_avx(_local_aa0,auVar317,0x7f);
              fVar259 = (fVar164 / fVar259) * (fVar236 + 1.0) + auVar362._0_4_ + fVar236 * fVar164;
              auVar174 = vdpps_avx(auVar291,auVar317,0x7f);
              auVar175 = vdpps_avx(_local_aa0,auVar249,0x7f);
              auVar178 = vdpps_avx(_local_970,auVar317,0x7f);
              auVar9 = vdpps_avx(_local_aa0,auVar291,0x7f);
              fVar203 = auVar174._0_4_ + auVar175._0_4_;
              fVar260 = auVar138._0_4_;
              auVar139._0_4_ = fVar260 * fVar260;
              auVar139._4_4_ = auVar138._4_4_ * auVar138._4_4_;
              auVar139._8_4_ = auVar138._8_4_ * auVar138._8_4_;
              auVar139._12_4_ = auVar138._12_4_ * auVar138._12_4_;
              auVar175 = vsubps_avx(auVar179,auVar139);
              auVar174 = vdpps_avx(_local_aa0,_local_970,0x7f);
              fVar236 = auVar9._0_4_ - fVar260 * fVar203;
              fVar262 = auVar174._0_4_ - fVar260 * auVar178._0_4_;
              auVar174 = vrsqrtss_avx(auVar175,auVar175);
              fVar263 = auVar175._0_4_;
              fVar260 = auVar174._0_4_;
              fVar260 = fVar260 * 1.5 + fVar263 * -0.5 * fVar260 * fVar260 * fVar260;
              if (fVar263 < 0.0) {
                local_a60._0_4_ = fVar236;
                local_a80._0_4_ = fVar262;
                local_9c0._0_4_ = fVar260;
                fVar263 = sqrtf(fVar263);
                auVar362 = ZEXT464(auVar248._0_4_);
                fVar260 = (float)local_9c0._0_4_;
                fVar236 = (float)local_a60._0_4_;
                fVar262 = (float)local_a80._0_4_;
              }
              else {
                auVar248 = vsqrtss_avx(auVar175,auVar175);
                fVar263 = auVar248._0_4_;
              }
              auVar175 = vpermilps_avx(local_940._0_16_,0xff);
              auVar9 = vpermilps_avx(auVar395,0xff);
              fVar236 = fVar236 * fVar260 - auVar9._0_4_;
              auVar273._0_8_ = auVar178._0_8_ ^ 0x8000000080000000;
              auVar273._8_4_ = auVar178._8_4_ ^ 0x80000000;
              auVar273._12_4_ = auVar178._12_4_ ^ 0x80000000;
              auVar292._0_4_ = -fVar236;
              auVar292._4_4_ = 0x80000000;
              auVar292._8_4_ = 0x80000000;
              auVar292._12_4_ = 0x80000000;
              auVar248 = vinsertps_avx(ZEXT416((uint)(fVar262 * fVar260)),auVar273,0x10);
              auVar174 = vmovsldup_avx(ZEXT416((uint)(fVar203 * fVar262 * fVar260 -
                                                     auVar178._0_4_ * fVar236)));
              auVar248 = vdivps_avx(auVar248,auVar174);
              auVar178 = ZEXT416((uint)(fVar263 - auVar175._0_4_));
              auVar175 = vinsertps_avx(auVar138,auVar178,0x10);
              auVar250._0_4_ = auVar175._0_4_ * auVar248._0_4_;
              auVar250._4_4_ = auVar175._4_4_ * auVar248._4_4_;
              auVar250._8_4_ = auVar175._8_4_ * auVar248._8_4_;
              auVar250._12_4_ = auVar175._12_4_ * auVar248._12_4_;
              auVar248 = vinsertps_avx(auVar292,ZEXT416((uint)fVar203),0x1c);
              auVar248 = vdivps_avx(auVar248,auVar174);
              auVar174 = vhaddps_avx(auVar250,auVar250);
              auVar219._0_4_ = auVar175._0_4_ * auVar248._0_4_;
              auVar219._4_4_ = auVar175._4_4_ * auVar248._4_4_;
              auVar219._8_4_ = auVar175._8_4_ * auVar248._8_4_;
              auVar219._12_4_ = auVar175._12_4_ * auVar248._12_4_;
              auVar248 = vhaddps_avx(auVar219,auVar219);
              fVar207 = fVar207 - auVar174._0_4_;
              local_cc0 = local_cc0 - auVar248._0_4_;
              auVar279 = ZEXT464((uint)local_cc0);
              auVar274._8_4_ = 0x7fffffff;
              auVar274._0_8_ = 0x7fffffff7fffffff;
              auVar274._12_4_ = 0x7fffffff;
              auVar403 = ZEXT1664(auVar274);
              auVar248 = vandps_avx(auVar138,auVar274);
              bVar83 = true;
              if (auVar248._0_4_ < fVar259) {
                auVar248 = vandps_avx(auVar178,auVar274);
                if (auVar248._0_4_ <
                    (float)local_900._0_4_ * 1.9073486e-06 + auVar362._0_4_ + fVar259) {
                  local_cc0 = local_cc0 + (float)local_8b0._0_4_;
                  auVar279 = ZEXT464((uint)local_cc0);
                  if ((((fVar243 <= local_cc0) &&
                       (fVar259 = *(float *)(ray + k * 4 + 0x100), local_cc0 <= fVar259)) &&
                      (0.0 <= fVar207)) && (fVar207 <= 1.0)) {
                    auVar179 = vrsqrtss_avx(auVar179,auVar179);
                    fVar203 = auVar179._0_4_;
                    pGVar25 = (context->scene->geometries).items[local_a18].ptr;
                    if ((pGVar25->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar25->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                        unaff_R13B = true;
                      }
                      else {
                        auVar179 = ZEXT416((uint)(fVar203 * 1.5 +
                                                 fVar261 * -0.5 * fVar203 * fVar203 * fVar203));
                        auVar179 = vshufps_avx(auVar179,auVar179,0);
                        auVar180._0_4_ = auVar179._0_4_ * (float)local_aa0._0_4_;
                        auVar180._4_4_ = auVar179._4_4_ * (float)local_aa0._4_4_;
                        auVar180._8_4_ = auVar179._8_4_ * fStack_a98;
                        auVar180._12_4_ = auVar179._12_4_ * fStack_a94;
                        auVar140._0_4_ = auVar395._0_4_ + auVar9._0_4_ * auVar180._0_4_;
                        auVar140._4_4_ = auVar395._4_4_ + auVar9._4_4_ * auVar180._4_4_;
                        auVar140._8_4_ = auVar395._8_4_ + auVar9._8_4_ * auVar180._8_4_;
                        auVar140._12_4_ = auVar395._12_4_ + auVar9._12_4_ * auVar180._12_4_;
                        auVar179 = vshufps_avx(auVar180,auVar180,0xc9);
                        auVar248 = vshufps_avx(auVar395,auVar395,0xc9);
                        auVar181._0_4_ = auVar248._0_4_ * auVar180._0_4_;
                        auVar181._4_4_ = auVar248._4_4_ * auVar180._4_4_;
                        auVar181._8_4_ = auVar248._8_4_ * auVar180._8_4_;
                        auVar181._12_4_ = auVar248._12_4_ * auVar180._12_4_;
                        auVar220._0_4_ = auVar395._0_4_ * auVar179._0_4_;
                        auVar220._4_4_ = auVar395._4_4_ * auVar179._4_4_;
                        auVar220._8_4_ = auVar395._8_4_ * auVar179._8_4_;
                        auVar220._12_4_ = auVar395._12_4_ * auVar179._12_4_;
                        auVar138 = vsubps_avx(auVar220,auVar181);
                        auVar179 = vshufps_avx(auVar138,auVar138,0xc9);
                        auVar248 = vshufps_avx(auVar140,auVar140,0xc9);
                        auVar221._0_4_ = auVar248._0_4_ * auVar179._0_4_;
                        auVar221._4_4_ = auVar248._4_4_ * auVar179._4_4_;
                        auVar221._8_4_ = auVar248._8_4_ * auVar179._8_4_;
                        auVar221._12_4_ = auVar248._12_4_ * auVar179._12_4_;
                        auVar179 = vshufps_avx(auVar138,auVar138,0xd2);
                        auVar141._0_4_ = auVar140._0_4_ * auVar179._0_4_;
                        auVar141._4_4_ = auVar140._4_4_ * auVar179._4_4_;
                        auVar141._8_4_ = auVar140._8_4_ * auVar179._8_4_;
                        auVar141._12_4_ = auVar140._12_4_ * auVar179._12_4_;
                        auVar179 = vsubps_avx(auVar221,auVar141);
                        pRVar28 = context->user;
                        local_5b0 = vshufps_avx(ZEXT416((uint)fVar207),ZEXT416((uint)fVar207),0);
                        auStack_610 = vshufps_avx(auVar179,auVar179,0x55);
                        local_5f0 = vshufps_avx(auVar179,auVar179,0xaa);
                        local_5d0 = vshufps_avx(auVar179,auVar179,0);
                        local_620 = (RTCHitN  [16])auStack_610;
                        local_600 = local_5f0;
                        local_5e0 = local_5d0;
                        local_5c0 = local_5b0;
                        local_5a0 = ZEXT832(0) << 0x20;
                        local_580 = local_4e0._0_8_;
                        uStack_578 = local_4e0._8_8_;
                        uStack_570 = local_4e0._16_8_;
                        uStack_568 = local_4e0._24_8_;
                        local_560 = local_4c0._0_8_;
                        uStack_558 = local_4c0._8_8_;
                        uStack_550 = local_4c0._16_8_;
                        uStack_548 = local_4c0._24_8_;
                        local_a20[1] = local_960;
                        *local_a20 = local_960;
                        local_540 = pRVar28->instID[0];
                        uStack_53c = local_540;
                        uStack_538 = local_540;
                        uStack_534 = local_540;
                        uStack_530 = local_540;
                        uStack_52c = local_540;
                        uStack_528 = local_540;
                        uStack_524 = local_540;
                        local_520 = pRVar28->instPrimID[0];
                        uStack_51c = local_520;
                        uStack_518 = local_520;
                        uStack_514 = local_520;
                        uStack_510 = local_520;
                        uStack_50c = local_520;
                        uStack_508 = local_520;
                        uStack_504 = local_520;
                        *(float *)(ray + k * 4 + 0x100) = local_cc0;
                        local_b20 = *local_a28;
                        uStack_b18 = local_a28[1];
                        local_b10 = *local_a30;
                        uStack_b08 = local_a30[1];
                        local_a10.valid = (int *)&local_b20;
                        local_a10.geometryUserPtr = pGVar25->userPtr;
                        local_a10.context = context->user;
                        local_a10.hit = local_620;
                        local_a10.N = 8;
                        local_a10.ray = (RTCRayN *)ray;
                        if (pGVar25->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar362 = ZEXT1664(auVar362._0_16_);
                          (*pGVar25->occlusionFilterN)(&local_a10);
                          auVar403 = ZEXT1664(CONCAT412(0x7fffffff,
                                                        CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                        }
                        auVar112._8_8_ = uStack_b18;
                        auVar112._0_8_ = local_b20;
                        auVar179 = vpcmpeqd_avx((undefined1  [16])0x0,auVar112);
                        auVar116._8_8_ = uStack_b08;
                        auVar116._0_8_ = local_b10;
                        auVar248 = vpcmpeqd_avx((undefined1  [16])0x0,auVar116);
                        auVar157._16_16_ = auVar248;
                        auVar157._0_16_ = auVar179;
                        auVar142 = local_960 & ~auVar157;
                        if ((((((((auVar142 >> 0x1f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0 &&
                                 (auVar142 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                 ) && (auVar142 >> 0x5f & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) && SUB321(auVar142 >> 0x7f,0) == '\0')
                              && (auVar142 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0
                              ) && SUB321(auVar142 >> 0xbf,0) == '\0') &&
                            (auVar142 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                            -1 < auVar142[0x1f]) {
                          auVar158._0_4_ = auVar179._0_4_ ^ local_960._0_4_;
                          auVar158._4_4_ = auVar179._4_4_ ^ local_960._4_4_;
                          auVar158._8_4_ = auVar179._8_4_ ^ local_960._8_4_;
                          auVar158._12_4_ = auVar179._12_4_ ^ local_960._12_4_;
                          auVar158._16_4_ = auVar248._0_4_ ^ local_960._16_4_;
                          auVar158._20_4_ = auVar248._4_4_ ^ local_960._20_4_;
                          auVar158._24_4_ = auVar248._8_4_ ^ local_960._24_4_;
                          auVar158._28_4_ = auVar248._12_4_ ^ local_960._28_4_;
                        }
                        else {
                          p_Var29 = context->args->filter;
                          if ((p_Var29 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar25->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar362 = ZEXT1664(auVar362._0_16_);
                            (*p_Var29)(&local_a10);
                            auVar403 = ZEXT1664(CONCAT412(0x7fffffff,
                                                          CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                          }
                          auVar113._8_8_ = uStack_b18;
                          auVar113._0_8_ = local_b20;
                          auVar179 = vpcmpeqd_avx((undefined1  [16])0x0,auVar113);
                          auVar117._8_8_ = uStack_b08;
                          auVar117._0_8_ = local_b10;
                          auVar248 = vpcmpeqd_avx((undefined1  [16])0x0,auVar117);
                          auVar198._16_16_ = auVar248;
                          auVar198._0_16_ = auVar179;
                          auVar158._0_4_ = auVar179._0_4_ ^ local_960._0_4_;
                          auVar158._4_4_ = auVar179._4_4_ ^ local_960._4_4_;
                          auVar158._8_4_ = auVar179._8_4_ ^ local_960._8_4_;
                          auVar158._12_4_ = auVar179._12_4_ ^ local_960._12_4_;
                          auVar158._16_4_ = auVar248._0_4_ ^ local_960._16_4_;
                          auVar158._20_4_ = auVar248._4_4_ ^ local_960._20_4_;
                          auVar158._24_4_ = auVar248._8_4_ ^ local_960._24_4_;
                          auVar158._28_4_ = auVar248._12_4_ ^ local_960._28_4_;
                          auVar233._8_4_ = 0xff800000;
                          auVar233._0_8_ = 0xff800000ff800000;
                          auVar233._12_4_ = 0xff800000;
                          auVar233._16_4_ = 0xff800000;
                          auVar233._20_4_ = 0xff800000;
                          auVar233._24_4_ = 0xff800000;
                          auVar233._28_4_ = 0xff800000;
                          auVar142 = vblendvps_avx(auVar233,*(undefined1 (*) [32])
                                                             (local_a10.ray + 0x100),auVar198);
                          *(undefined1 (*) [32])(local_a10.ray + 0x100) = auVar142;
                        }
                        bVar103 = (auVar158 >> 0x1f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0;
                        bVar104 = (auVar158 >> 0x3f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0;
                        bVar102 = (auVar158 >> 0x5f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0;
                        bVar101 = SUB321(auVar158 >> 0x7f,0) != '\0';
                        bVar100 = (auVar158 & (undefined1  [32])0x100000000) !=
                                  (undefined1  [32])0x0;
                        bVar99 = SUB321(auVar158 >> 0xbf,0) != '\0';
                        bVar97 = (auVar158 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0
                        ;
                        bVar83 = auVar158[0x1f] < '\0';
                        unaff_R13B = ((((((bVar103 || bVar104) || bVar102) || bVar101) || bVar100)
                                      || bVar99) || bVar97) || bVar83;
                        if (((((((!bVar103 && !bVar104) && !bVar102) && !bVar101) && !bVar100) &&
                             !bVar99) && !bVar97) && !bVar83) {
                          *(float *)(ray + k * 4 + 0x100) = fVar259;
                        }
                      }
                      auVar279 = ZEXT464((uint)local_cc0);
                      bVar83 = false;
                      goto LAB_01289cd9;
                    }
                  }
                  bVar83 = false;
                  unaff_R13B = 0;
                }
              }
LAB_01289cd9:
              auVar413 = ZEXT464((uint)fVar207);
              if (!bVar83) goto LAB_0128a06b;
              lVar125 = lVar125 + -1;
            } while (lVar125 != 0);
            unaff_R13B = 0;
LAB_0128a06b:
            unaff_R13B = unaff_R13B & 1;
            uVar123 = CONCAT71(local_820._1_7_,local_820[0] | unaff_R13B);
            uVar7 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar159._4_4_ = uVar7;
            auVar159._0_4_ = uVar7;
            auVar159._8_4_ = uVar7;
            auVar159._12_4_ = uVar7;
            auVar159._16_4_ = uVar7;
            auVar159._20_4_ = uVar7;
            auVar159._24_4_ = uVar7;
            auVar159._28_4_ = uVar7;
            auVar152 = vcmpps_avx(_local_800,auVar159,2);
            auVar142 = vandps_avx(auVar152,local_700);
            local_700 = local_700 & auVar152;
            uVar129 = local_720;
          } while ((((((((local_700 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                        (local_700 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (local_700 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      SUB321(local_700 >> 0x7f,0) != '\0') ||
                     (local_700 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    SUB321(local_700 >> 0xbf,0) != '\0') ||
                   (local_700 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   local_700[0x1f] < '\0');
        }
        auVar142 = vandps_avx(local_7a0,local_780);
        auVar152 = vandps_avx(_local_880,_local_860);
        auVar234._0_4_ = (float)local_9a0._0_4_ + local_320._0_4_;
        auVar234._4_4_ = (float)local_9a0._4_4_ + local_320._4_4_;
        auVar234._8_4_ = fStack_998 + local_320._8_4_;
        auVar234._12_4_ = fStack_994 + local_320._12_4_;
        auVar234._16_4_ = fStack_990 + local_320._16_4_;
        auVar234._20_4_ = fStack_98c + local_320._20_4_;
        auVar234._24_4_ = fStack_988 + local_320._24_4_;
        auVar234._28_4_ = fStack_984 + local_320._28_4_;
        uVar7 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar278._4_4_ = uVar7;
        auVar278._0_4_ = uVar7;
        auVar278._8_4_ = uVar7;
        auVar278._12_4_ = uVar7;
        auVar278._16_4_ = uVar7;
        auVar278._20_4_ = uVar7;
        auVar278._24_4_ = uVar7;
        auVar278._28_4_ = uVar7;
        auVar30 = vcmpps_avx(auVar234,auVar278,2);
        auVar142 = vandps_avx(auVar30,auVar142);
        auVar299._0_4_ = (float)local_9a0._0_4_ + local_2e0._0_4_;
        auVar299._4_4_ = (float)local_9a0._4_4_ + local_2e0._4_4_;
        auVar299._8_4_ = fStack_998 + local_2e0._8_4_;
        auVar299._12_4_ = fStack_994 + local_2e0._12_4_;
        auVar299._16_4_ = fStack_990 + local_2e0._16_4_;
        auVar299._20_4_ = fStack_98c + local_2e0._20_4_;
        auVar299._24_4_ = fStack_988 + local_2e0._24_4_;
        auVar299._28_4_ = fStack_984 + local_2e0._28_4_;
        auVar30 = vcmpps_avx(auVar299,auVar278,2);
        auVar152 = vandps_avx(auVar30,auVar152);
        auVar152 = vorps_avx(auVar142,auVar152);
        if ((((((((auVar152 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar152 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar152 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar152 >> 0x7f,0) != '\0') ||
              (auVar152 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar152 >> 0xbf,0) != '\0') ||
            (auVar152 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar152[0x1f] < '\0') {
          uVar122 = (ulong)uVar120;
          *(undefined1 (*) [32])(auStack_180 + uVar122 * 0x60) = auVar152;
          auVar142 = vblendvps_avx(_local_2e0,_local_320,auVar142);
          *(undefined1 (*) [32])(auStack_160 + uVar122 * 0x60) = auVar142;
          uVar8 = vmovlps_avx(local_8a0);
          *(undefined8 *)(afStack_140 + uVar122 * 0x18) = uVar8;
          auStack_138[uVar122 * 0x18] = (int)uVar129 + 1;
          uVar120 = uVar120 + 1;
        }
        auVar279 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                       &
                                                  DAT_3f8000003f800000)))))));
        auVar403 = ZEXT3264(local_840);
      }
    }
    do {
      if (uVar120 == 0) {
        if ((uVar123 & 1) != 0) {
          return local_cc9;
        }
        uVar7 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar160._4_4_ = uVar7;
        auVar160._0_4_ = uVar7;
        auVar160._8_4_ = uVar7;
        auVar160._12_4_ = uVar7;
        auVar160._16_4_ = uVar7;
        auVar160._20_4_ = uVar7;
        auVar160._24_4_ = uVar7;
        auVar160._28_4_ = uVar7;
        auVar142 = vcmpps_avx(local_280,auVar160,2);
        uVar120 = vmovmskps_avx(auVar142);
        uVar120 = (uint)local_888 - 1 & (uint)local_888 & uVar120;
        local_cc9 = uVar120 != 0;
        if (!local_cc9) {
          return local_cc9;
        }
        goto LAB_01287320;
      }
      uVar124 = uVar120 - 1;
      uVar122 = (ulong)uVar124;
      lVar125 = uVar122 * 0x60;
      auVar142 = *(undefined1 (*) [32])(auStack_160 + lVar125);
      auVar150._0_4_ = (float)local_9a0._0_4_ + auVar142._0_4_;
      auVar150._4_4_ = (float)local_9a0._4_4_ + auVar142._4_4_;
      auVar150._8_4_ = fStack_998 + auVar142._8_4_;
      auVar150._12_4_ = fStack_994 + auVar142._12_4_;
      auVar150._16_4_ = fStack_990 + auVar142._16_4_;
      auVar150._20_4_ = fStack_98c + auVar142._20_4_;
      auVar150._24_4_ = fStack_988 + auVar142._24_4_;
      auVar150._28_4_ = fStack_984 + auVar142._28_4_;
      uVar7 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar257._4_4_ = uVar7;
      auVar257._0_4_ = uVar7;
      auVar257._8_4_ = uVar7;
      auVar257._12_4_ = uVar7;
      auVar257._16_4_ = uVar7;
      auVar257._20_4_ = uVar7;
      auVar257._24_4_ = uVar7;
      auVar257._28_4_ = uVar7;
      auVar30 = vcmpps_avx(auVar150,auVar257,2);
      auVar152 = vandps_avx(auVar30,*(undefined1 (*) [32])(auStack_180 + lVar125));
      _local_620 = auVar152;
      auVar30 = *(undefined1 (*) [32])(auStack_180 + lVar125) & auVar30;
      bVar103 = (auVar30 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar104 = (auVar30 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar102 = (auVar30 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar101 = SUB321(auVar30 >> 0x7f,0) == '\0';
      bVar100 = (auVar30 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar99 = SUB321(auVar30 >> 0xbf,0) == '\0';
      bVar97 = (auVar30 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar83 = -1 < auVar30[0x1f];
      if (((((((!bVar103 || !bVar104) || !bVar102) || !bVar101) || !bVar100) || !bVar99) || !bVar97)
          || !bVar83) {
        auVar226._8_4_ = 0x7f800000;
        auVar226._0_8_ = 0x7f8000007f800000;
        auVar226._12_4_ = 0x7f800000;
        auVar226._16_4_ = 0x7f800000;
        auVar226._20_4_ = 0x7f800000;
        auVar226._24_4_ = 0x7f800000;
        auVar226._28_4_ = 0x7f800000;
        auVar142 = vblendvps_avx(auVar226,auVar142,auVar152);
        auVar30 = vshufps_avx(auVar142,auVar142,0xb1);
        auVar30 = vminps_avx(auVar142,auVar30);
        auVar31 = vshufpd_avx(auVar30,auVar30,5);
        auVar30 = vminps_avx(auVar30,auVar31);
        auVar31 = vperm2f128_avx(auVar30,auVar30,1);
        auVar30 = vminps_avx(auVar30,auVar31);
        auVar142 = vcmpps_avx(auVar142,auVar30,0);
        auVar30 = auVar152 & auVar142;
        if ((((((((auVar30 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar30 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar30 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar30 >> 0x7f,0) != '\0') ||
              (auVar30 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar30 >> 0xbf,0) != '\0') ||
            (auVar30 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar30[0x1f] < '\0') {
          auVar152 = vandps_avx(auVar142,auVar152);
        }
        fVar164 = afStack_140[uVar122 * 0x18 + 1];
        uVar129 = (ulong)auStack_138[uVar122 * 0x18];
        uVar126 = vmovmskps_avx(auVar152);
        uVar121 = 0;
        if (uVar126 != 0) {
          for (; (uVar126 >> uVar121 & 1) == 0; uVar121 = uVar121 + 1) {
          }
        }
        fVar259 = afStack_140[uVar122 * 0x18];
        *(undefined4 *)(local_620 + (ulong)uVar121 * 4) = 0;
        *(undefined1 (*) [32])(auStack_180 + lVar125) = _local_620;
        if ((((((((_local_620 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (_local_620 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (_local_620 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(_local_620 >> 0x7f,0) != '\0') ||
              (_local_620 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(_local_620 >> 0xbf,0) != '\0') ||
            (_local_620 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            local_620[0x1f] < '\0') {
          uVar124 = uVar120;
        }
        auVar179 = vshufps_avx(ZEXT416((uint)(fVar164 - fVar259)),ZEXT416((uint)(fVar164 - fVar259))
                               ,0);
        local_320._4_4_ = fVar259 + auVar179._4_4_ * 0.14285715;
        local_320._0_4_ = fVar259 + auVar179._0_4_ * 0.0;
        fStack_318 = fVar259 + auVar179._8_4_ * 0.2857143;
        fStack_314 = fVar259 + auVar179._12_4_ * 0.42857146;
        fStack_310 = fVar259 + auVar179._0_4_ * 0.5714286;
        fStack_30c = fVar259 + auVar179._4_4_ * 0.71428573;
        fStack_308 = fVar259 + auVar179._8_4_ * 0.8571429;
        fStack_304 = fVar259 + auVar179._12_4_;
        local_8a0._8_8_ = 0;
        local_8a0._0_8_ = *(ulong *)(local_320 + (ulong)uVar121 * 4);
      }
      uVar120 = uVar124;
    } while (((((((bVar103 && bVar104) && bVar102) && bVar101) && bVar100) && bVar99) && bVar97) &&
             bVar83);
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }